

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersector1<8>::
     occluded_h<embree::avx::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [28];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Primitive PVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  RTCFilterFunctionN p_Var23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [28];
  undefined1 auVar138 [28];
  undefined1 auVar139 [28];
  undefined1 auVar140 [28];
  ulong uVar141;
  ulong uVar142;
  RTCIntersectArguments *pRVar143;
  ulong uVar144;
  uint uVar145;
  long lVar146;
  long lVar147;
  byte bVar148;
  undefined4 uVar149;
  undefined8 unaff_R13;
  long lVar150;
  Geometry *geometry;
  long lVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar171;
  float fVar175;
  float fVar177;
  float fVar178;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar169;
  float fVar173;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar170;
  float fVar172;
  float fVar174;
  float fVar176;
  float fVar179;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar181 [16];
  float fVar194;
  float fVar197;
  undefined1 auVar182 [16];
  float fVar180;
  undefined1 auVar183 [16];
  float fVar196;
  float fVar199;
  float fVar200;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar201;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar195;
  float fVar198;
  undefined1 auVar193 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar215;
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  float fVar216;
  float fVar223;
  float fVar224;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  float fVar225;
  float fVar226;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar227;
  float fVar242;
  undefined1 auVar229 [16];
  float fVar228;
  undefined1 auVar231 [16];
  undefined1 auVar230 [16];
  float fVar238;
  float fVar240;
  float fVar245;
  float fVar248;
  float fVar250;
  undefined1 auVar232 [32];
  float fVar252;
  undefined1 auVar233 [32];
  float fVar239;
  float fVar241;
  float fVar243;
  float fVar244;
  float fVar246;
  float fVar247;
  float fVar249;
  float fVar251;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar253;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar254;
  float fVar265;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar263;
  float fVar264;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar270;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar271;
  float fVar272;
  float fVar277;
  float fVar279;
  undefined1 auVar273 [16];
  float fVar281;
  float fVar283;
  float fVar285;
  float fVar287;
  float fVar288;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar278;
  float fVar280;
  float fVar282;
  float fVar284;
  float fVar286;
  float fVar289;
  undefined1 auVar276 [32];
  float fVar296;
  float fVar297;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar298;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  float fVar299;
  float fVar300;
  float fVar308;
  float fVar309;
  undefined1 auVar310 [12];
  float fVar311;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar313;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar312;
  undefined1 auVar306 [32];
  undefined1 auVar307 [64];
  float fVar314;
  float fVar322;
  float fVar323;
  float fVar325;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  float fVar330;
  undefined1 auVar318 [32];
  float fVar324;
  float fVar326;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [64];
  float fVar340;
  float fVar341;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  float fVar342;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  float fVar372;
  float fVar376;
  float fVar377;
  float fVar378;
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [64];
  float fVar379;
  float fVar383;
  float fVar384;
  float fVar385;
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar386 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_7dc;
  RayQueryContext *local_7d8;
  long local_7d0;
  Primitive *local_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  ulong local_720;
  Precalculations *local_718;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_690 [8];
  undefined8 uStack_688;
  undefined8 local_680;
  undefined4 local_678;
  float local_674;
  uint local_670;
  undefined4 local_66c;
  undefined4 local_668;
  uint local_664;
  uint local_660;
  ulong local_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5b0 [8];
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  undefined8 uStack_598;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar184 [24];
  
  local_7d8 = context;
  PVar19 = prim[1];
  uVar141 = (ulong)(byte)PVar19;
  auVar386 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 4 + 6)));
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 4 + 10)));
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 5 + 6)));
  local_718 = pre;
  auVar219 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 5 + 10)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 6 + 6)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 6 + 10)));
  lVar150 = uVar141 * 0x25;
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 0xf + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 0xf + 10)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 10)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 0x11 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 0x11 + 10)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 0x1a + 6)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 0x1a + 10)));
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 0x1b + 6)));
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 0x1b + 10)));
  auVar185._16_16_ = auVar207;
  auVar185._0_16_ = auVar386;
  auVar192._16_16_ = auVar219;
  auVar192._0_16_ = auVar231;
  auVar386 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 0x1c + 6)));
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar141 * 0x1c + 10)));
  auVar232._16_16_ = auVar34;
  auVar232._0_16_ = auVar33;
  fVar227 = *(float *)(prim + lVar150 + 0x12);
  auVar353._16_16_ = auVar36;
  auVar353._0_16_ = auVar35;
  auVar231 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar150 + 6));
  auVar273._0_4_ = fVar227 * auVar231._0_4_;
  auVar273._4_4_ = fVar227 * auVar231._4_4_;
  auVar273._8_4_ = fVar227 * auVar231._8_4_;
  auVar273._12_4_ = fVar227 * auVar231._12_4_;
  auVar290._0_4_ = fVar227 * (ray->dir).field_0.m128[0];
  auVar290._4_4_ = fVar227 * (ray->dir).field_0.m128[1];
  auVar290._8_4_ = fVar227 * (ray->dir).field_0.m128[2];
  auVar290._12_4_ = fVar227 * (ray->dir).field_0.m128[3];
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar25 = vcvtdq2ps_avx(auVar232);
  auVar257._16_16_ = auVar38;
  auVar257._0_16_ = auVar37;
  auVar26 = vcvtdq2ps_avx(auVar257);
  auVar258._16_16_ = auVar40;
  auVar258._0_16_ = auVar39;
  auVar27 = vcvtdq2ps_avx(auVar258);
  auVar373._16_16_ = auVar42;
  auVar373._0_16_ = auVar41;
  auVar362._16_16_ = auVar44;
  auVar362._0_16_ = auVar43;
  auVar301._16_16_ = auVar207;
  auVar301._0_16_ = auVar386;
  auVar386 = vshufps_avx(auVar290,auVar290,0x55);
  auVar207 = vshufps_avx(auVar290,auVar290,0xaa);
  fVar240 = auVar207._0_4_;
  fVar194 = auVar207._4_4_;
  fVar242 = auVar207._8_4_;
  fVar197 = auVar207._12_4_;
  fVar245 = auVar386._0_4_;
  fVar248 = auVar386._4_4_;
  fVar250 = auVar386._8_4_;
  fVar254 = auVar386._12_4_;
  auVar28 = vcvtdq2ps_avx(auVar185);
  auVar29 = vcvtdq2ps_avx(auVar353);
  auVar30 = vcvtdq2ps_avx(auVar373);
  auVar31 = vcvtdq2ps_avx(auVar362);
  auVar32 = vcvtdq2ps_avx(auVar301);
  auVar386 = vshufps_avx(auVar290,auVar290,0);
  fVar227 = auVar386._0_4_;
  fVar226 = auVar386._4_4_;
  fVar238 = auVar386._8_4_;
  fVar252 = auVar386._12_4_;
  auVar363._0_4_ = auVar28._0_4_ * fVar227 + fVar245 * auVar192._0_4_ + fVar240 * auVar25._0_4_;
  auVar363._4_4_ = auVar28._4_4_ * fVar226 + fVar248 * auVar192._4_4_ + fVar194 * auVar25._4_4_;
  auVar363._8_4_ = auVar28._8_4_ * fVar238 + fVar250 * auVar192._8_4_ + fVar242 * auVar25._8_4_;
  auVar363._12_4_ = auVar28._12_4_ * fVar252 + fVar254 * auVar192._12_4_ + fVar197 * auVar25._12_4_;
  auVar363._16_4_ = auVar28._16_4_ * fVar227 + fVar245 * auVar192._16_4_ + fVar240 * auVar25._16_4_;
  auVar363._20_4_ = auVar28._20_4_ * fVar226 + fVar248 * auVar192._20_4_ + fVar194 * auVar25._20_4_;
  auVar363._24_4_ = auVar28._24_4_ * fVar238 + fVar250 * auVar192._24_4_ + fVar242 * auVar25._24_4_;
  auVar363._28_4_ = auVar36._12_4_ + 0.0;
  auVar354._0_4_ = auVar29._0_4_ * fVar227 + fVar240 * auVar27._0_4_ + fVar245 * auVar26._0_4_;
  auVar354._4_4_ = auVar29._4_4_ * fVar226 + fVar194 * auVar27._4_4_ + fVar248 * auVar26._4_4_;
  auVar354._8_4_ = auVar29._8_4_ * fVar238 + fVar242 * auVar27._8_4_ + fVar250 * auVar26._8_4_;
  auVar354._12_4_ = auVar29._12_4_ * fVar252 + fVar197 * auVar27._12_4_ + fVar254 * auVar26._12_4_;
  auVar354._16_4_ = auVar29._16_4_ * fVar227 + fVar240 * auVar27._16_4_ + fVar245 * auVar26._16_4_;
  auVar354._20_4_ = auVar29._20_4_ * fVar226 + fVar194 * auVar27._20_4_ + fVar248 * auVar26._20_4_;
  auVar354._24_4_ = auVar29._24_4_ * fVar238 + fVar242 * auVar27._24_4_ + fVar250 * auVar26._24_4_;
  auVar354._28_4_ = 0;
  auVar343._0_4_ = fVar245 * auVar31._0_4_ + fVar240 * auVar32._0_4_ + fVar227 * auVar30._0_4_;
  auVar343._4_4_ = fVar248 * auVar31._4_4_ + fVar194 * auVar32._4_4_ + fVar226 * auVar30._4_4_;
  auVar343._8_4_ = fVar250 * auVar31._8_4_ + fVar242 * auVar32._8_4_ + fVar238 * auVar30._8_4_;
  auVar343._12_4_ = fVar254 * auVar31._12_4_ + fVar197 * auVar32._12_4_ + fVar252 * auVar30._12_4_;
  auVar343._16_4_ = fVar245 * auVar31._16_4_ + fVar240 * auVar32._16_4_ + fVar227 * auVar30._16_4_;
  auVar343._20_4_ = fVar248 * auVar31._20_4_ + fVar194 * auVar32._20_4_ + fVar226 * auVar30._20_4_;
  auVar343._24_4_ = fVar250 * auVar31._24_4_ + fVar242 * auVar32._24_4_ + fVar238 * auVar30._24_4_;
  auVar343._28_4_ = auVar36._12_4_ + fVar197 + 0.0;
  auVar386 = vshufps_avx(auVar273,auVar273,0x55);
  auVar207 = vshufps_avx(auVar273,auVar273,0xaa);
  fVar194 = auVar207._0_4_;
  fVar242 = auVar207._4_4_;
  fVar197 = auVar207._8_4_;
  fVar245 = auVar207._12_4_;
  fVar227 = auVar386._0_4_;
  fVar226 = auVar386._4_4_;
  fVar238 = auVar386._8_4_;
  fVar240 = auVar386._12_4_;
  fVar252 = fVar252 + auVar25._28_4_;
  auVar386._8_8_ = 0;
  auVar386._0_8_ = *(ulong *)(prim + uVar141 * 7 + 6);
  auVar386 = vpmovsxwd_avx(auVar386);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + uVar141 * 7 + 0xe);
  auVar207 = vpmovsxwd_avx(auVar207);
  auVar231 = vshufps_avx(auVar273,auVar273,0);
  fVar248 = auVar231._0_4_;
  fVar250 = auVar231._4_4_;
  fVar254 = auVar231._8_4_;
  fVar263 = auVar231._12_4_;
  auVar186._0_4_ = fVar248 * auVar28._0_4_ + fVar227 * auVar192._0_4_ + fVar194 * auVar25._0_4_;
  auVar186._4_4_ = fVar250 * auVar28._4_4_ + fVar226 * auVar192._4_4_ + fVar242 * auVar25._4_4_;
  auVar186._8_4_ = fVar254 * auVar28._8_4_ + fVar238 * auVar192._8_4_ + fVar197 * auVar25._8_4_;
  auVar186._12_4_ = fVar263 * auVar28._12_4_ + fVar240 * auVar192._12_4_ + fVar245 * auVar25._12_4_;
  auVar186._16_4_ = fVar248 * auVar28._16_4_ + fVar227 * auVar192._16_4_ + fVar194 * auVar25._16_4_;
  auVar186._20_4_ = fVar250 * auVar28._20_4_ + fVar226 * auVar192._20_4_ + fVar242 * auVar25._20_4_;
  auVar186._24_4_ = fVar254 * auVar28._24_4_ + fVar238 * auVar192._24_4_ + fVar197 * auVar25._24_4_;
  auVar186._28_4_ = fVar240 + fVar252;
  auVar155._0_4_ = fVar248 * auVar29._0_4_ + fVar227 * auVar26._0_4_ + fVar194 * auVar27._0_4_;
  auVar155._4_4_ = fVar250 * auVar29._4_4_ + fVar226 * auVar26._4_4_ + fVar242 * auVar27._4_4_;
  auVar155._8_4_ = fVar254 * auVar29._8_4_ + fVar238 * auVar26._8_4_ + fVar197 * auVar27._8_4_;
  auVar155._12_4_ = fVar263 * auVar29._12_4_ + fVar240 * auVar26._12_4_ + fVar245 * auVar27._12_4_;
  auVar155._16_4_ = fVar248 * auVar29._16_4_ + fVar227 * auVar26._16_4_ + fVar194 * auVar27._16_4_;
  auVar155._20_4_ = fVar250 * auVar29._20_4_ + fVar226 * auVar26._20_4_ + fVar242 * auVar27._20_4_;
  auVar155._24_4_ = fVar254 * auVar29._24_4_ + fVar238 * auVar26._24_4_ + fVar197 * auVar27._24_4_;
  auVar155._28_4_ = fVar252 + auVar27._28_4_ + 0.0;
  auVar331._8_4_ = 0x7fffffff;
  auVar331._0_8_ = 0x7fffffff7fffffff;
  auVar331._12_4_ = 0x7fffffff;
  auVar331._16_4_ = 0x7fffffff;
  auVar331._20_4_ = 0x7fffffff;
  auVar331._24_4_ = 0x7fffffff;
  auVar331._28_4_ = 0x7fffffff;
  auVar259._8_4_ = 0x219392ef;
  auVar259._0_8_ = 0x219392ef219392ef;
  auVar259._12_4_ = 0x219392ef;
  auVar259._16_4_ = 0x219392ef;
  auVar259._20_4_ = 0x219392ef;
  auVar259._24_4_ = 0x219392ef;
  auVar259._28_4_ = 0x219392ef;
  auVar192 = vandps_avx(auVar363,auVar331);
  auVar192 = vcmpps_avx(auVar192,auVar259,1);
  auVar25 = vblendvps_avx(auVar363,auVar259,auVar192);
  auVar192 = vandps_avx(auVar354,auVar331);
  auVar192 = vcmpps_avx(auVar192,auVar259,1);
  auVar26 = vblendvps_avx(auVar354,auVar259,auVar192);
  auVar192 = vandps_avx(auVar343,auVar331);
  auVar192 = vcmpps_avx(auVar192,auVar259,1);
  auVar192 = vblendvps_avx(auVar343,auVar259,auVar192);
  auVar209._0_4_ = fVar248 * auVar30._0_4_ + auVar31._0_4_ * fVar227 + auVar32._0_4_ * fVar194;
  auVar209._4_4_ = fVar250 * auVar30._4_4_ + auVar31._4_4_ * fVar226 + auVar32._4_4_ * fVar242;
  auVar209._8_4_ = fVar254 * auVar30._8_4_ + auVar31._8_4_ * fVar238 + auVar32._8_4_ * fVar197;
  auVar209._12_4_ = fVar263 * auVar30._12_4_ + auVar31._12_4_ * fVar240 + auVar32._12_4_ * fVar245;
  auVar209._16_4_ = fVar248 * auVar30._16_4_ + auVar31._16_4_ * fVar227 + auVar32._16_4_ * fVar194;
  auVar209._20_4_ = fVar250 * auVar30._20_4_ + auVar31._20_4_ * fVar226 + auVar32._20_4_ * fVar242;
  auVar209._24_4_ = fVar254 * auVar30._24_4_ + auVar31._24_4_ * fVar238 + auVar32._24_4_ * fVar197;
  auVar209._28_4_ = fVar252 + fVar240 + fVar245;
  auVar27 = vrcpps_avx(auVar25);
  fVar227 = auVar27._0_4_;
  fVar238 = auVar27._4_4_;
  auVar28._4_4_ = auVar25._4_4_ * fVar238;
  auVar28._0_4_ = auVar25._0_4_ * fVar227;
  fVar240 = auVar27._8_4_;
  auVar28._8_4_ = auVar25._8_4_ * fVar240;
  fVar242 = auVar27._12_4_;
  auVar28._12_4_ = auVar25._12_4_ * fVar242;
  fVar245 = auVar27._16_4_;
  auVar28._16_4_ = auVar25._16_4_ * fVar245;
  fVar248 = auVar27._20_4_;
  auVar28._20_4_ = auVar25._20_4_ * fVar248;
  fVar250 = auVar27._24_4_;
  auVar28._24_4_ = auVar25._24_4_ * fVar250;
  auVar28._28_4_ = 0x219392ef;
  auVar364._8_4_ = 0x3f800000;
  auVar364._0_8_ = 0x3f8000003f800000;
  auVar364._12_4_ = 0x3f800000;
  auVar364._16_4_ = 0x3f800000;
  auVar364._20_4_ = 0x3f800000;
  auVar364._24_4_ = 0x3f800000;
  auVar364._28_4_ = 0x3f800000;
  auVar29 = vsubps_avx(auVar364,auVar28);
  auVar28 = vrcpps_avx(auVar26);
  fVar227 = fVar227 + fVar227 * auVar29._0_4_;
  fVar238 = fVar238 + fVar238 * auVar29._4_4_;
  fVar240 = fVar240 + fVar240 * auVar29._8_4_;
  fVar242 = fVar242 + fVar242 * auVar29._12_4_;
  fVar245 = fVar245 + fVar245 * auVar29._16_4_;
  fVar248 = fVar248 + fVar248 * auVar29._20_4_;
  fVar250 = fVar250 + fVar250 * auVar29._24_4_;
  fVar254 = auVar28._0_4_;
  fVar263 = auVar28._4_4_;
  auVar25._4_4_ = fVar263 * auVar26._4_4_;
  auVar25._0_4_ = fVar254 * auVar26._0_4_;
  fVar264 = auVar28._8_4_;
  auVar25._8_4_ = fVar264 * auVar26._8_4_;
  fVar265 = auVar28._12_4_;
  auVar25._12_4_ = fVar265 * auVar26._12_4_;
  fVar266 = auVar28._16_4_;
  auVar25._16_4_ = fVar266 * auVar26._16_4_;
  fVar267 = auVar28._20_4_;
  auVar25._20_4_ = fVar267 * auVar26._20_4_;
  fVar268 = auVar28._24_4_;
  auVar25._24_4_ = fVar268 * auVar26._24_4_;
  auVar25._28_4_ = auVar29._28_4_;
  auVar26 = vsubps_avx(auVar364,auVar25);
  fVar254 = fVar254 + fVar254 * auVar26._0_4_;
  fVar263 = fVar263 + fVar263 * auVar26._4_4_;
  fVar264 = fVar264 + fVar264 * auVar26._8_4_;
  fVar265 = fVar265 + fVar265 * auVar26._12_4_;
  fVar266 = fVar266 + fVar266 * auVar26._16_4_;
  fVar267 = fVar267 + fVar267 * auVar26._20_4_;
  fVar268 = fVar268 + fVar268 * auVar26._24_4_;
  auVar25 = vrcpps_avx(auVar192);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *(ulong *)(prim + uVar141 * 0xb + 6);
  auVar231 = vpmovsxwd_avx(auVar231);
  auVar219._8_8_ = 0;
  auVar219._0_8_ = *(ulong *)(prim + uVar141 * 0xb + 0xe);
  auVar219 = vpmovsxwd_avx(auVar219);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar141 * 9 + 6);
  auVar33 = vpmovsxwd_avx(auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar141 * 9 + 0xe);
  auVar34 = vpmovsxwd_avx(auVar34);
  fVar271 = auVar25._0_4_;
  fVar277 = auVar25._4_4_;
  auVar30._4_4_ = fVar277 * auVar192._4_4_;
  auVar30._0_4_ = fVar271 * auVar192._0_4_;
  fVar279 = auVar25._8_4_;
  auVar30._8_4_ = fVar279 * auVar192._8_4_;
  fVar281 = auVar25._12_4_;
  auVar30._12_4_ = fVar281 * auVar192._12_4_;
  fVar283 = auVar25._16_4_;
  auVar30._16_4_ = fVar283 * auVar192._16_4_;
  fVar285 = auVar25._20_4_;
  auVar30._20_4_ = fVar285 * auVar192._20_4_;
  fVar287 = auVar25._24_4_;
  auVar30._24_4_ = fVar287 * auVar192._24_4_;
  auVar30._28_4_ = auVar192._28_4_;
  auVar192 = vsubps_avx(auVar364,auVar30);
  fVar271 = fVar271 + fVar271 * auVar192._0_4_;
  fVar277 = fVar277 + fVar277 * auVar192._4_4_;
  fVar279 = fVar279 + fVar279 * auVar192._8_4_;
  fVar281 = fVar281 + fVar281 * auVar192._12_4_;
  fVar283 = fVar283 + fVar283 * auVar192._16_4_;
  fVar285 = fVar285 + fVar285 * auVar192._20_4_;
  fVar287 = fVar287 + fVar287 * auVar192._24_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar141 * 0xd + 6);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar292._16_16_ = auVar207;
  auVar292._0_16_ = auVar386;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar141 * 0xd + 0xe);
  auVar386 = vpmovsxwd_avx(auVar36);
  auVar207 = vpermilps_avx(ZEXT416((uint)(((ray->dir).field_0.m128[3] -
                                          *(float *)(prim + lVar150 + 0x16)) *
                                         *(float *)(prim + lVar150 + 0x1a))),0);
  auVar192 = vcvtdq2ps_avx(auVar292);
  auVar344._16_16_ = auVar219;
  auVar344._0_16_ = auVar231;
  auVar25 = vcvtdq2ps_avx(auVar344);
  auVar25 = vsubps_avx(auVar25,auVar192);
  fVar226 = auVar207._0_4_;
  fVar252 = auVar207._4_4_;
  fVar194 = auVar207._8_4_;
  fVar197 = auVar207._12_4_;
  auVar293._0_4_ = auVar25._0_4_ * fVar226 + auVar192._0_4_;
  auVar293._4_4_ = auVar25._4_4_ * fVar252 + auVar192._4_4_;
  auVar293._8_4_ = auVar25._8_4_ * fVar194 + auVar192._8_4_;
  auVar293._12_4_ = auVar25._12_4_ * fVar197 + auVar192._12_4_;
  auVar293._16_4_ = auVar25._16_4_ * fVar226 + auVar192._16_4_;
  auVar293._20_4_ = auVar25._20_4_ * fVar252 + auVar192._20_4_;
  auVar293._24_4_ = auVar25._24_4_ * fVar194 + auVar192._24_4_;
  auVar293._28_4_ = auVar25._28_4_ + auVar192._28_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar141 * 0x12 + 6);
  auVar207 = vpmovsxwd_avx(auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar141 * 0x12 + 0xe);
  auVar231 = vpmovsxwd_avx(auVar38);
  auVar315._16_16_ = auVar34;
  auVar315._0_16_ = auVar33;
  auVar302._16_16_ = auVar386;
  auVar302._0_16_ = auVar35;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar141 * 0x16 + 6);
  auVar386 = vpmovsxwd_avx(auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar141 * 0x16 + 0xe);
  auVar219 = vpmovsxwd_avx(auVar40);
  auVar192 = vcvtdq2ps_avx(auVar315);
  auVar25 = vcvtdq2ps_avx(auVar302);
  auVar25 = vsubps_avx(auVar25,auVar192);
  auVar303._0_4_ = auVar192._0_4_ + auVar25._0_4_ * fVar226;
  auVar303._4_4_ = auVar192._4_4_ + auVar25._4_4_ * fVar252;
  auVar303._8_4_ = auVar192._8_4_ + auVar25._8_4_ * fVar194;
  auVar303._12_4_ = auVar192._12_4_ + auVar25._12_4_ * fVar197;
  auVar303._16_4_ = auVar192._16_4_ + auVar25._16_4_ * fVar226;
  auVar303._20_4_ = auVar192._20_4_ + auVar25._20_4_ * fVar252;
  auVar303._24_4_ = auVar192._24_4_ + auVar25._24_4_ * fVar194;
  auVar303._28_4_ = auVar192._28_4_ + auVar25._28_4_;
  auVar316._16_16_ = auVar231;
  auVar316._0_16_ = auVar207;
  auVar192 = vcvtdq2ps_avx(auVar316);
  auVar332._16_16_ = auVar219;
  auVar332._0_16_ = auVar386;
  auVar25 = vcvtdq2ps_avx(auVar332);
  auVar25 = vsubps_avx(auVar25,auVar192);
  auVar317._0_4_ = auVar192._0_4_ + auVar25._0_4_ * fVar226;
  auVar317._4_4_ = auVar192._4_4_ + auVar25._4_4_ * fVar252;
  auVar317._8_4_ = auVar192._8_4_ + auVar25._8_4_ * fVar194;
  auVar317._12_4_ = auVar192._12_4_ + auVar25._12_4_ * fVar197;
  auVar317._16_4_ = auVar192._16_4_ + auVar25._16_4_ * fVar226;
  auVar317._20_4_ = auVar192._20_4_ + auVar25._20_4_ * fVar252;
  auVar317._24_4_ = auVar192._24_4_ + auVar25._24_4_ * fVar194;
  auVar317._28_4_ = auVar192._28_4_ + auVar25._28_4_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar141 * 0x14 + 6);
  auVar386 = vpmovsxwd_avx(auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar141 * 0x14 + 0xe);
  auVar207 = vpmovsxwd_avx(auVar42);
  auVar333._16_16_ = auVar207;
  auVar333._0_16_ = auVar386;
  auVar192 = vcvtdq2ps_avx(auVar333);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar141 * 0x18 + 6);
  auVar386 = vpmovsxwd_avx(auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar141 * 0x18 + 0xe);
  auVar207 = vpmovsxwd_avx(auVar44);
  auVar345._16_16_ = auVar207;
  auVar345._0_16_ = auVar386;
  auVar25 = vcvtdq2ps_avx(auVar345);
  auVar25 = vsubps_avx(auVar25,auVar192);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar141 * 0x1d + 6);
  auVar386 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar141 * 0x1d + 0xe);
  auVar207 = vpmovsxwd_avx(auVar12);
  auVar334._0_4_ = auVar192._0_4_ + auVar25._0_4_ * fVar226;
  auVar334._4_4_ = auVar192._4_4_ + auVar25._4_4_ * fVar252;
  auVar334._8_4_ = auVar192._8_4_ + auVar25._8_4_ * fVar194;
  auVar334._12_4_ = auVar192._12_4_ + auVar25._12_4_ * fVar197;
  auVar334._16_4_ = auVar192._16_4_ + auVar25._16_4_ * fVar226;
  auVar334._20_4_ = auVar192._20_4_ + auVar25._20_4_ * fVar252;
  auVar334._24_4_ = auVar192._24_4_ + auVar25._24_4_ * fVar194;
  auVar334._28_4_ = auVar192._28_4_ + auVar25._28_4_;
  auVar346._16_16_ = auVar207;
  auVar346._0_16_ = auVar386;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar141 * 0x21 + 6);
  auVar386 = vpmovsxwd_avx(auVar13);
  auVar192 = vcvtdq2ps_avx(auVar346);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar141 * 0x21 + 0xe);
  auVar207 = vpmovsxwd_avx(auVar14);
  auVar355._16_16_ = auVar207;
  auVar355._0_16_ = auVar386;
  auVar25 = vcvtdq2ps_avx(auVar355);
  auVar25 = vsubps_avx(auVar25,auVar192);
  auVar347._0_4_ = auVar192._0_4_ + auVar25._0_4_ * fVar226;
  auVar347._4_4_ = auVar192._4_4_ + auVar25._4_4_ * fVar252;
  auVar347._8_4_ = auVar192._8_4_ + auVar25._8_4_ * fVar194;
  auVar347._12_4_ = auVar192._12_4_ + auVar25._12_4_ * fVar197;
  auVar347._16_4_ = auVar192._16_4_ + auVar25._16_4_ * fVar226;
  auVar347._20_4_ = auVar192._20_4_ + auVar25._20_4_ * fVar252;
  auVar347._24_4_ = auVar192._24_4_ + auVar25._24_4_ * fVar194;
  auVar347._28_4_ = auVar192._28_4_ + auVar25._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar141 * 0x1f + 6);
  auVar386 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar141 * 0x1f + 0xe);
  auVar207 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar141 * 0x23 + 6);
  auVar231 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar141 * 0x23 + 0xe);
  auVar219 = vpmovsxwd_avx(auVar18);
  auVar356._16_16_ = auVar207;
  auVar356._0_16_ = auVar386;
  auVar365._16_16_ = auVar219;
  auVar365._0_16_ = auVar231;
  auVar192 = vcvtdq2ps_avx(auVar356);
  auVar25 = vcvtdq2ps_avx(auVar365);
  auVar25 = vsubps_avx(auVar25,auVar192);
  auVar357._0_4_ = auVar192._0_4_ + auVar25._0_4_ * fVar226;
  auVar357._4_4_ = auVar192._4_4_ + auVar25._4_4_ * fVar252;
  auVar357._8_4_ = auVar192._8_4_ + auVar25._8_4_ * fVar194;
  auVar357._12_4_ = auVar192._12_4_ + auVar25._12_4_ * fVar197;
  auVar357._16_4_ = auVar192._16_4_ + auVar25._16_4_ * fVar226;
  auVar357._20_4_ = auVar192._20_4_ + auVar25._20_4_ * fVar252;
  auVar357._24_4_ = auVar192._24_4_ + auVar25._24_4_ * fVar194;
  auVar357._28_4_ = auVar192._28_4_ + fVar197;
  auVar192 = vsubps_avx(auVar293,auVar186);
  auVar217._0_4_ = fVar227 * auVar192._0_4_;
  auVar217._4_4_ = fVar238 * auVar192._4_4_;
  auVar217._8_4_ = fVar240 * auVar192._8_4_;
  auVar217._12_4_ = fVar242 * auVar192._12_4_;
  auVar31._16_4_ = fVar245 * auVar192._16_4_;
  auVar31._0_16_ = auVar217;
  auVar31._20_4_ = fVar248 * auVar192._20_4_;
  auVar31._24_4_ = fVar250 * auVar192._24_4_;
  auVar31._28_4_ = auVar192._28_4_;
  auVar192 = vsubps_avx(auVar303,auVar186);
  auVar229._0_4_ = fVar227 * auVar192._0_4_;
  auVar229._4_4_ = fVar238 * auVar192._4_4_;
  auVar229._8_4_ = fVar240 * auVar192._8_4_;
  auVar229._12_4_ = fVar242 * auVar192._12_4_;
  auVar32._16_4_ = fVar245 * auVar192._16_4_;
  auVar32._0_16_ = auVar229;
  auVar32._20_4_ = fVar248 * auVar192._20_4_;
  auVar32._24_4_ = fVar250 * auVar192._24_4_;
  auVar32._28_4_ = auVar27._28_4_ + auVar29._28_4_;
  auVar192 = vsubps_avx(auVar317,auVar155);
  auVar181._0_4_ = fVar254 * auVar192._0_4_;
  auVar181._4_4_ = fVar263 * auVar192._4_4_;
  auVar181._8_4_ = fVar264 * auVar192._8_4_;
  auVar181._12_4_ = fVar265 * auVar192._12_4_;
  auVar27._16_4_ = fVar266 * auVar192._16_4_;
  auVar27._0_16_ = auVar181;
  auVar27._20_4_ = fVar267 * auVar192._20_4_;
  auVar27._24_4_ = fVar268 * auVar192._24_4_;
  auVar27._28_4_ = auVar192._28_4_;
  auVar192 = vsubps_avx(auVar334,auVar155);
  auVar255._0_4_ = fVar254 * auVar192._0_4_;
  auVar255._4_4_ = fVar263 * auVar192._4_4_;
  auVar255._8_4_ = fVar264 * auVar192._8_4_;
  auVar255._12_4_ = fVar265 * auVar192._12_4_;
  auVar29._16_4_ = fVar266 * auVar192._16_4_;
  auVar29._0_16_ = auVar255;
  auVar29._20_4_ = fVar267 * auVar192._20_4_;
  auVar29._24_4_ = fVar268 * auVar192._24_4_;
  auVar29._28_4_ = auVar28._28_4_ + auVar26._28_4_;
  auVar192 = vsubps_avx(auVar347,auVar209);
  auVar152._0_4_ = fVar271 * auVar192._0_4_;
  auVar152._4_4_ = fVar277 * auVar192._4_4_;
  auVar152._8_4_ = fVar279 * auVar192._8_4_;
  auVar152._12_4_ = fVar281 * auVar192._12_4_;
  auVar26._16_4_ = fVar283 * auVar192._16_4_;
  auVar26._0_16_ = auVar152;
  auVar26._20_4_ = fVar285 * auVar192._20_4_;
  auVar26._24_4_ = fVar287 * auVar192._24_4_;
  auVar26._28_4_ = auVar192._28_4_;
  auVar192 = vsubps_avx(auVar357,auVar209);
  auVar202._0_4_ = fVar271 * auVar192._0_4_;
  auVar202._4_4_ = fVar277 * auVar192._4_4_;
  auVar202._8_4_ = fVar279 * auVar192._8_4_;
  auVar202._12_4_ = fVar281 * auVar192._12_4_;
  auVar24._16_4_ = fVar283 * auVar192._16_4_;
  auVar24._0_16_ = auVar202;
  auVar24._20_4_ = fVar285 * auVar192._20_4_;
  auVar24._24_4_ = fVar287 * auVar192._24_4_;
  auVar24._28_4_ = auVar192._28_4_;
  auVar386 = vpminsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar207 = vpminsd_avx(auVar217,auVar229);
  auVar335._16_16_ = auVar386;
  auVar335._0_16_ = auVar207;
  auVar386 = vpminsd_avx(auVar27._16_16_,auVar29._16_16_);
  auVar207 = vpminsd_avx(auVar181,auVar255);
  auVar348._16_16_ = auVar386;
  auVar348._0_16_ = auVar207;
  auVar192 = vmaxps_avx(auVar335,auVar348);
  auVar386 = vpminsd_avx(auVar26._16_16_,auVar24._16_16_);
  auVar207 = vpminsd_avx(auVar152,auVar202);
  uVar149 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar380._4_4_ = uVar149;
  auVar380._0_4_ = uVar149;
  auVar380._8_4_ = uVar149;
  auVar380._12_4_ = uVar149;
  auVar380._16_4_ = uVar149;
  auVar380._20_4_ = uVar149;
  auVar380._24_4_ = uVar149;
  auVar380._28_4_ = uVar149;
  auVar366._16_16_ = auVar386;
  auVar366._0_16_ = auVar207;
  auVar25 = vmaxps_avx(auVar366,auVar380);
  auVar192 = vmaxps_avx(auVar192,auVar25);
  local_80._4_4_ = auVar192._4_4_ * 0.99999964;
  local_80._0_4_ = auVar192._0_4_ * 0.99999964;
  local_80._8_4_ = auVar192._8_4_ * 0.99999964;
  local_80._12_4_ = auVar192._12_4_ * 0.99999964;
  local_80._16_4_ = auVar192._16_4_ * 0.99999964;
  local_80._20_4_ = auVar192._20_4_ * 0.99999964;
  local_80._24_4_ = auVar192._24_4_ * 0.99999964;
  local_80._28_4_ = auVar25._28_4_;
  auVar386 = vpmaxsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar207 = vpmaxsd_avx(auVar217,auVar229);
  auVar220._16_16_ = auVar386;
  auVar220._0_16_ = auVar207;
  auVar386 = vpmaxsd_avx(auVar27._16_16_,auVar29._16_16_);
  auVar207 = vpmaxsd_avx(auVar181,auVar255);
  auVar187._16_16_ = auVar386;
  auVar187._0_16_ = auVar207;
  auVar192 = vminps_avx(auVar220,auVar187);
  auVar386 = vpmaxsd_avx(auVar26._16_16_,auVar24._16_16_);
  auVar207 = vpmaxsd_avx(auVar152,auVar202);
  auVar156._16_16_ = auVar386;
  auVar156._0_16_ = auVar207;
  fVar227 = ray->tfar;
  auVar210._4_4_ = fVar227;
  auVar210._0_4_ = fVar227;
  auVar210._8_4_ = fVar227;
  auVar210._12_4_ = fVar227;
  auVar210._16_4_ = fVar227;
  auVar210._20_4_ = fVar227;
  auVar210._24_4_ = fVar227;
  auVar210._28_4_ = fVar227;
  auVar25 = vminps_avx(auVar156,auVar210);
  auVar192 = vminps_avx(auVar192,auVar25);
  auVar45._4_4_ = auVar192._4_4_ * 1.0000004;
  auVar45._0_4_ = auVar192._0_4_ * 1.0000004;
  auVar45._8_4_ = auVar192._8_4_ * 1.0000004;
  auVar45._12_4_ = auVar192._12_4_ * 1.0000004;
  auVar45._16_4_ = auVar192._16_4_ * 1.0000004;
  auVar45._20_4_ = auVar192._20_4_ * 1.0000004;
  auVar45._24_4_ = auVar192._24_4_ * 1.0000004;
  auVar45._28_4_ = auVar192._28_4_;
  auVar192 = vcmpps_avx(local_80,auVar45,2);
  auVar386 = vpshufd_avx(ZEXT116((byte)PVar19),0);
  auVar188._16_16_ = auVar386;
  auVar188._0_16_ = auVar386;
  auVar25 = vcvtdq2ps_avx(auVar188);
  auVar25 = vcmpps_avx(_DAT_01f7b060,auVar25,1);
  auVar192 = vandps_avx(auVar192,auVar25);
  uVar149 = vmovmskps_avx(auVar192);
  local_480 = mm_lookupmask_ps._16_8_;
  uStack_478 = mm_lookupmask_ps._24_8_;
  uStack_470 = mm_lookupmask_ps._16_8_;
  uStack_468 = mm_lookupmask_ps._24_8_;
  local_7c8 = prim;
  for (uVar141 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar149); auVar192 = local_640,
      uVar141 != 0; uVar141 = (ulong)((uint)uVar141 & (uint)uVar141 + 0xff & uVar145)) {
    lVar150 = 0;
    if (uVar141 != 0) {
      for (; (uVar141 >> lVar150 & 1) == 0; lVar150 = lVar150 + 1) {
      }
    }
    local_720 = (ulong)*(uint *)(local_7c8 + 2);
    pGVar20 = (local_7d8->scene->geometries).items[*(uint *)(local_7c8 + 2)].ptr;
    local_648 = (ulong)*(uint *)(local_7c8 + lVar150 * 4 + 6);
    uVar144 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                              (ulong)*(uint *)(local_7c8 + lVar150 * 4 + 6) *
                              pGVar20[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar227 = (pGVar20->time_range).lower;
    fVar227 = pGVar20->fnumTimeSegments *
              (((ray->dir).field_0.m128[3] - fVar227) / ((pGVar20->time_range).upper - fVar227));
    auVar386 = vroundss_avx(ZEXT416((uint)fVar227),ZEXT416((uint)fVar227),9);
    auVar386 = vminss_avx(auVar386,ZEXT416((uint)(pGVar20->fnumTimeSegments + -1.0)));
    auVar386 = vmaxss_avx(ZEXT816(0) << 0x20,auVar386);
    fVar227 = fVar227 - auVar386._0_4_;
    _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar146 = (long)(int)auVar386._0_4_ * 0x38;
    lVar151 = *(long *)(_Var21 + 0x10 + lVar146);
    lVar147 = *(long *)(_Var21 + 0x38 + lVar146);
    lVar22 = *(long *)(_Var21 + 0x48 + lVar146);
    auVar386 = vshufps_avx(ZEXT416((uint)fVar227),ZEXT416((uint)fVar227),0);
    pfVar1 = (float *)(lVar147 + lVar22 * uVar144);
    fVar240 = auVar386._0_4_;
    fVar194 = auVar386._4_4_;
    fVar242 = auVar386._8_4_;
    fVar197 = auVar386._12_4_;
    lVar150 = uVar144 + 1;
    pfVar2 = (float *)(lVar147 + lVar22 * lVar150);
    p_Var23 = pGVar20[4].occlusionFilterN;
    auVar386 = vshufps_avx(ZEXT416((uint)(1.0 - fVar227)),ZEXT416((uint)(1.0 - fVar227)),0);
    pfVar3 = (float *)(*(long *)(_Var21 + lVar146) + lVar151 * uVar144);
    fVar227 = auVar386._0_4_;
    fVar226 = auVar386._4_4_;
    fVar238 = auVar386._8_4_;
    fVar252 = auVar386._12_4_;
    pfVar4 = (float *)(*(long *)(_Var21 + lVar146) + lVar151 * lVar150);
    pfVar5 = (float *)(*(long *)(p_Var23 + lVar146 + 0x38) +
                      uVar144 * *(long *)(p_Var23 + lVar146 + 0x48));
    pfVar6 = (float *)(*(long *)(p_Var23 + lVar146 + 0x38) +
                      *(long *)(p_Var23 + lVar146 + 0x48) * lVar150);
    pfVar7 = (float *)(*(long *)(p_Var23 + lVar146) + *(long *)(p_Var23 + lVar146 + 0x10) * uVar144)
    ;
    fVar245 = fVar227 * *pfVar3 + fVar240 * *pfVar1;
    fVar248 = fVar226 * pfVar3[1] + fVar194 * pfVar1[1];
    local_690 = (undefined1  [8])CONCAT44(fVar248,fVar245);
    uStack_688._0_4_ = fVar238 * pfVar3[2] + fVar242 * pfVar1[2];
    uStack_688._4_4_ = fVar252 * pfVar3[3] + fVar197 * pfVar1[3];
    pfVar1 = (float *)(*(long *)(p_Var23 + lVar146) + *(long *)(p_Var23 + lVar146 + 0x10) * lVar150)
    ;
    local_590._0_4_ = fVar227 * *pfVar4 + fVar240 * *pfVar2;
    local_590._4_4_ = fVar226 * pfVar4[1] + fVar194 * pfVar2[1];
    fStack_588 = fVar238 * pfVar4[2] + fVar242 * pfVar2[2];
    fStack_584 = fVar252 * pfVar4[3] + fVar197 * pfVar2[3];
    uVar145 = (uint)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    local_5a0 = (undefined1  [8])
                CONCAT44(fVar248 + (fVar226 * pfVar7[1] + fVar194 * pfVar5[1]) * 0.33333334,
                         fVar245 + (fVar227 * *pfVar7 + fVar240 * *pfVar5) * 0.33333334);
    uStack_598._0_4_ = (float)uStack_688 + (fVar238 * pfVar7[2] + fVar242 * pfVar5[2]) * 0.33333334;
    uStack_598._4_4_ = uStack_688._4_4_ + (fVar252 * pfVar7[3] + fVar197 * pfVar5[3]) * 0.33333334;
    auVar153._0_4_ = (fVar227 * *pfVar1 + fVar240 * *pfVar6) * 0.33333334;
    auVar153._4_4_ = (fVar226 * pfVar1[1] + fVar194 * pfVar6[1]) * 0.33333334;
    auVar153._8_4_ = (fVar238 * pfVar1[2] + fVar242 * pfVar6[2]) * 0.33333334;
    auVar153._12_4_ = (fVar252 * pfVar1[3] + fVar197 * pfVar6[3]) * 0.33333334;
    _local_5b0 = vsubps_avx(_local_590,auVar153);
    aVar10 = (ray->org).field_0;
    auVar231 = vsubps_avx(_local_690,(undefined1  [16])aVar10);
    auVar35 = _local_690;
    auVar386 = vshufps_avx(auVar231,auVar231,0);
    auVar207 = vshufps_avx(auVar231,auVar231,0x55);
    auVar231 = vshufps_avx(auVar231,auVar231,0xaa);
    fVar227 = (local_718->ray_space).vx.field_0.m128[0];
    fVar226 = (local_718->ray_space).vx.field_0.m128[1];
    fVar238 = (local_718->ray_space).vx.field_0.m128[2];
    fVar252 = (local_718->ray_space).vx.field_0.m128[3];
    fVar240 = (local_718->ray_space).vy.field_0.m128[0];
    fVar194 = (local_718->ray_space).vy.field_0.m128[1];
    fVar242 = (local_718->ray_space).vy.field_0.m128[2];
    fVar197 = (local_718->ray_space).vy.field_0.m128[3];
    fVar245 = (local_718->ray_space).vz.field_0.m128[0];
    fVar248 = (local_718->ray_space).vz.field_0.m128[1];
    fVar250 = (local_718->ray_space).vz.field_0.m128[2];
    fVar254 = (local_718->ray_space).vz.field_0.m128[3];
    auVar218._0_4_ = auVar386._0_4_ * fVar227 + auVar231._0_4_ * fVar245 + auVar207._0_4_ * fVar240;
    auVar218._4_4_ = auVar386._4_4_ * fVar226 + auVar231._4_4_ * fVar248 + auVar207._4_4_ * fVar194;
    auVar218._8_4_ = auVar386._8_4_ * fVar238 + auVar231._8_4_ * fVar250 + auVar207._8_4_ * fVar242;
    auVar218._12_4_ =
         auVar386._12_4_ * fVar252 + auVar231._12_4_ * fVar254 + auVar207._12_4_ * fVar197;
    auVar386 = vblendps_avx(auVar218,_local_690,8);
    auVar219 = vsubps_avx(_local_5a0,(undefined1  [16])aVar10);
    auVar207 = vshufps_avx(auVar219,auVar219,0);
    auVar231 = vshufps_avx(auVar219,auVar219,0x55);
    auVar219 = vshufps_avx(auVar219,auVar219,0xaa);
    auVar203._0_4_ = auVar207._0_4_ * fVar227 + auVar231._0_4_ * fVar240 + fVar245 * auVar219._0_4_;
    auVar203._4_4_ = auVar207._4_4_ * fVar226 + auVar231._4_4_ * fVar194 + fVar248 * auVar219._4_4_;
    auVar203._8_4_ = auVar207._8_4_ * fVar238 + auVar231._8_4_ * fVar242 + fVar250 * auVar219._8_4_;
    auVar203._12_4_ =
         auVar207._12_4_ * fVar252 + auVar231._12_4_ * fVar197 + fVar254 * auVar219._12_4_;
    auVar207 = vblendps_avx(auVar203,_local_5a0,8);
    auVar33 = vsubps_avx(_local_5b0,(undefined1  [16])aVar10);
    auVar231 = vshufps_avx(auVar33,auVar33,0);
    auVar219 = vshufps_avx(auVar33,auVar33,0x55);
    auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
    auVar291._0_4_ = auVar231._0_4_ * fVar227 + auVar219._0_4_ * fVar240 + fVar245 * auVar33._0_4_;
    auVar291._4_4_ = auVar231._4_4_ * fVar226 + auVar219._4_4_ * fVar194 + fVar248 * auVar33._4_4_;
    auVar291._8_4_ = auVar231._8_4_ * fVar238 + auVar219._8_4_ * fVar242 + fVar250 * auVar33._8_4_;
    auVar291._12_4_ =
         auVar231._12_4_ * fVar252 + auVar219._12_4_ * fVar197 + fVar254 * auVar33._12_4_;
    auVar231 = vblendps_avx(auVar291,_local_5b0,8);
    auVar34 = vsubps_avx(_local_590,(undefined1  [16])aVar10);
    auVar219 = vshufps_avx(auVar34,auVar34,0xaa);
    auVar33 = vshufps_avx(auVar34,auVar34,0);
    auVar34 = vshufps_avx(auVar34,auVar34,0x55);
    auVar182._0_4_ = auVar33._0_4_ * fVar227 + auVar219._0_4_ * fVar245 + auVar34._0_4_ * fVar240;
    auVar182._4_4_ = auVar33._4_4_ * fVar226 + auVar219._4_4_ * fVar248 + auVar34._4_4_ * fVar194;
    auVar182._8_4_ = auVar33._8_4_ * fVar238 + auVar219._8_4_ * fVar250 + auVar34._8_4_ * fVar242;
    auVar182._12_4_ =
         auVar33._12_4_ * fVar252 + auVar219._12_4_ * fVar254 + auVar34._12_4_ * fVar197;
    auVar219 = vblendps_avx(auVar182,_local_590,8);
    auVar230._8_4_ = 0x7fffffff;
    auVar230._0_8_ = 0x7fffffff7fffffff;
    auVar230._12_4_ = 0x7fffffff;
    auVar386 = vandps_avx(auVar386,auVar230);
    auVar207 = vandps_avx(auVar207,auVar230);
    auVar33 = vmaxps_avx(auVar386,auVar207);
    auVar386 = vandps_avx(auVar231,auVar230);
    auVar207 = vandps_avx(auVar219,auVar230);
    auVar386 = vmaxps_avx(auVar386,auVar207);
    auVar386 = vmaxps_avx(auVar33,auVar386);
    auVar207 = vmovshdup_avx(auVar386);
    auVar207 = vmaxss_avx(auVar207,auVar386);
    auVar386 = vshufpd_avx(auVar386,auVar386,1);
    auVar386 = vmaxss_avx(auVar386,auVar207);
    local_640._0_4_ = auVar386._0_4_;
    local_7d0 = (long)(int)uVar145;
    lVar150 = local_7d0 * 0x44;
    fVar271 = *(float *)(bezier_basis0 + lVar150 + 0x908);
    fVar277 = *(float *)(bezier_basis0 + lVar150 + 0x90c);
    fVar279 = *(float *)(bezier_basis0 + lVar150 + 0x910);
    fVar281 = *(float *)(bezier_basis0 + lVar150 + 0x914);
    fVar283 = *(float *)(bezier_basis0 + lVar150 + 0x918);
    fVar285 = *(float *)(bezier_basis0 + lVar150 + 0x91c);
    fVar287 = *(float *)(bezier_basis0 + lVar150 + 0x920);
    auVar207 = vshufps_avx(auVar291,auVar291,0);
    register0x00001250 = auVar207;
    _local_7c0 = auVar207;
    fVar226 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar150 + 0xd8c);
    fVar238 = *(float *)(bezier_basis0 + lVar150 + 0xd90);
    fVar240 = *(float *)(bezier_basis0 + lVar150 + 0xd94);
    fVar194 = *(float *)(bezier_basis0 + lVar150 + 0xd98);
    fVar197 = *(float *)(bezier_basis0 + lVar150 + 0xd9c);
    fVar245 = *(float *)(bezier_basis0 + lVar150 + 0xda0);
    fVar250 = *(float *)(bezier_basis0 + lVar150 + 0xda4);
    auVar137 = *(undefined1 (*) [28])(bezier_basis0 + lVar150 + 0xd8c);
    auVar231 = vshufps_avx(auVar182,auVar182,0);
    register0x000014d0 = auVar231;
    _local_400 = auVar231;
    fVar342 = auVar231._0_4_;
    fVar349 = auVar231._4_4_;
    fVar350 = auVar231._8_4_;
    fVar351 = auVar231._12_4_;
    fVar180 = auVar207._0_4_;
    fVar195 = auVar207._4_4_;
    fVar196 = auVar207._8_4_;
    fVar198 = auVar207._12_4_;
    auVar207 = vshufps_avx(auVar291,auVar291,0x55);
    register0x000012d0 = auVar207;
    _local_760 = auVar207;
    auVar231 = vshufps_avx(auVar182,auVar182,0x55);
    register0x00001210 = auVar231;
    _local_740 = auVar231;
    fVar227 = auVar231._0_4_;
    fVar252 = auVar231._4_4_;
    fVar242 = auVar231._8_4_;
    fVar248 = auVar231._12_4_;
    fVar216 = auVar207._0_4_;
    fVar223 = auVar207._4_4_;
    fVar224 = auVar207._8_4_;
    fVar225 = auVar207._12_4_;
    auVar36 = _local_5b0;
    auVar207 = vshufps_avx(_local_5b0,_local_5b0,0xff);
    register0x00001390 = auVar207;
    _local_a0 = auVar207;
    auVar231 = vshufps_avx(_local_590,_local_590,0xff);
    register0x00001450 = auVar231;
    _local_c0 = auVar231;
    fVar297 = auVar231._0_4_;
    fVar298 = auVar231._4_4_;
    fVar323 = auVar231._8_4_;
    fVar325 = auVar231._12_4_;
    fVar265 = auVar207._0_4_;
    fVar266 = auVar207._4_4_;
    fVar267 = auVar207._8_4_;
    auVar231 = vshufps_avx(auVar203,auVar203,0);
    register0x00001310 = auVar231;
    _local_780 = auVar231;
    fVar269 = *(float *)(bezier_basis0 + lVar150 + 0x484);
    fVar352 = *(float *)(bezier_basis0 + lVar150 + 0x488);
    fVar288 = *(float *)(bezier_basis0 + lVar150 + 0x48c);
    fVar300 = *(float *)(bezier_basis0 + lVar150 + 0x490);
    fVar244 = *(float *)(bezier_basis0 + lVar150 + 0x494);
    fVar199 = *(float *)(bezier_basis0 + lVar150 + 0x498);
    fVar309 = *(float *)(bezier_basis0 + lVar150 + 0x49c);
    fVar280 = auVar231._0_4_;
    fVar282 = auVar231._4_4_;
    fVar284 = auVar231._8_4_;
    fVar286 = auVar231._12_4_;
    auVar231 = vshufps_avx(auVar203,auVar203,0x55);
    register0x00001290 = auVar231;
    _local_320 = auVar231;
    auVar214 = ZEXT3264(_local_320);
    fVar278 = auVar231._0_4_;
    fStack_41c = auVar231._4_4_;
    fStack_418 = auVar231._8_4_;
    fStack_414 = auVar231._12_4_;
    auVar37 = _local_5a0;
    auVar219 = vshufps_avx(_local_5a0,_local_5a0,0xff);
    register0x000015d0 = auVar219;
    _local_140 = auVar219;
    fVar340 = auVar219._0_4_;
    fVar341 = auVar219._4_4_;
    fVar372 = auVar219._8_4_;
    fVar376 = auVar219._12_4_;
    auVar219 = vshufps_avx(auVar218,auVar218,0);
    register0x00001250 = auVar219;
    _local_6c0 = auVar219;
    pauVar8 = (undefined1 (*) [16])(bezier_basis0 + lVar150);
    fVar254 = *(float *)*pauVar8;
    fVar263 = *(float *)(bezier_basis0 + lVar150 + 4);
    fVar264 = *(float *)(bezier_basis0 + lVar150 + 8);
    auVar310 = *(undefined1 (*) [12])*pauVar8;
    fVar312 = *(float *)(bezier_basis0 + lVar150 + 0xc);
    fStack_370 = *(float *)(bezier_basis0 + lVar150 + 0x10);
    fStack_36c = *(float *)(bezier_basis0 + lVar150 + 0x14);
    fStack_368 = *(float *)(bezier_basis0 + lVar150 + 0x18);
    fVar176 = auVar219._0_4_;
    fVar177 = auVar219._4_4_;
    fVar178 = auVar219._8_4_;
    fVar272 = auVar219._12_4_;
    auVar336._0_4_ = fVar176 * fVar254 + fVar280 * fVar269 + fVar180 * fVar271 + fVar342 * fVar226;
    auVar336._4_4_ = fVar177 * fVar263 + fVar282 * fVar352 + fVar195 * fVar277 + fVar349 * fVar238;
    auVar336._8_4_ = fVar178 * fVar264 + fVar284 * fVar288 + fVar196 * fVar279 + fVar350 * fVar240;
    auVar336._12_4_ = fVar272 * fVar312 + fVar286 * fVar300 + fVar198 * fVar281 + fVar351 * fVar194;
    auVar336._16_4_ =
         fVar176 * fStack_370 + fVar280 * fVar244 + fVar180 * fVar283 + fVar342 * fVar197;
    auVar336._20_4_ =
         fVar177 * fStack_36c + fVar282 * fVar199 + fVar195 * fVar285 + fVar349 * fVar245;
    auVar336._24_4_ =
         fVar178 * fStack_368 + fVar284 * fVar309 + fVar196 * fVar287 + fVar350 * fVar250;
    auVar336._28_4_ = *(float *)(bezier_basis0 + lVar150 + 0x924) + fVar198 + 0.0 + 0.0;
    auVar219 = vshufps_avx(auVar218,auVar218,0x55);
    register0x00001410 = auVar219;
    _local_340 = auVar219;
    fVar299 = auVar219._0_4_;
    fVar308 = auVar219._4_4_;
    fVar311 = auVar219._8_4_;
    fVar313 = auVar219._12_4_;
    auVar367._0_4_ = fVar299 * fVar254 + fVar278 * fVar269 + fVar216 * fVar271 + fVar226 * fVar227;
    auVar367._4_4_ =
         fVar308 * fVar263 + fStack_41c * fVar352 + fVar223 * fVar277 + fVar238 * fVar252;
    auVar367._8_4_ =
         fVar311 * fVar264 + fStack_418 * fVar288 + fVar224 * fVar279 + fVar240 * fVar242;
    auVar367._12_4_ =
         fVar313 * fVar312 + fStack_414 * fVar300 + fVar225 * fVar281 + fVar194 * fVar248;
    auVar367._16_4_ =
         fVar299 * fStack_370 + fVar278 * fVar244 + fVar216 * fVar283 + fVar197 * fVar227;
    auVar367._20_4_ =
         fVar308 * fStack_36c + fStack_41c * fVar199 + fVar223 * fVar285 + fVar245 * fVar252;
    auVar367._24_4_ =
         fVar311 * fStack_368 + fStack_418 * fVar309 + fVar224 * fVar287 + fVar250 * fVar242;
    auVar367._28_4_ = fVar225 + fVar248 + 0.0 + 0.0;
    auVar219 = vpermilps_avx(_local_690,0xff);
    register0x000013d0 = auVar219;
    _local_e0 = auVar219;
    _local_380 = *pauVar8;
    auVar38 = _local_380;
    uStack_364 = *(undefined4 *)(bezier_basis0 + lVar150 + 0x1c);
    fVar268 = auVar219._0_4_;
    fVar289 = auVar219._4_4_;
    fVar296 = auVar219._8_4_;
    local_7a0._0_4_ = fVar265 * fVar271 + fVar297 * fVar226 + fVar340 * fVar269 + fVar268 * fVar254;
    local_7a0._4_4_ = fVar266 * fVar277 + fVar298 * fVar238 + fVar341 * fVar352 + fVar289 * fVar263;
    fStack_798 = fVar267 * fVar279 + fVar323 * fVar240 + fVar372 * fVar288 + fVar296 * fVar264;
    fStack_794 = auVar207._12_4_ * fVar281 + fVar325 * fVar194 + fVar376 * fVar300 +
                 auVar219._12_4_ * fVar312;
    fStack_790 = fVar265 * fVar283 + fVar297 * fVar197 + fVar340 * fVar244 + fVar268 * fStack_370;
    fStack_78c = fVar266 * fVar285 + fVar298 * fVar245 + fVar341 * fVar199 + fVar289 * fStack_36c;
    fStack_788 = fVar267 * fVar287 + fVar323 * fVar250 + fVar372 * fVar309 + fVar296 * fStack_368;
    fStack_784 = 0.0;
    fVar247 = *(float *)(bezier_basis1 + lVar150 + 0x908);
    fVar200 = *(float *)(bezier_basis1 + lVar150 + 0x90c);
    fVar314 = *(float *)(bezier_basis1 + lVar150 + 0x910);
    fVar322 = *(float *)(bezier_basis1 + lVar150 + 0x914);
    fVar324 = *(float *)(bezier_basis1 + lVar150 + 0x918);
    fVar326 = *(float *)(bezier_basis1 + lVar150 + 0x91c);
    fVar327 = *(float *)(bezier_basis1 + lVar150 + 0x920);
    fVar328 = *(float *)(bezier_basis1 + lVar150 + 0xd8c);
    fVar329 = *(float *)(bezier_basis1 + lVar150 + 0xd90);
    fVar201 = *(float *)(bezier_basis1 + lVar150 + 0xd94);
    fVar215 = *(float *)(bezier_basis1 + lVar150 + 0xd98);
    fVar330 = *(float *)(bezier_basis1 + lVar150 + 0xd9c);
    fVar169 = *(float *)(bezier_basis1 + lVar150 + 0xda0);
    fVar171 = *(float *)(bezier_basis1 + lVar150 + 0xda4);
    fVar226 = fVar286 + 0.0;
    fVar173 = *(float *)(bezier_basis1 + lVar150 + 0x484);
    fVar175 = *(float *)(bezier_basis1 + lVar150 + 0x488);
    fVar179 = *(float *)(bezier_basis1 + lVar150 + 0x48c);
    fVar253 = *(float *)(bezier_basis1 + lVar150 + 0x490);
    fVar228 = *(float *)(bezier_basis1 + lVar150 + 0x494);
    fVar239 = *(float *)(bezier_basis1 + lVar150 + 0x498);
    fVar241 = *(float *)(bezier_basis1 + lVar150 + 0x49c);
    fVar238 = fVar226 + fVar286 + 0.0;
    fVar270 = fVar226 + fVar325 + 0.0;
    fVar243 = *(float *)(bezier_basis1 + lVar150);
    fVar246 = *(float *)(bezier_basis1 + lVar150 + 4);
    fVar249 = *(float *)(bezier_basis1 + lVar150 + 8);
    fVar251 = *(float *)(bezier_basis1 + lVar150 + 0xc);
    fVar170 = *(float *)(bezier_basis1 + lVar150 + 0x10);
    fVar172 = *(float *)(bezier_basis1 + lVar150 + 0x14);
    fVar174 = *(float *)(bezier_basis1 + lVar150 + 0x18);
    local_360._0_4_ = fVar176 * fVar243 + fVar280 * fVar173 + fVar247 * fVar180 + fVar342 * fVar328;
    local_360._4_4_ = fVar177 * fVar246 + fVar282 * fVar175 + fVar200 * fVar195 + fVar349 * fVar329;
    local_360._8_4_ = fVar178 * fVar249 + fVar284 * fVar179 + fVar314 * fVar196 + fVar350 * fVar201;
    local_360._12_4_ = fVar272 * fVar251 + fVar286 * fVar253 + fVar322 * fVar198 + fVar351 * fVar215
    ;
    local_360._16_4_ = fVar176 * fVar170 + fVar280 * fVar228 + fVar324 * fVar180 + fVar342 * fVar330
    ;
    local_360._20_4_ = fVar177 * fVar172 + fVar282 * fVar239 + fVar326 * fVar195 + fVar349 * fVar169
    ;
    local_360._24_4_ = fVar178 * fVar174 + fVar284 * fVar241 + fVar327 * fVar196 + fVar350 * fVar171
    ;
    local_360._28_4_ = fVar376 + fVar226 + 0.0;
    local_460._0_4_ = fVar299 * fVar243 + fVar173 * fVar278 + fVar247 * fVar216 + fVar328 * fVar227;
    local_460._4_4_ =
         fVar308 * fVar246 + fVar175 * fStack_41c + fVar200 * fVar223 + fVar329 * fVar252;
    fStack_458 = fVar311 * fVar249 + fVar179 * fStack_418 + fVar314 * fVar224 + fVar201 * fVar242;
    fStack_454 = fVar313 * fVar251 + fVar253 * fStack_414 + fVar322 * fVar225 + fVar215 * fVar248;
    fStack_450 = fVar299 * fVar170 + fVar228 * fVar278 + fVar324 * fVar216 + fVar330 * fVar227;
    fStack_44c = fVar308 * fVar172 + fVar239 * fStack_41c + fVar326 * fVar223 + fVar169 * fVar252;
    fStack_448 = fVar311 * fVar174 + fVar241 * fStack_418 + fVar327 * fVar224 + fVar171 * fVar242;
    register0x0000159c = fVar226 + 0.0 + fVar238;
    local_6e0._0_4_ = fVar268 * fVar243 + fVar340 * fVar173 + fVar265 * fVar247 + fVar297 * fVar328;
    local_6e0._4_4_ = fVar289 * fVar246 + fVar341 * fVar175 + fVar266 * fVar200 + fVar298 * fVar329;
    local_6e0._8_4_ = fVar296 * fVar249 + fVar372 * fVar179 + fVar267 * fVar314 + fVar323 * fVar201;
    local_6e0._12_4_ =
         auVar219._12_4_ * fVar251 +
         fVar376 * fVar253 + auVar207._12_4_ * fVar322 + fVar325 * fVar215;
    local_6e0._16_4_ = fVar268 * fVar170 + fVar340 * fVar228 + fVar265 * fVar324 + fVar297 * fVar330
    ;
    local_6e0._20_4_ = fVar289 * fVar172 + fVar341 * fVar239 + fVar266 * fVar326 + fVar298 * fVar169
    ;
    local_6e0._24_4_ = fVar296 * fVar174 + fVar372 * fVar241 + fVar267 * fVar327 + fVar323 * fVar171
    ;
    local_6e0._28_4_ = fVar238 + fVar270;
    auVar27 = vsubps_avx(local_360,auVar336);
    auVar28 = vsubps_avx(_local_460,auVar367);
    fVar226 = auVar27._0_4_;
    fVar240 = auVar27._4_4_;
    auVar46._4_4_ = auVar367._4_4_ * fVar240;
    auVar46._0_4_ = auVar367._0_4_ * fVar226;
    fVar197 = auVar27._8_4_;
    auVar46._8_4_ = auVar367._8_4_ * fVar197;
    fVar250 = auVar27._12_4_;
    auVar46._12_4_ = auVar367._12_4_ * fVar250;
    fVar263 = auVar27._16_4_;
    auVar46._16_4_ = auVar367._16_4_ * fVar263;
    fVar265 = auVar27._20_4_;
    auVar46._20_4_ = auVar367._20_4_ * fVar265;
    fVar267 = auVar27._24_4_;
    auVar46._24_4_ = auVar367._24_4_ * fVar267;
    auVar46._28_4_ = fVar238;
    fVar238 = auVar28._0_4_;
    fVar194 = auVar28._4_4_;
    auVar47._4_4_ = auVar336._4_4_ * fVar194;
    auVar47._0_4_ = auVar336._0_4_ * fVar238;
    fVar245 = auVar28._8_4_;
    auVar47._8_4_ = auVar336._8_4_ * fVar245;
    fVar254 = auVar28._12_4_;
    auVar47._12_4_ = auVar336._12_4_ * fVar254;
    fVar264 = auVar28._16_4_;
    auVar47._16_4_ = auVar336._16_4_ * fVar264;
    fVar266 = auVar28._20_4_;
    auVar47._20_4_ = auVar336._20_4_ * fVar266;
    fVar268 = auVar28._24_4_;
    auVar47._24_4_ = auVar336._24_4_ * fVar268;
    auVar47._28_4_ = fVar270;
    auVar26 = vsubps_avx(auVar46,auVar47);
    auVar25 = vmaxps_avx(_local_7a0,local_6e0);
    auVar48._4_4_ = auVar25._4_4_ * auVar25._4_4_ * (fVar240 * fVar240 + fVar194 * fVar194);
    auVar48._0_4_ = auVar25._0_4_ * auVar25._0_4_ * (fVar226 * fVar226 + fVar238 * fVar238);
    auVar48._8_4_ = auVar25._8_4_ * auVar25._8_4_ * (fVar197 * fVar197 + fVar245 * fVar245);
    auVar48._12_4_ = auVar25._12_4_ * auVar25._12_4_ * (fVar250 * fVar250 + fVar254 * fVar254);
    auVar48._16_4_ = auVar25._16_4_ * auVar25._16_4_ * (fVar263 * fVar263 + fVar264 * fVar264);
    auVar48._20_4_ = auVar25._20_4_ * auVar25._20_4_ * (fVar265 * fVar265 + fVar266 * fVar266);
    auVar48._24_4_ = auVar25._24_4_ * auVar25._24_4_ * (fVar267 * fVar267 + fVar268 * fVar268);
    auVar48._28_4_ = local_360._28_4_ + fVar270;
    auVar49._4_4_ = auVar26._4_4_ * auVar26._4_4_;
    auVar49._0_4_ = auVar26._0_4_ * auVar26._0_4_;
    auVar49._8_4_ = auVar26._8_4_ * auVar26._8_4_;
    auVar49._12_4_ = auVar26._12_4_ * auVar26._12_4_;
    auVar49._16_4_ = auVar26._16_4_ * auVar26._16_4_;
    auVar49._20_4_ = auVar26._20_4_ * auVar26._20_4_;
    auVar49._24_4_ = auVar26._24_4_ * auVar26._24_4_;
    auVar49._28_4_ = auVar26._28_4_;
    auVar25 = vcmpps_avx(auVar49,auVar48,2);
    auVar256._0_4_ = (float)(int)uVar145;
    auVar256._4_12_ = auVar231._4_12_;
    local_420 = auVar256._0_4_;
    auVar207 = vshufps_avx(auVar256,auVar256,0);
    auVar260._16_16_ = auVar207;
    auVar260._0_16_ = auVar207;
    auVar26 = vcmpps_avx(_DAT_01f7b060,auVar260,1);
    auVar207 = vpermilps_avx(auVar218,0xaa);
    register0x000013d0 = auVar207;
    _local_560 = auVar207;
    auVar231 = vpermilps_avx(auVar203,0xaa);
    register0x00001590 = auVar231;
    _local_300 = auVar231;
    auVar219 = vpermilps_avx(auVar291,0xaa);
    register0x000015d0 = auVar219;
    _local_2e0 = auVar219;
    auVar33 = vpermilps_avx(auVar182,0xaa);
    register0x00001490 = auVar33;
    _local_580 = auVar33;
    auVar29 = auVar26 & auVar25;
    auVar34 = vpermilps_avx((undefined1  [16])aVar10,0xff);
    local_620 = ZEXT1632(auVar34);
    auVar386 = ZEXT416((uint)(auVar386._0_4_ * 4.7683716e-07));
    fVar226 = fVar227;
    fVar238 = fVar252;
    fVar240 = fVar242;
    fVar194 = fVar248;
    fVar197 = fVar180;
    fVar245 = fVar195;
    fVar250 = fVar196;
    fVar254 = fVar216;
    fVar263 = fVar223;
    fVar264 = fVar224;
    if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar29 >> 0x7f,0) == '\0') &&
          (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar29 >> 0xbf,0) == '\0') &&
        (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar29[0x1f]) {
      bVar148 = 0;
      auVar321 = ZEXT3264(_local_780);
      auVar375 = ZEXT3264(_local_6c0);
      local_620._0_16_ = auVar34;
    }
    else {
      local_3a0 = vandps_avx(auVar25,auVar26);
      fVar289 = auVar207._0_4_;
      fVar296 = auVar207._4_4_;
      fVar297 = auVar207._8_4_;
      fVar298 = auVar207._12_4_;
      fVar372 = auVar231._0_4_;
      fVar376 = auVar231._4_4_;
      fVar377 = auVar231._8_4_;
      fVar378 = auVar231._12_4_;
      fVar379 = auVar219._0_4_;
      fVar383 = auVar219._4_4_;
      fVar384 = auVar219._8_4_;
      fVar385 = auVar219._12_4_;
      fVar323 = auVar33._0_4_;
      fVar325 = auVar33._4_4_;
      fVar340 = auVar33._8_4_;
      fVar341 = auVar33._12_4_;
      fVar270 = auVar26._28_4_ + 0.0;
      fVar265 = local_3a0._28_4_ + fVar270;
      local_640._16_16_ = auVar192._16_16_;
      local_640._0_16_ = auVar386;
      local_440 = fVar289 * fVar243 + fVar372 * fVar173 + fVar379 * fVar247 + fVar323 * fVar328;
      fStack_43c = fVar296 * fVar246 + fVar376 * fVar175 + fVar383 * fVar200 + fVar325 * fVar329;
      fStack_438 = fVar297 * fVar249 + fVar377 * fVar179 + fVar384 * fVar314 + fVar340 * fVar201;
      fStack_434 = fVar298 * fVar251 + fVar378 * fVar253 + fVar385 * fVar322 + fVar341 * fVar215;
      fStack_430 = fVar289 * fVar170 + fVar372 * fVar228 + fVar379 * fVar324 + fVar323 * fVar330;
      fStack_42c = fVar296 * fVar172 + fVar376 * fVar239 + fVar383 * fVar326 + fVar325 * fVar169;
      fStack_428 = fVar297 * fVar174 + fVar377 * fVar241 + fVar384 * fVar327 + fVar340 * fVar171;
      fStack_424 = *(float *)(bezier_basis1 + lVar150 + 0x1c) + fVar265;
      local_380._0_4_ = auVar310._0_4_;
      local_380._4_4_ = auVar310._4_4_;
      fStack_378 = auVar310._8_4_;
      local_600._0_4_ = auVar137._0_4_;
      local_600._4_4_ = auVar137._4_4_;
      fStack_5f8 = auVar137._8_4_;
      fStack_5f4 = auVar137._12_4_;
      fStack_5f0 = auVar137._16_4_;
      fStack_5ec = auVar137._20_4_;
      fStack_5e8 = auVar137._24_4_;
      local_5e0 = fVar289 * (float)local_380._0_4_ +
                  fVar372 * fVar269 + fVar379 * fVar271 + fVar323 * (float)local_600._0_4_;
      fStack_5dc = fVar296 * (float)local_380._4_4_ +
                   fVar376 * fVar352 + fVar383 * fVar277 + fVar325 * (float)local_600._4_4_;
      fStack_5d8 = fVar297 * fStack_378 +
                   fVar377 * fVar288 + fVar384 * fVar279 + fVar340 * fStack_5f8;
      fStack_5d4 = fVar298 * fVar312 + fVar378 * fVar300 + fVar385 * fVar281 + fVar341 * fStack_5f4;
      fStack_5d0 = fVar289 * fStack_370 +
                   fVar372 * fVar244 + fVar379 * fVar283 + fVar323 * fStack_5f0;
      fStack_5cc = fVar296 * fStack_36c +
                   fVar376 * fVar199 + fVar383 * fVar285 + fVar325 * fStack_5ec;
      fStack_5c8 = fVar297 * fStack_368 +
                   fVar377 * fVar309 + fVar384 * fVar287 + fVar340 * fStack_5e8;
      fStack_5c4 = fVar313 + fStack_424 + *(float *)(bezier_basis1 + lVar150 + 0x1c) + fVar265;
      fVar265 = *(float *)(bezier_basis0 + lVar150 + 0x1210);
      fVar266 = *(float *)(bezier_basis0 + lVar150 + 0x1214);
      fVar267 = *(float *)(bezier_basis0 + lVar150 + 0x1218);
      fVar268 = *(float *)(bezier_basis0 + lVar150 + 0x121c);
      fVar271 = *(float *)(bezier_basis0 + lVar150 + 0x1220);
      fVar277 = *(float *)(bezier_basis0 + lVar150 + 0x1224);
      fVar279 = *(float *)(bezier_basis0 + lVar150 + 0x1228);
      fVar281 = *(float *)(bezier_basis0 + lVar150 + 0x1694);
      fVar283 = *(float *)(bezier_basis0 + lVar150 + 0x1698);
      fVar285 = *(float *)(bezier_basis0 + lVar150 + 0x169c);
      fVar287 = *(float *)(bezier_basis0 + lVar150 + 0x16a0);
      fVar269 = *(float *)(bezier_basis0 + lVar150 + 0x16a4);
      fVar352 = *(float *)(bezier_basis0 + lVar150 + 0x16a8);
      fVar288 = *(float *)(bezier_basis0 + lVar150 + 0x16ac);
      fVar300 = *(float *)(bezier_basis0 + lVar150 + 0x1b18);
      fVar244 = *(float *)(bezier_basis0 + lVar150 + 0x1b1c);
      fVar199 = *(float *)(bezier_basis0 + lVar150 + 0x1b20);
      fVar309 = *(float *)(bezier_basis0 + lVar150 + 0x1b24);
      fVar312 = *(float *)(bezier_basis0 + lVar150 + 0x1b28);
      fVar247 = *(float *)(bezier_basis0 + lVar150 + 0x1b2c);
      fVar200 = *(float *)(bezier_basis0 + lVar150 + 0x1b30);
      fVar314 = *(float *)(bezier_basis0 + lVar150 + 0x1f9c);
      fVar322 = *(float *)(bezier_basis0 + lVar150 + 0x1fa0);
      fVar324 = *(float *)(bezier_basis0 + lVar150 + 0x1fa4);
      fVar326 = *(float *)(bezier_basis0 + lVar150 + 0x1fa8);
      fVar327 = *(float *)(bezier_basis0 + lVar150 + 0x1fac);
      fVar328 = *(float *)(bezier_basis0 + lVar150 + 0x1fb0);
      fVar329 = *(float *)(bezier_basis0 + lVar150 + 0x1fb4);
      fVar215 = *(float *)(bezier_basis1 + lVar150 + 0x4a0) + fVar298;
      fVar201 = *(float *)(bezier_basis0 + lVar150 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar150 + 0x1fb8);
      fVar330 = *(float *)(bezier_basis0 + lVar150 + 0x16b0) + fVar201;
      local_540 = fVar176 * fVar265 + fVar281 * fVar280 + fVar180 * fVar300 + fVar342 * fVar314;
      fStack_53c = fVar177 * fVar266 + fVar283 * fVar282 + fVar195 * fVar244 + fVar349 * fVar322;
      fStack_538 = fVar178 * fVar267 + fVar285 * fVar284 + fVar196 * fVar199 + fVar350 * fVar324;
      fStack_534 = fVar272 * fVar268 + fVar287 * fVar286 + fVar198 * fVar309 + fVar351 * fVar326;
      fStack_530 = fVar176 * fVar271 + fVar269 * fVar280 + fVar180 * fVar312 + fVar342 * fVar327;
      fStack_52c = fVar177 * fVar277 + fVar352 * fVar282 + fVar195 * fVar247 + fVar349 * fVar328;
      fStack_528 = fVar178 * fVar279 + fVar288 * fVar284 + fVar196 * fVar200 + fVar350 * fVar329;
      fStack_524 = *(float *)(bezier_basis0 + lVar150 + 0x16b0) +
                   *(float *)(bezier_basis0 + lVar150 + 0x1fb8) + fVar215;
      auVar368._0_4_ = fVar299 * fVar265 + fVar278 * fVar281 + fVar216 * fVar300 + fVar227 * fVar314
      ;
      auVar368._4_4_ =
           fVar308 * fVar266 + fStack_41c * fVar283 + fVar223 * fVar244 + fVar252 * fVar322;
      auVar368._8_4_ =
           fVar311 * fVar267 + fStack_418 * fVar285 + fVar224 * fVar199 + fVar242 * fVar324;
      auVar368._12_4_ =
           fVar313 * fVar268 + fStack_414 * fVar287 + fVar225 * fVar309 + fVar248 * fVar326;
      auVar368._16_4_ =
           fVar299 * fVar271 + fVar278 * fVar269 + fVar216 * fVar312 + fVar227 * fVar327;
      auVar368._20_4_ =
           fVar308 * fVar277 + fStack_41c * fVar352 + fVar223 * fVar247 + fVar252 * fVar328;
      auVar368._24_4_ =
           fVar311 * fVar279 + fStack_418 * fVar288 + fVar224 * fVar200 + fVar242 * fVar329;
      auVar368._28_4_ = fVar201 + fVar215 + *(float *)(bezier_basis1 + lVar150 + 0x4a0) + fVar270;
      auVar221._0_4_ = fVar372 * fVar281 + fVar379 * fVar300 + fVar323 * fVar314 + fVar289 * fVar265
      ;
      auVar221._4_4_ = fVar376 * fVar283 + fVar383 * fVar244 + fVar325 * fVar322 + fVar296 * fVar266
      ;
      auVar221._8_4_ = fVar377 * fVar285 + fVar384 * fVar199 + fVar340 * fVar324 + fVar297 * fVar267
      ;
      auVar221._12_4_ =
           fVar378 * fVar287 + fVar385 * fVar309 + fVar341 * fVar326 + fVar298 * fVar268;
      auVar221._16_4_ =
           fVar372 * fVar269 + fVar379 * fVar312 + fVar323 * fVar327 + fVar289 * fVar271;
      auVar221._20_4_ =
           fVar376 * fVar352 + fVar383 * fVar247 + fVar325 * fVar328 + fVar296 * fVar277;
      auVar221._24_4_ =
           fVar377 * fVar288 + fVar384 * fVar200 + fVar340 * fVar329 + fVar297 * fVar279;
      auVar221._28_4_ = fVar330 + *(float *)(bezier_basis0 + lVar150 + 0x122c);
      fVar265 = *(float *)(bezier_basis1 + lVar150 + 0x1b18);
      fVar266 = *(float *)(bezier_basis1 + lVar150 + 0x1b1c);
      fVar267 = *(float *)(bezier_basis1 + lVar150 + 0x1b20);
      fVar268 = *(float *)(bezier_basis1 + lVar150 + 0x1b24);
      fVar271 = *(float *)(bezier_basis1 + lVar150 + 0x1b28);
      fVar277 = *(float *)(bezier_basis1 + lVar150 + 0x1b2c);
      fVar279 = *(float *)(bezier_basis1 + lVar150 + 0x1b30);
      fVar281 = *(float *)(bezier_basis1 + lVar150 + 0x1f9c);
      fVar283 = *(float *)(bezier_basis1 + lVar150 + 0x1fa0);
      fVar285 = *(float *)(bezier_basis1 + lVar150 + 0x1fa4);
      fVar287 = *(float *)(bezier_basis1 + lVar150 + 0x1fa8);
      fVar269 = *(float *)(bezier_basis1 + lVar150 + 0x1fac);
      fVar352 = *(float *)(bezier_basis1 + lVar150 + 0x1fb0);
      fVar288 = *(float *)(bezier_basis1 + lVar150 + 0x1fb4);
      fVar300 = *(float *)(bezier_basis1 + lVar150 + 0x1694);
      fVar244 = *(float *)(bezier_basis1 + lVar150 + 0x1698);
      fVar199 = *(float *)(bezier_basis1 + lVar150 + 0x169c);
      fVar309 = *(float *)(bezier_basis1 + lVar150 + 0x16a0);
      fVar312 = *(float *)(bezier_basis1 + lVar150 + 0x16a4);
      fVar247 = *(float *)(bezier_basis1 + lVar150 + 0x16a8);
      fVar200 = *(float *)(bezier_basis1 + lVar150 + 0x16ac);
      fVar314 = *(float *)(bezier_basis1 + lVar150 + 0x1210);
      fVar322 = *(float *)(bezier_basis1 + lVar150 + 0x1214);
      fVar324 = *(float *)(bezier_basis1 + lVar150 + 0x1218);
      fVar326 = *(float *)(bezier_basis1 + lVar150 + 0x121c);
      fVar327 = *(float *)(bezier_basis1 + lVar150 + 0x1220);
      fVar328 = *(float *)(bezier_basis1 + lVar150 + 0x1224);
      fVar329 = *(float *)(bezier_basis1 + lVar150 + 0x1228);
      auVar304._0_4_ = fVar176 * fVar314 + fVar300 * fVar280 + fVar180 * fVar265 + fVar342 * fVar281
      ;
      auVar304._4_4_ = fVar177 * fVar322 + fVar244 * fVar282 + fVar195 * fVar266 + fVar349 * fVar283
      ;
      auVar304._8_4_ = fVar178 * fVar324 + fVar199 * fVar284 + fVar196 * fVar267 + fVar350 * fVar285
      ;
      auVar304._12_4_ =
           fVar272 * fVar326 + fVar309 * fVar286 + fVar198 * fVar268 + fVar351 * fVar287;
      auVar304._16_4_ =
           fVar176 * fVar327 + fVar312 * fVar280 + fVar180 * fVar271 + fVar342 * fVar269;
      auVar304._20_4_ =
           fVar177 * fVar328 + fVar247 * fVar282 + fVar195 * fVar277 + fVar349 * fVar352;
      auVar304._24_4_ =
           fVar178 * fVar329 + fVar200 * fVar284 + fVar196 * fVar279 + fVar350 * fVar288;
      auVar304._28_4_ = fVar225 + fVar225 + fVar330 + fVar351;
      auVar318._0_4_ = fVar299 * fVar314 + fVar278 * fVar300 + fVar216 * fVar265 + fVar227 * fVar281
      ;
      auVar318._4_4_ =
           fVar308 * fVar322 + fStack_41c * fVar244 + fVar223 * fVar266 + fVar252 * fVar283;
      auVar318._8_4_ =
           fVar311 * fVar324 + fStack_418 * fVar199 + fVar224 * fVar267 + fVar242 * fVar285;
      auVar318._12_4_ =
           fVar313 * fVar326 + fStack_414 * fVar309 + fVar225 * fVar268 + fVar248 * fVar287;
      auVar318._16_4_ =
           fVar299 * fVar327 + fVar278 * fVar312 + fVar216 * fVar271 + fVar227 * fVar269;
      auVar318._20_4_ =
           fVar308 * fVar328 + fStack_41c * fVar247 + fVar223 * fVar277 + fVar252 * fVar352;
      auVar318._24_4_ =
           fVar311 * fVar329 + fStack_418 * fVar200 + fVar224 * fVar279 + fVar242 * fVar288;
      auVar318._28_4_ = fVar225 + fVar225 + fVar225 + fVar330;
      auVar233._0_4_ = fVar289 * fVar314 + fVar372 * fVar300 + fVar379 * fVar265 + fVar323 * fVar281
      ;
      auVar233._4_4_ = fVar296 * fVar322 + fVar376 * fVar244 + fVar383 * fVar266 + fVar325 * fVar283
      ;
      auVar233._8_4_ = fVar297 * fVar324 + fVar377 * fVar199 + fVar384 * fVar267 + fVar340 * fVar285
      ;
      auVar233._12_4_ =
           fVar298 * fVar326 + fVar378 * fVar309 + fVar385 * fVar268 + fVar341 * fVar287;
      auVar233._16_4_ =
           fVar289 * fVar327 + fVar372 * fVar312 + fVar379 * fVar271 + fVar323 * fVar269;
      auVar233._20_4_ =
           fVar296 * fVar328 + fVar376 * fVar247 + fVar383 * fVar277 + fVar325 * fVar352;
      auVar233._24_4_ =
           fVar297 * fVar329 + fVar377 * fVar200 + fVar384 * fVar279 + fVar340 * fVar288;
      auVar233._28_4_ =
           *(float *)(bezier_basis1 + lVar150 + 0x122c) +
           *(float *)(bezier_basis1 + lVar150 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar150 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar150 + 0x1fb8);
      auVar211._8_4_ = 0x7fffffff;
      auVar211._0_8_ = 0x7fffffff7fffffff;
      auVar211._12_4_ = 0x7fffffff;
      auVar211._16_4_ = 0x7fffffff;
      auVar211._20_4_ = 0x7fffffff;
      auVar211._24_4_ = 0x7fffffff;
      auVar211._28_4_ = 0x7fffffff;
      auVar131._4_4_ = fStack_53c;
      auVar131._0_4_ = local_540;
      auVar131._8_4_ = fStack_538;
      auVar131._12_4_ = fStack_534;
      auVar131._16_4_ = fStack_530;
      auVar131._20_4_ = fStack_52c;
      auVar131._24_4_ = fStack_528;
      auVar131._28_4_ = fStack_524;
      auVar192 = vandps_avx(auVar131,auVar211);
      auVar25 = vandps_avx(auVar368,auVar211);
      auVar25 = vmaxps_avx(auVar192,auVar25);
      auVar192 = vandps_avx(auVar221,auVar211);
      auVar192 = vmaxps_avx(auVar25,auVar192);
      auVar386 = vpermilps_avx(auVar386,0);
      auVar294._16_16_ = auVar386;
      auVar294._0_16_ = auVar386;
      auVar192 = vcmpps_avx(auVar192,auVar294,1);
      auVar26 = vblendvps_avx(auVar131,auVar27,auVar192);
      auVar29 = vblendvps_avx(auVar368,auVar28,auVar192);
      auVar192 = vandps_avx(auVar304,auVar211);
      auVar25 = vandps_avx(auVar318,auVar211);
      auVar30 = vmaxps_avx(auVar192,auVar25);
      auVar192 = vandps_avx(auVar233,auVar211);
      auVar192 = vmaxps_avx(auVar30,auVar192);
      auVar30 = vcmpps_avx(auVar192,auVar294,1);
      auVar192 = vblendvps_avx(auVar304,auVar27,auVar30);
      auVar27 = vblendvps_avx(auVar318,auVar28,auVar30);
      fVar330 = auVar26._0_4_;
      fVar169 = auVar26._4_4_;
      fVar171 = auVar26._8_4_;
      fVar173 = auVar26._12_4_;
      fVar175 = auVar26._16_4_;
      fVar179 = auVar26._20_4_;
      fVar253 = auVar26._24_4_;
      fVar228 = auVar192._0_4_;
      fVar239 = auVar192._4_4_;
      fVar241 = auVar192._8_4_;
      fVar243 = auVar192._12_4_;
      fVar246 = auVar192._16_4_;
      fVar249 = auVar192._20_4_;
      fVar251 = auVar192._24_4_;
      fVar265 = auVar29._0_4_;
      fVar271 = auVar29._4_4_;
      fVar283 = auVar29._8_4_;
      fVar352 = auVar29._12_4_;
      fVar199 = auVar29._16_4_;
      fVar200 = auVar29._20_4_;
      fVar326 = auVar29._24_4_;
      auVar157._0_4_ = fVar265 * fVar265 + fVar330 * fVar330;
      auVar157._4_4_ = fVar271 * fVar271 + fVar169 * fVar169;
      auVar157._8_4_ = fVar283 * fVar283 + fVar171 * fVar171;
      auVar157._12_4_ = fVar352 * fVar352 + fVar173 * fVar173;
      auVar157._16_4_ = fVar199 * fVar199 + fVar175 * fVar175;
      auVar157._20_4_ = fVar200 * fVar200 + fVar179 * fVar179;
      auVar157._24_4_ = fVar326 * fVar326 + fVar253 * fVar253;
      auVar157._28_4_ = auVar318._28_4_ + auVar26._28_4_;
      auVar26 = vrsqrtps_avx(auVar157);
      fVar266 = auVar26._0_4_;
      fVar267 = auVar26._4_4_;
      auVar50._4_4_ = fVar267 * 1.5;
      auVar50._0_4_ = fVar266 * 1.5;
      fVar268 = auVar26._8_4_;
      auVar50._8_4_ = fVar268 * 1.5;
      fVar277 = auVar26._12_4_;
      auVar50._12_4_ = fVar277 * 1.5;
      fVar279 = auVar26._16_4_;
      auVar50._16_4_ = fVar279 * 1.5;
      fVar281 = auVar26._20_4_;
      auVar50._20_4_ = fVar281 * 1.5;
      fVar285 = auVar26._24_4_;
      auVar50._24_4_ = fVar285 * 1.5;
      auVar50._28_4_ = auVar25._28_4_;
      auVar51._4_4_ = fVar267 * fVar267 * fVar267 * auVar157._4_4_ * 0.5;
      auVar51._0_4_ = fVar266 * fVar266 * fVar266 * auVar157._0_4_ * 0.5;
      auVar51._8_4_ = fVar268 * fVar268 * fVar268 * auVar157._8_4_ * 0.5;
      auVar51._12_4_ = fVar277 * fVar277 * fVar277 * auVar157._12_4_ * 0.5;
      auVar51._16_4_ = fVar279 * fVar279 * fVar279 * auVar157._16_4_ * 0.5;
      auVar51._20_4_ = fVar281 * fVar281 * fVar281 * auVar157._20_4_ * 0.5;
      auVar51._24_4_ = fVar285 * fVar285 * fVar285 * auVar157._24_4_ * 0.5;
      auVar51._28_4_ = auVar157._28_4_;
      auVar26 = vsubps_avx(auVar50,auVar51);
      fVar266 = auVar26._0_4_;
      fVar277 = auVar26._4_4_;
      fVar285 = auVar26._8_4_;
      fVar288 = auVar26._12_4_;
      fVar309 = auVar26._16_4_;
      fVar314 = auVar26._20_4_;
      fVar327 = auVar26._24_4_;
      fVar201 = auVar29._28_4_;
      fVar267 = auVar27._0_4_;
      fVar279 = auVar27._4_4_;
      fVar287 = auVar27._8_4_;
      fVar300 = auVar27._12_4_;
      fVar312 = auVar27._16_4_;
      fVar322 = auVar27._20_4_;
      fVar328 = auVar27._24_4_;
      auVar158._0_4_ = fVar267 * fVar267 + fVar228 * fVar228;
      auVar158._4_4_ = fVar279 * fVar279 + fVar239 * fVar239;
      auVar158._8_4_ = fVar287 * fVar287 + fVar241 * fVar241;
      auVar158._12_4_ = fVar300 * fVar300 + fVar243 * fVar243;
      auVar158._16_4_ = fVar312 * fVar312 + fVar246 * fVar246;
      auVar158._20_4_ = fVar322 * fVar322 + fVar249 * fVar249;
      auVar158._24_4_ = fVar328 * fVar328 + fVar251 * fVar251;
      auVar158._28_4_ = auVar192._28_4_ + auVar26._28_4_;
      auVar192 = vrsqrtps_avx(auVar158);
      fVar268 = auVar192._0_4_;
      fVar281 = auVar192._4_4_;
      auVar52._4_4_ = fVar281 * 1.5;
      auVar52._0_4_ = fVar268 * 1.5;
      fVar269 = auVar192._8_4_;
      auVar52._8_4_ = fVar269 * 1.5;
      fVar244 = auVar192._12_4_;
      auVar52._12_4_ = fVar244 * 1.5;
      fVar247 = auVar192._16_4_;
      auVar52._16_4_ = fVar247 * 1.5;
      fVar324 = auVar192._20_4_;
      auVar52._20_4_ = fVar324 * 1.5;
      fVar329 = auVar192._24_4_;
      auVar52._24_4_ = fVar329 * 1.5;
      auVar52._28_4_ = auVar25._28_4_;
      fVar215 = auVar192._28_4_;
      auVar53._4_4_ = fVar281 * fVar281 * fVar281 * auVar158._4_4_ * 0.5;
      auVar53._0_4_ = fVar268 * fVar268 * fVar268 * auVar158._0_4_ * 0.5;
      auVar53._8_4_ = fVar269 * fVar269 * fVar269 * auVar158._8_4_ * 0.5;
      auVar53._12_4_ = fVar244 * fVar244 * fVar244 * auVar158._12_4_ * 0.5;
      auVar53._16_4_ = fVar247 * fVar247 * fVar247 * auVar158._16_4_ * 0.5;
      auVar53._20_4_ = fVar324 * fVar324 * fVar324 * auVar158._20_4_ * 0.5;
      auVar53._24_4_ = fVar329 * fVar329 * fVar329 * auVar158._24_4_ * 0.5;
      auVar53._28_4_ = auVar158._28_4_;
      auVar192 = vsubps_avx(auVar52,auVar53);
      fVar268 = auVar192._0_4_;
      fVar281 = auVar192._4_4_;
      fVar269 = auVar192._8_4_;
      fVar244 = auVar192._12_4_;
      fVar247 = auVar192._16_4_;
      fVar324 = auVar192._20_4_;
      fVar329 = auVar192._24_4_;
      fVar265 = (float)local_7a0._0_4_ * fVar265 * fVar266;
      fVar271 = (float)local_7a0._4_4_ * fVar271 * fVar277;
      auVar54._4_4_ = fVar271;
      auVar54._0_4_ = fVar265;
      fVar283 = fStack_798 * fVar283 * fVar285;
      auVar54._8_4_ = fVar283;
      fVar352 = fStack_794 * fVar352 * fVar288;
      auVar54._12_4_ = fVar352;
      fVar199 = fStack_790 * fVar199 * fVar309;
      auVar54._16_4_ = fVar199;
      fVar200 = fStack_78c * fVar200 * fVar314;
      auVar54._20_4_ = fVar200;
      fVar326 = fStack_788 * fVar326 * fVar327;
      auVar54._24_4_ = fVar326;
      auVar54._28_4_ = fVar201;
      local_600._4_4_ = auVar336._4_4_ + fVar271;
      local_600._0_4_ = auVar336._0_4_ + fVar265;
      fStack_5f8 = auVar336._8_4_ + fVar283;
      fStack_5f4 = auVar336._12_4_ + fVar352;
      fStack_5f0 = auVar336._16_4_ + fVar199;
      fStack_5ec = auVar336._20_4_ + fVar200;
      fStack_5e8 = auVar336._24_4_ + fVar326;
      fStack_5e4 = auVar336._28_4_ + fVar201;
      fVar265 = (float)local_7a0._0_4_ * fVar266 * -fVar330;
      fVar271 = (float)local_7a0._4_4_ * fVar277 * -fVar169;
      auVar55._4_4_ = fVar271;
      auVar55._0_4_ = fVar265;
      fVar283 = fStack_798 * fVar285 * -fVar171;
      auVar55._8_4_ = fVar283;
      fVar352 = fStack_794 * fVar288 * -fVar173;
      auVar55._12_4_ = fVar352;
      fVar199 = fStack_790 * fVar309 * -fVar175;
      auVar55._16_4_ = fVar199;
      fVar200 = fStack_78c * fVar314 * -fVar179;
      auVar55._20_4_ = fVar200;
      fVar326 = fStack_788 * fVar327 * -fVar253;
      auVar55._24_4_ = fVar326;
      auVar55._28_4_ = 0x3f000000;
      local_520._4_4_ = fVar271 + auVar367._4_4_;
      local_520._0_4_ = fVar265 + auVar367._0_4_;
      fStack_518 = fVar283 + auVar367._8_4_;
      fStack_514 = fVar352 + auVar367._12_4_;
      fStack_510 = fVar199 + auVar367._16_4_;
      fStack_50c = fVar200 + auVar367._20_4_;
      fStack_508 = fVar326 + auVar367._24_4_;
      fStack_504 = auVar367._28_4_ + 0.5;
      fVar265 = (float)local_7a0._0_4_ * fVar266 * 0.0;
      fVar266 = (float)local_7a0._4_4_ * fVar277 * 0.0;
      auVar56._4_4_ = fVar266;
      auVar56._0_4_ = fVar265;
      fVar271 = fStack_798 * fVar285 * 0.0;
      auVar56._8_4_ = fVar271;
      fVar277 = fStack_794 * fVar288 * 0.0;
      auVar56._12_4_ = fVar277;
      fVar283 = fStack_790 * fVar309 * 0.0;
      auVar56._16_4_ = fVar283;
      fVar285 = fStack_78c * fVar314 * 0.0;
      auVar56._20_4_ = fVar285;
      fVar352 = fStack_788 * fVar327 * 0.0;
      auVar56._24_4_ = fVar352;
      auVar56._28_4_ = auVar368._28_4_;
      auVar129._4_4_ = fStack_5dc;
      auVar129._0_4_ = local_5e0;
      auVar129._8_4_ = fStack_5d8;
      auVar129._12_4_ = fStack_5d4;
      auVar129._16_4_ = fStack_5d0;
      auVar129._20_4_ = fStack_5cc;
      auVar129._24_4_ = fStack_5c8;
      auVar129._28_4_ = fStack_5c4;
      auVar305._0_4_ = fVar265 + local_5e0;
      auVar305._4_4_ = fVar266 + fStack_5dc;
      auVar305._8_4_ = fVar271 + fStack_5d8;
      auVar305._12_4_ = fVar277 + fStack_5d4;
      auVar305._16_4_ = fVar283 + fStack_5d0;
      auVar305._20_4_ = fVar285 + fStack_5cc;
      auVar305._24_4_ = fVar352 + fStack_5c8;
      auVar305._28_4_ = auVar368._28_4_ + fStack_5c4;
      fVar265 = (float)local_6e0._0_4_ * fVar267 * fVar268;
      fVar266 = local_6e0._4_4_ * fVar279 * fVar281;
      auVar57._4_4_ = fVar266;
      auVar57._0_4_ = fVar265;
      fVar267 = local_6e0._8_4_ * fVar287 * fVar269;
      auVar57._8_4_ = fVar267;
      fVar271 = local_6e0._12_4_ * fVar300 * fVar244;
      auVar57._12_4_ = fVar271;
      fVar277 = local_6e0._16_4_ * fVar312 * fVar247;
      auVar57._16_4_ = fVar277;
      fVar279 = local_6e0._20_4_ * fVar322 * fVar324;
      auVar57._20_4_ = fVar279;
      fVar283 = local_6e0._24_4_ * fVar328 * fVar329;
      auVar57._24_4_ = fVar283;
      auVar57._28_4_ = auVar27._28_4_;
      auVar28 = vsubps_avx(auVar336,auVar54);
      auVar337._0_4_ = local_360._0_4_ + fVar265;
      auVar337._4_4_ = local_360._4_4_ + fVar266;
      auVar337._8_4_ = local_360._8_4_ + fVar267;
      auVar337._12_4_ = local_360._12_4_ + fVar271;
      auVar337._16_4_ = local_360._16_4_ + fVar277;
      auVar337._20_4_ = local_360._20_4_ + fVar279;
      auVar337._24_4_ = local_360._24_4_ + fVar283;
      auVar337._28_4_ = local_360._28_4_ + auVar27._28_4_;
      fVar265 = (float)local_6e0._0_4_ * -fVar228 * fVar268;
      fVar266 = local_6e0._4_4_ * -fVar239 * fVar281;
      auVar58._4_4_ = fVar266;
      auVar58._0_4_ = fVar265;
      fVar267 = local_6e0._8_4_ * -fVar241 * fVar269;
      auVar58._8_4_ = fVar267;
      fVar271 = local_6e0._12_4_ * -fVar243 * fVar244;
      auVar58._12_4_ = fVar271;
      fVar277 = local_6e0._16_4_ * -fVar246 * fVar247;
      auVar58._16_4_ = fVar277;
      fVar279 = local_6e0._20_4_ * -fVar249 * fVar324;
      auVar58._20_4_ = fVar279;
      fVar283 = local_6e0._24_4_ * -fVar251 * fVar329;
      auVar58._24_4_ = fVar283;
      auVar58._28_4_ = fVar201;
      auVar32 = vsubps_avx(auVar367,auVar55);
      auVar374._0_4_ = (float)local_460._0_4_ + fVar265;
      auVar374._4_4_ = (float)local_460._4_4_ + fVar266;
      auVar374._8_4_ = fStack_458 + fVar267;
      auVar374._12_4_ = fStack_454 + fVar271;
      auVar374._16_4_ = fStack_450 + fVar277;
      auVar374._20_4_ = fStack_44c + fVar279;
      auVar374._24_4_ = fStack_448 + fVar283;
      auVar374._28_4_ = register0x0000159c + fVar201;
      fVar265 = fVar268 * 0.0 * (float)local_6e0._0_4_;
      fVar266 = fVar281 * 0.0 * local_6e0._4_4_;
      auVar59._4_4_ = fVar266;
      auVar59._0_4_ = fVar265;
      fVar267 = fVar269 * 0.0 * local_6e0._8_4_;
      auVar59._8_4_ = fVar267;
      fVar268 = fVar244 * 0.0 * local_6e0._12_4_;
      auVar59._12_4_ = fVar268;
      fVar271 = fVar247 * 0.0 * local_6e0._16_4_;
      auVar59._16_4_ = fVar271;
      fVar277 = fVar324 * 0.0 * local_6e0._20_4_;
      auVar59._20_4_ = fVar277;
      fVar279 = fVar329 * 0.0 * local_6e0._24_4_;
      auVar59._24_4_ = fVar279;
      auVar59._28_4_ = fVar215;
      auVar30 = vsubps_avx(auVar129,auVar56);
      auVar133._4_4_ = fStack_43c;
      auVar133._0_4_ = local_440;
      auVar133._8_4_ = fStack_438;
      auVar133._12_4_ = fStack_434;
      auVar133._16_4_ = fStack_430;
      auVar133._20_4_ = fStack_42c;
      auVar133._24_4_ = fStack_428;
      auVar133._28_4_ = fStack_424;
      auVar381._0_4_ = local_440 + fVar265;
      auVar381._4_4_ = fStack_43c + fVar266;
      auVar381._8_4_ = fStack_438 + fVar267;
      auVar381._12_4_ = fStack_434 + fVar268;
      auVar381._16_4_ = fStack_430 + fVar271;
      auVar381._20_4_ = fStack_42c + fVar277;
      auVar381._24_4_ = fStack_428 + fVar279;
      auVar381._28_4_ = fStack_424 + fVar215;
      auVar192 = vsubps_avx(local_360,auVar57);
      auVar25 = vsubps_avx(_local_460,auVar58);
      auVar26 = vsubps_avx(auVar133,auVar59);
      auVar27 = vsubps_avx(auVar374,auVar32);
      auVar29 = vsubps_avx(auVar381,auVar30);
      auVar60._4_4_ = auVar30._4_4_ * auVar27._4_4_;
      auVar60._0_4_ = auVar30._0_4_ * auVar27._0_4_;
      auVar60._8_4_ = auVar30._8_4_ * auVar27._8_4_;
      auVar60._12_4_ = auVar30._12_4_ * auVar27._12_4_;
      auVar60._16_4_ = auVar30._16_4_ * auVar27._16_4_;
      auVar60._20_4_ = auVar30._20_4_ * auVar27._20_4_;
      auVar60._24_4_ = auVar30._24_4_ * auVar27._24_4_;
      auVar60._28_4_ = fVar215;
      auVar61._4_4_ = auVar32._4_4_ * auVar29._4_4_;
      auVar61._0_4_ = auVar32._0_4_ * auVar29._0_4_;
      auVar61._8_4_ = auVar32._8_4_ * auVar29._8_4_;
      auVar61._12_4_ = auVar32._12_4_ * auVar29._12_4_;
      auVar61._16_4_ = auVar32._16_4_ * auVar29._16_4_;
      auVar61._20_4_ = auVar32._20_4_ * auVar29._20_4_;
      auVar61._24_4_ = auVar32._24_4_ * auVar29._24_4_;
      auVar61._28_4_ = register0x0000159c;
      auVar31 = vsubps_avx(auVar61,auVar60);
      auVar62._4_4_ = auVar28._4_4_ * auVar29._4_4_;
      auVar62._0_4_ = auVar28._0_4_ * auVar29._0_4_;
      auVar62._8_4_ = auVar28._8_4_ * auVar29._8_4_;
      auVar62._12_4_ = auVar28._12_4_ * auVar29._12_4_;
      auVar62._16_4_ = auVar28._16_4_ * auVar29._16_4_;
      auVar62._20_4_ = auVar28._20_4_ * auVar29._20_4_;
      auVar62._24_4_ = auVar28._24_4_ * auVar29._24_4_;
      auVar62._28_4_ = auVar29._28_4_;
      auVar24 = vsubps_avx(auVar337,auVar28);
      auVar63._4_4_ = auVar30._4_4_ * auVar24._4_4_;
      auVar63._0_4_ = auVar30._0_4_ * auVar24._0_4_;
      auVar63._8_4_ = auVar30._8_4_ * auVar24._8_4_;
      auVar63._12_4_ = auVar30._12_4_ * auVar24._12_4_;
      auVar63._16_4_ = auVar30._16_4_ * auVar24._16_4_;
      auVar63._20_4_ = auVar30._20_4_ * auVar24._20_4_;
      auVar63._24_4_ = auVar30._24_4_ * auVar24._24_4_;
      auVar63._28_4_ = local_360._28_4_;
      auVar45 = vsubps_avx(auVar63,auVar62);
      auVar64._4_4_ = auVar32._4_4_ * auVar24._4_4_;
      auVar64._0_4_ = auVar32._0_4_ * auVar24._0_4_;
      auVar64._8_4_ = auVar32._8_4_ * auVar24._8_4_;
      auVar64._12_4_ = auVar32._12_4_ * auVar24._12_4_;
      auVar64._16_4_ = auVar32._16_4_ * auVar24._16_4_;
      auVar64._20_4_ = auVar32._20_4_ * auVar24._20_4_;
      auVar64._24_4_ = auVar32._24_4_ * auVar24._24_4_;
      auVar64._28_4_ = auVar29._28_4_;
      auVar65._4_4_ = auVar28._4_4_ * auVar27._4_4_;
      auVar65._0_4_ = auVar28._0_4_ * auVar27._0_4_;
      auVar65._8_4_ = auVar28._8_4_ * auVar27._8_4_;
      auVar65._12_4_ = auVar28._12_4_ * auVar27._12_4_;
      auVar65._16_4_ = auVar28._16_4_ * auVar27._16_4_;
      auVar65._20_4_ = auVar28._20_4_ * auVar27._20_4_;
      auVar65._24_4_ = auVar28._24_4_ * auVar27._24_4_;
      auVar65._28_4_ = auVar27._28_4_;
      auVar27 = vsubps_avx(auVar65,auVar64);
      auVar159._0_4_ = auVar31._0_4_ * 0.0 + auVar27._0_4_ + auVar45._0_4_ * 0.0;
      auVar159._4_4_ = auVar31._4_4_ * 0.0 + auVar27._4_4_ + auVar45._4_4_ * 0.0;
      auVar159._8_4_ = auVar31._8_4_ * 0.0 + auVar27._8_4_ + auVar45._8_4_ * 0.0;
      auVar159._12_4_ = auVar31._12_4_ * 0.0 + auVar27._12_4_ + auVar45._12_4_ * 0.0;
      auVar159._16_4_ = auVar31._16_4_ * 0.0 + auVar27._16_4_ + auVar45._16_4_ * 0.0;
      auVar159._20_4_ = auVar31._20_4_ * 0.0 + auVar27._20_4_ + auVar45._20_4_ * 0.0;
      auVar159._24_4_ = auVar31._24_4_ * 0.0 + auVar27._24_4_ + auVar45._24_4_ * 0.0;
      auVar159._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar45._28_4_;
      auVar31 = vcmpps_avx(auVar159,ZEXT832(0) << 0x20,2);
      local_4e0 = vblendvps_avx(auVar192,_local_600,auVar31);
      _local_500 = vblendvps_avx(auVar25,_local_520,auVar31);
      auVar192 = vblendvps_avx(auVar26,auVar305,auVar31);
      auVar25 = vblendvps_avx(auVar28,auVar337,auVar31);
      auVar26 = vblendvps_avx(auVar32,auVar374,auVar31);
      auVar27 = vblendvps_avx(auVar30,auVar381,auVar31);
      auVar28 = vblendvps_avx(auVar337,auVar28,auVar31);
      auVar29 = vblendvps_avx(auVar374,auVar32,auVar31);
      auVar386 = vpackssdw_avx(local_3a0._0_16_,local_3a0._16_16_);
      auVar30 = vblendvps_avx(auVar381,auVar30,auVar31);
      auVar28 = vsubps_avx(auVar28,local_4e0);
      auVar29 = vsubps_avx(auVar29,_local_500);
      auVar30 = vsubps_avx(auVar30,auVar192);
      auVar24 = vsubps_avx(_local_500,auVar26);
      fVar265 = auVar29._0_4_;
      fVar179 = auVar192._0_4_;
      fVar277 = auVar29._4_4_;
      fVar253 = auVar192._4_4_;
      auVar66._4_4_ = fVar253 * fVar277;
      auVar66._0_4_ = fVar179 * fVar265;
      fVar287 = auVar29._8_4_;
      fVar228 = auVar192._8_4_;
      auVar66._8_4_ = fVar228 * fVar287;
      fVar244 = auVar29._12_4_;
      fVar239 = auVar192._12_4_;
      auVar66._12_4_ = fVar239 * fVar244;
      fVar200 = auVar29._16_4_;
      fVar241 = auVar192._16_4_;
      auVar66._16_4_ = fVar241 * fVar200;
      fVar327 = auVar29._20_4_;
      fVar243 = auVar192._20_4_;
      auVar66._20_4_ = fVar243 * fVar327;
      fVar330 = auVar29._24_4_;
      fVar246 = auVar192._24_4_;
      auVar66._24_4_ = fVar246 * fVar330;
      auVar66._28_4_ = local_3a0._28_4_;
      fVar266 = local_500._0_4_;
      fVar178 = auVar30._0_4_;
      fVar279 = local_500._4_4_;
      fVar272 = auVar30._4_4_;
      auVar67._4_4_ = fVar272 * fVar279;
      auVar67._0_4_ = fVar178 * fVar266;
      fVar269 = local_500._8_4_;
      fVar278 = auVar30._8_4_;
      auVar67._8_4_ = fVar278 * fVar269;
      fVar199 = local_500._12_4_;
      fVar280 = auVar30._12_4_;
      auVar67._12_4_ = fVar280 * fVar199;
      fVar314 = local_500._16_4_;
      fVar282 = auVar30._16_4_;
      auVar67._16_4_ = fVar282 * fVar314;
      fVar328 = local_500._20_4_;
      fVar284 = auVar30._20_4_;
      auVar67._20_4_ = fVar284 * fVar328;
      fVar169 = local_500._24_4_;
      fVar286 = auVar30._24_4_;
      uVar149 = auVar32._28_4_;
      auVar67._24_4_ = fVar286 * fVar169;
      auVar67._28_4_ = uVar149;
      auVar32 = vsubps_avx(auVar67,auVar66);
      fVar267 = local_4e0._0_4_;
      fVar281 = local_4e0._4_4_;
      auVar68._4_4_ = fVar272 * fVar281;
      auVar68._0_4_ = fVar178 * fVar267;
      fVar352 = local_4e0._8_4_;
      auVar68._8_4_ = fVar278 * fVar352;
      fVar309 = local_4e0._12_4_;
      auVar68._12_4_ = fVar280 * fVar309;
      fVar322 = local_4e0._16_4_;
      auVar68._16_4_ = fVar282 * fVar322;
      fVar329 = local_4e0._20_4_;
      auVar68._20_4_ = fVar284 * fVar329;
      fVar171 = local_4e0._24_4_;
      auVar68._24_4_ = fVar286 * fVar171;
      auVar68._28_4_ = uVar149;
      fVar268 = auVar28._0_4_;
      fVar283 = auVar28._4_4_;
      auVar69._4_4_ = fVar253 * fVar283;
      auVar69._0_4_ = fVar179 * fVar268;
      fVar288 = auVar28._8_4_;
      auVar69._8_4_ = fVar228 * fVar288;
      fVar312 = auVar28._12_4_;
      auVar69._12_4_ = fVar239 * fVar312;
      fVar324 = auVar28._16_4_;
      auVar69._16_4_ = fVar241 * fVar324;
      fVar201 = auVar28._20_4_;
      auVar69._20_4_ = fVar243 * fVar201;
      fVar173 = auVar28._24_4_;
      auVar69._24_4_ = fVar246 * fVar173;
      auVar69._28_4_ = auVar374._28_4_;
      auVar45 = vsubps_avx(auVar69,auVar68);
      auVar70._4_4_ = fVar279 * fVar283;
      auVar70._0_4_ = fVar266 * fVar268;
      auVar70._8_4_ = fVar269 * fVar288;
      auVar70._12_4_ = fVar199 * fVar312;
      auVar70._16_4_ = fVar314 * fVar324;
      auVar70._20_4_ = fVar328 * fVar201;
      auVar70._24_4_ = fVar169 * fVar173;
      auVar70._28_4_ = uVar149;
      auVar71._4_4_ = fVar281 * fVar277;
      auVar71._0_4_ = fVar267 * fVar265;
      auVar71._8_4_ = fVar352 * fVar287;
      auVar71._12_4_ = fVar309 * fVar244;
      auVar71._16_4_ = fVar322 * fVar200;
      auVar71._20_4_ = fVar329 * fVar327;
      auVar71._24_4_ = fVar171 * fVar330;
      auVar71._28_4_ = auVar381._28_4_;
      auVar155 = vsubps_avx(auVar71,auVar70);
      auVar156 = vsubps_avx(auVar192,auVar27);
      fVar271 = auVar155._28_4_ + auVar45._28_4_;
      auVar234._0_4_ = auVar155._0_4_ + auVar45._0_4_ * 0.0 + auVar32._0_4_ * 0.0;
      auVar234._4_4_ = auVar155._4_4_ + auVar45._4_4_ * 0.0 + auVar32._4_4_ * 0.0;
      auVar234._8_4_ = auVar155._8_4_ + auVar45._8_4_ * 0.0 + auVar32._8_4_ * 0.0;
      auVar234._12_4_ = auVar155._12_4_ + auVar45._12_4_ * 0.0 + auVar32._12_4_ * 0.0;
      auVar234._16_4_ = auVar155._16_4_ + auVar45._16_4_ * 0.0 + auVar32._16_4_ * 0.0;
      auVar234._20_4_ = auVar155._20_4_ + auVar45._20_4_ * 0.0 + auVar32._20_4_ * 0.0;
      auVar234._24_4_ = auVar155._24_4_ + auVar45._24_4_ * 0.0 + auVar32._24_4_ * 0.0;
      auVar234._28_4_ = fVar271 + 0.0;
      fVar249 = auVar24._0_4_;
      fVar251 = auVar24._4_4_;
      auVar72._4_4_ = fVar251 * auVar27._4_4_;
      auVar72._0_4_ = fVar249 * auVar27._0_4_;
      fVar170 = auVar24._8_4_;
      auVar72._8_4_ = fVar170 * auVar27._8_4_;
      fVar172 = auVar24._12_4_;
      auVar72._12_4_ = fVar172 * auVar27._12_4_;
      fVar174 = auVar24._16_4_;
      auVar72._16_4_ = fVar174 * auVar27._16_4_;
      fVar176 = auVar24._20_4_;
      auVar72._20_4_ = fVar176 * auVar27._20_4_;
      fVar177 = auVar24._24_4_;
      auVar72._24_4_ = fVar177 * auVar27._24_4_;
      auVar72._28_4_ = fVar271;
      fVar271 = auVar156._0_4_;
      fVar285 = auVar156._4_4_;
      auVar73._4_4_ = auVar26._4_4_ * fVar285;
      auVar73._0_4_ = auVar26._0_4_ * fVar271;
      fVar300 = auVar156._8_4_;
      auVar73._8_4_ = auVar26._8_4_ * fVar300;
      fVar247 = auVar156._12_4_;
      auVar73._12_4_ = auVar26._12_4_ * fVar247;
      fVar326 = auVar156._16_4_;
      auVar73._16_4_ = auVar26._16_4_ * fVar326;
      fVar215 = auVar156._20_4_;
      auVar73._20_4_ = auVar26._20_4_ * fVar215;
      fVar175 = auVar156._24_4_;
      auVar73._24_4_ = auVar26._24_4_ * fVar175;
      auVar73._28_4_ = auVar155._28_4_;
      auVar192 = vsubps_avx(auVar73,auVar72);
      auVar32 = vsubps_avx(local_4e0,auVar25);
      fVar270 = auVar32._0_4_;
      fVar289 = auVar32._4_4_;
      auVar74._4_4_ = fVar289 * auVar27._4_4_;
      auVar74._0_4_ = fVar270 * auVar27._0_4_;
      fVar296 = auVar32._8_4_;
      auVar74._8_4_ = fVar296 * auVar27._8_4_;
      fVar299 = auVar32._12_4_;
      auVar74._12_4_ = fVar299 * auVar27._12_4_;
      fVar308 = auVar32._16_4_;
      auVar74._16_4_ = fVar308 * auVar27._16_4_;
      fVar311 = auVar32._20_4_;
      auVar74._20_4_ = fVar311 * auVar27._20_4_;
      fVar313 = auVar32._24_4_;
      auVar74._24_4_ = fVar313 * auVar27._24_4_;
      auVar74._28_4_ = auVar27._28_4_;
      auVar75._4_4_ = auVar25._4_4_ * fVar285;
      auVar75._0_4_ = auVar25._0_4_ * fVar271;
      auVar75._8_4_ = auVar25._8_4_ * fVar300;
      auVar75._12_4_ = auVar25._12_4_ * fVar247;
      auVar75._16_4_ = auVar25._16_4_ * fVar326;
      auVar75._20_4_ = auVar25._20_4_ * fVar215;
      auVar75._24_4_ = auVar25._24_4_ * fVar175;
      auVar75._28_4_ = 0;
      auVar32 = vsubps_avx(auVar74,auVar75);
      auVar76._4_4_ = auVar26._4_4_ * fVar289;
      auVar76._0_4_ = auVar26._0_4_ * fVar270;
      auVar76._8_4_ = auVar26._8_4_ * fVar296;
      auVar76._12_4_ = auVar26._12_4_ * fVar299;
      auVar76._16_4_ = auVar26._16_4_ * fVar308;
      auVar76._20_4_ = auVar26._20_4_ * fVar311;
      auVar76._24_4_ = auVar26._24_4_ * fVar313;
      auVar76._28_4_ = auVar27._28_4_;
      auVar77._4_4_ = auVar25._4_4_ * fVar251;
      auVar77._0_4_ = auVar25._0_4_ * fVar249;
      auVar77._8_4_ = auVar25._8_4_ * fVar170;
      auVar77._12_4_ = auVar25._12_4_ * fVar172;
      auVar77._16_4_ = auVar25._16_4_ * fVar174;
      auVar77._20_4_ = auVar25._20_4_ * fVar176;
      auVar77._24_4_ = auVar25._24_4_ * fVar177;
      auVar77._28_4_ = auVar25._28_4_;
      auVar25 = vsubps_avx(auVar77,auVar76);
      auVar212._0_4_ = auVar192._0_4_ * 0.0 + auVar25._0_4_ + auVar32._0_4_ * 0.0;
      auVar212._4_4_ = auVar192._4_4_ * 0.0 + auVar25._4_4_ + auVar32._4_4_ * 0.0;
      auVar212._8_4_ = auVar192._8_4_ * 0.0 + auVar25._8_4_ + auVar32._8_4_ * 0.0;
      auVar212._12_4_ = auVar192._12_4_ * 0.0 + auVar25._12_4_ + auVar32._12_4_ * 0.0;
      auVar212._16_4_ = auVar192._16_4_ * 0.0 + auVar25._16_4_ + auVar32._16_4_ * 0.0;
      auVar212._20_4_ = auVar192._20_4_ * 0.0 + auVar25._20_4_ + auVar32._20_4_ * 0.0;
      auVar212._24_4_ = auVar192._24_4_ * 0.0 + auVar25._24_4_ + auVar32._24_4_ * 0.0;
      auVar212._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar32._28_4_;
      auVar214 = ZEXT3264(auVar212);
      auVar192 = vmaxps_avx(auVar234,auVar212);
      auVar192 = vcmpps_avx(auVar192,ZEXT832(0) << 0x20,2);
      auVar207 = vpackssdw_avx(auVar192._0_16_,auVar192._16_16_);
      auVar386 = vpand_avx(auVar386,auVar207);
      auVar207 = vpmovsxwd_avx(auVar386);
      auVar231 = vpunpckhwd_avx(auVar386,auVar386);
      auVar160._16_16_ = auVar231;
      auVar160._0_16_ = auVar207;
      if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar160 >> 0x7f,0) == '\0') &&
            (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar231 >> 0x3f,0) == '\0') &&
          (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar231[0xf]
         ) {
LAB_00b1192d:
        auVar193 = ZEXT3264(CONCAT824(uStack_468,
                                      CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
        auVar168 = ZEXT3264(local_4a0);
        auVar307 = ZEXT3264(local_4c0);
      }
      else {
        auVar78._4_4_ = fVar285 * fVar277;
        auVar78._0_4_ = fVar271 * fVar265;
        auVar78._8_4_ = fVar300 * fVar287;
        auVar78._12_4_ = fVar247 * fVar244;
        auVar78._16_4_ = fVar326 * fVar200;
        auVar78._20_4_ = fVar215 * fVar327;
        auVar78._24_4_ = fVar175 * fVar330;
        auVar78._28_4_ = auVar231._12_4_;
        auVar358._0_4_ = fVar249 * fVar178;
        auVar358._4_4_ = fVar251 * fVar272;
        auVar358._8_4_ = fVar170 * fVar278;
        auVar358._12_4_ = fVar172 * fVar280;
        auVar358._16_4_ = fVar174 * fVar282;
        auVar358._20_4_ = fVar176 * fVar284;
        auVar358._24_4_ = fVar177 * fVar286;
        auVar358._28_4_ = 0;
        auVar25 = vsubps_avx(auVar358,auVar78);
        auVar79._4_4_ = fVar289 * fVar272;
        auVar79._0_4_ = fVar270 * fVar178;
        auVar79._8_4_ = fVar296 * fVar278;
        auVar79._12_4_ = fVar299 * fVar280;
        auVar79._16_4_ = fVar308 * fVar282;
        auVar79._20_4_ = fVar311 * fVar284;
        auVar79._24_4_ = fVar313 * fVar286;
        auVar79._28_4_ = auVar30._28_4_;
        auVar80._4_4_ = fVar285 * fVar283;
        auVar80._0_4_ = fVar271 * fVar268;
        auVar80._8_4_ = fVar300 * fVar288;
        auVar80._12_4_ = fVar247 * fVar312;
        auVar80._16_4_ = fVar326 * fVar324;
        auVar80._20_4_ = fVar215 * fVar201;
        auVar80._24_4_ = fVar175 * fVar173;
        auVar80._28_4_ = auVar156._28_4_;
        auVar26 = vsubps_avx(auVar80,auVar79);
        auVar81._4_4_ = fVar251 * fVar283;
        auVar81._0_4_ = fVar249 * fVar268;
        auVar81._8_4_ = fVar170 * fVar288;
        auVar81._12_4_ = fVar172 * fVar312;
        auVar81._16_4_ = fVar174 * fVar324;
        auVar81._20_4_ = fVar176 * fVar201;
        auVar81._24_4_ = fVar177 * fVar173;
        auVar81._28_4_ = auVar28._28_4_;
        auVar82._4_4_ = fVar289 * fVar277;
        auVar82._0_4_ = fVar270 * fVar265;
        auVar82._8_4_ = fVar296 * fVar287;
        auVar82._12_4_ = fVar299 * fVar244;
        auVar82._16_4_ = fVar308 * fVar200;
        auVar82._20_4_ = fVar311 * fVar327;
        auVar82._24_4_ = fVar313 * fVar330;
        auVar82._28_4_ = auVar29._28_4_;
        auVar27 = vsubps_avx(auVar82,auVar81);
        auVar295._0_4_ = auVar25._0_4_ * 0.0 + auVar27._0_4_ + auVar26._0_4_ * 0.0;
        auVar295._4_4_ = auVar25._4_4_ * 0.0 + auVar27._4_4_ + auVar26._4_4_ * 0.0;
        auVar295._8_4_ = auVar25._8_4_ * 0.0 + auVar27._8_4_ + auVar26._8_4_ * 0.0;
        auVar295._12_4_ = auVar25._12_4_ * 0.0 + auVar27._12_4_ + auVar26._12_4_ * 0.0;
        auVar295._16_4_ = auVar25._16_4_ * 0.0 + auVar27._16_4_ + auVar26._16_4_ * 0.0;
        auVar295._20_4_ = auVar25._20_4_ * 0.0 + auVar27._20_4_ + auVar26._20_4_ * 0.0;
        auVar295._24_4_ = auVar25._24_4_ * 0.0 + auVar27._24_4_ + auVar26._24_4_ * 0.0;
        auVar295._28_4_ = auVar29._28_4_ + auVar27._28_4_ + auVar28._28_4_;
        auVar192 = vrcpps_avx(auVar295);
        fVar268 = auVar192._0_4_;
        fVar271 = auVar192._4_4_;
        auVar83._4_4_ = auVar295._4_4_ * fVar271;
        auVar83._0_4_ = auVar295._0_4_ * fVar268;
        fVar277 = auVar192._8_4_;
        auVar83._8_4_ = auVar295._8_4_ * fVar277;
        fVar283 = auVar192._12_4_;
        auVar83._12_4_ = auVar295._12_4_ * fVar283;
        fVar285 = auVar192._16_4_;
        auVar83._16_4_ = auVar295._16_4_ * fVar285;
        fVar287 = auVar192._20_4_;
        auVar83._20_4_ = auVar295._20_4_ * fVar287;
        fVar288 = auVar192._24_4_;
        auVar83._24_4_ = auVar295._24_4_ * fVar288;
        auVar83._28_4_ = auVar156._28_4_;
        auVar359._8_4_ = 0x3f800000;
        auVar359._0_8_ = 0x3f8000003f800000;
        auVar359._12_4_ = 0x3f800000;
        auVar359._16_4_ = 0x3f800000;
        auVar359._20_4_ = 0x3f800000;
        auVar359._24_4_ = 0x3f800000;
        auVar359._28_4_ = 0x3f800000;
        auVar192 = vsubps_avx(auVar359,auVar83);
        fVar268 = auVar192._0_4_ * fVar268 + fVar268;
        fVar271 = auVar192._4_4_ * fVar271 + fVar271;
        fVar277 = auVar192._8_4_ * fVar277 + fVar277;
        fVar283 = auVar192._12_4_ * fVar283 + fVar283;
        fVar285 = auVar192._16_4_ * fVar285 + fVar285;
        fVar287 = auVar192._20_4_ * fVar287 + fVar287;
        fVar288 = auVar192._24_4_ * fVar288 + fVar288;
        auVar189._0_4_ =
             (auVar25._0_4_ * fVar267 + auVar26._0_4_ * fVar266 + auVar27._0_4_ * fVar179) * fVar268
        ;
        auVar189._4_4_ =
             (auVar25._4_4_ * fVar281 + auVar26._4_4_ * fVar279 + auVar27._4_4_ * fVar253) * fVar271
        ;
        auVar189._8_4_ =
             (auVar25._8_4_ * fVar352 + auVar26._8_4_ * fVar269 + auVar27._8_4_ * fVar228) * fVar277
        ;
        auVar189._12_4_ =
             (auVar25._12_4_ * fVar309 + auVar26._12_4_ * fVar199 + auVar27._12_4_ * fVar239) *
             fVar283;
        auVar189._16_4_ =
             (auVar25._16_4_ * fVar322 + auVar26._16_4_ * fVar314 + auVar27._16_4_ * fVar241) *
             fVar285;
        auVar189._20_4_ =
             (auVar25._20_4_ * fVar329 + auVar26._20_4_ * fVar328 + auVar27._20_4_ * fVar243) *
             fVar287;
        auVar189._24_4_ =
             (auVar25._24_4_ * fVar171 + auVar26._24_4_ * fVar169 + auVar27._24_4_ * fVar246) *
             fVar288;
        auVar189._28_4_ = 0;
        auVar161._16_16_ = auVar34;
        auVar161._0_16_ = auVar34;
        auVar192 = vcmpps_avx(auVar161,auVar189,2);
        fVar265 = ray->tfar;
        auVar235._4_4_ = fVar265;
        auVar235._0_4_ = fVar265;
        auVar235._8_4_ = fVar265;
        auVar235._12_4_ = fVar265;
        auVar235._16_4_ = fVar265;
        auVar235._20_4_ = fVar265;
        auVar235._24_4_ = fVar265;
        auVar235._28_4_ = fVar265;
        auVar25 = vcmpps_avx(auVar189,auVar235,2);
        auVar192 = vandps_avx(auVar25,auVar192);
        auVar207 = vpackssdw_avx(auVar192._0_16_,auVar192._16_16_);
        auVar386 = vpand_avx(auVar386,auVar207);
        auVar207 = vpmovsxwd_avx(auVar386);
        auVar231 = vpshufd_avx(auVar386,0xee);
        auVar231 = vpmovsxwd_avx(auVar231);
        auVar162._16_16_ = auVar231;
        auVar162._0_16_ = auVar207;
        if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar162 >> 0x7f,0) == '\0') &&
              (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar231 >> 0x3f,0) == '\0') &&
            (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar231[0xf]) goto LAB_00b1192d;
        auVar192 = vcmpps_avx(ZEXT832(0) << 0x20,auVar295,4);
        auVar207 = vpackssdw_avx(auVar192._0_16_,auVar192._16_16_);
        auVar386 = vpand_avx(auVar386,auVar207);
        auVar207 = vpmovsxwd_avx(auVar386);
        auVar386 = vpunpckhwd_avx(auVar386,auVar386);
        auVar261._16_16_ = auVar386;
        auVar261._0_16_ = auVar207;
        auVar193 = ZEXT3264(CONCAT824(uStack_468,
                                      CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
        auVar168 = ZEXT3264(local_4a0);
        auVar307 = ZEXT3264(local_4c0);
        if ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar261 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar261 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar261 >> 0x7f,0) != '\0') ||
              (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar386 >> 0x3f,0) != '\0') ||
            (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar386[0xf] < '\0') {
          auVar163._0_4_ = auVar234._0_4_ * fVar268;
          auVar163._4_4_ = auVar234._4_4_ * fVar271;
          auVar163._8_4_ = auVar234._8_4_ * fVar277;
          auVar163._12_4_ = auVar234._12_4_ * fVar283;
          auVar163._16_4_ = auVar234._16_4_ * fVar285;
          auVar163._20_4_ = auVar234._20_4_ * fVar287;
          auVar163._24_4_ = auVar234._24_4_ * fVar288;
          auVar163._28_4_ = 0;
          auVar84._4_4_ = auVar212._4_4_ * fVar271;
          auVar84._0_4_ = auVar212._0_4_ * fVar268;
          auVar84._8_4_ = auVar212._8_4_ * fVar277;
          auVar84._12_4_ = auVar212._12_4_ * fVar283;
          auVar84._16_4_ = auVar212._16_4_ * fVar285;
          auVar84._20_4_ = auVar212._20_4_ * fVar287;
          auVar84._24_4_ = auVar212._24_4_ * fVar288;
          auVar84._28_4_ = auVar212._28_4_;
          auVar214 = ZEXT3264(auVar84);
          auVar274._8_4_ = 0x3f800000;
          auVar274._0_8_ = 0x3f8000003f800000;
          auVar274._12_4_ = 0x3f800000;
          auVar274._16_4_ = 0x3f800000;
          auVar274._20_4_ = 0x3f800000;
          auVar274._24_4_ = 0x3f800000;
          auVar274._28_4_ = 0x3f800000;
          auVar192 = vsubps_avx(auVar274,auVar163);
          auVar192 = vblendvps_avx(auVar192,auVar163,auVar31);
          auVar168 = ZEXT3264(auVar192);
          auVar192 = vsubps_avx(auVar274,auVar84);
          _local_3c0 = vblendvps_avx(auVar192,auVar84,auVar31);
          auVar193 = ZEXT3264(auVar261);
          auVar307 = ZEXT3264(auVar189);
        }
      }
      auVar375 = ZEXT3264(_local_6c0);
      auVar321 = ZEXT3264(_local_780);
      local_4a0 = auVar168._0_32_;
      local_4c0 = auVar307._0_32_;
      auVar192 = auVar193._0_32_;
      if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar192 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar192 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar192 >> 0x7f,0) == '\0') &&
            (auVar193 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar192 >> 0xbf,0) == '\0') &&
          (auVar193 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar193[0x1f]) {
        bVar148 = 0;
        _local_690 = auVar35;
        _local_5b0 = auVar36;
        _local_5a0 = auVar37;
      }
      else {
        auVar25 = vsubps_avx(local_6e0,_local_7a0);
        fVar266 = (float)local_7a0._0_4_ + auVar25._0_4_ * auVar168._0_4_;
        fVar267 = (float)local_7a0._4_4_ + auVar25._4_4_ * auVar168._4_4_;
        fVar268 = fStack_798 + auVar25._8_4_ * auVar168._8_4_;
        fVar271 = fStack_794 + auVar25._12_4_ * auVar168._12_4_;
        fVar277 = fStack_790 + auVar25._16_4_ * auVar168._16_4_;
        fVar279 = fStack_78c + auVar25._20_4_ * auVar168._20_4_;
        fVar281 = fStack_788 + auVar25._24_4_ * auVar168._24_4_;
        fVar283 = auVar25._28_4_ + 0.0;
        fVar265 = local_718->depth_scale;
        auVar85._4_4_ = (fVar267 + fVar267) * fVar265;
        auVar85._0_4_ = (fVar266 + fVar266) * fVar265;
        auVar85._8_4_ = (fVar268 + fVar268) * fVar265;
        auVar85._12_4_ = (fVar271 + fVar271) * fVar265;
        auVar85._16_4_ = (fVar277 + fVar277) * fVar265;
        auVar85._20_4_ = (fVar279 + fVar279) * fVar265;
        auVar85._24_4_ = (fVar281 + fVar281) * fVar265;
        auVar85._28_4_ = fVar283 + fVar283;
        auVar25 = vcmpps_avx(local_4c0,auVar85,6);
        auVar26 = auVar192 & auVar25;
        if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0x7f,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar26 >> 0xbf,0) == '\0') &&
            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar26[0x1f]) {
          bVar148 = 0;
          _local_690 = auVar35;
          _local_5b0 = auVar36;
          _local_5a0 = auVar37;
        }
        else {
          local_200 = vandps_avx(auVar25,auVar192);
          local_2a0._0_4_ = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
          local_2a0._4_4_ = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
          fStack_298 = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
          fStack_294 = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
          fStack_290 = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
          fStack_28c = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
          fStack_288 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
          fStack_284 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
          local_2c0 = local_4a0;
          local_280 = local_4c0;
          local_260 = 0;
          local_25c = uVar145;
          local_250 = local_690;
          uStack_248 = uStack_688;
          local_240 = local_5a0;
          uStack_238 = uStack_598;
          local_230 = local_5b0;
          uStack_228 = uStack_5a8;
          auVar214 = ZEXT1664(_local_590);
          local_220 = _local_590;
          local_3c0._4_4_ = local_2a0._4_4_;
          local_3c0._0_4_ = local_2a0._0_4_;
          uStack_3b8._0_4_ = fStack_298;
          uStack_3b8._4_4_ = fStack_294;
          uStack_3b0._0_4_ = fStack_290;
          uStack_3b0._4_4_ = fStack_28c;
          auVar184 = _local_3c0;
          uStack_3a8._0_4_ = fStack_288;
          uStack_3a8._4_4_ = fStack_284;
          auVar192 = _local_3c0;
          auVar25 = local_4c0;
          auVar26 = local_4a0;
          _local_690 = auVar35;
          _local_5b0 = auVar36;
          _local_5a0 = auVar37;
          if ((pGVar20->mask & ray->mask) != 0) {
            if ((local_7d8->args->filter == (RTCFilterFunctionN)0x0) &&
               (bVar148 = 1, pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0))
            goto LAB_00b10b5a;
            auVar204._0_4_ = 1.0 / auVar256._0_4_;
            auVar204._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar386 = vshufps_avx(auVar204,auVar204,0);
            auVar214 = ZEXT3264(CONCAT1616(auVar386,auVar386));
            local_1e0[0] = auVar386._0_4_ * (auVar168._0_4_ + 0.0);
            local_1e0[1] = auVar386._4_4_ * (auVar168._4_4_ + 1.0);
            local_1e0[2] = auVar386._8_4_ * (auVar168._8_4_ + 2.0);
            local_1e0[3] = auVar386._12_4_ * (auVar168._12_4_ + 3.0);
            fStack_1d0 = auVar386._0_4_ * (auVar168._16_4_ + 4.0);
            fStack_1cc = auVar386._4_4_ * (auVar168._20_4_ + 5.0);
            fStack_1c8 = auVar386._8_4_ * (auVar168._24_4_ + 6.0);
            fStack_1c4 = auVar168._28_4_ + 7.0;
            uStack_3b0 = auVar184._16_8_;
            uStack_3a8 = auVar192._24_8_;
            local_1c0 = local_3c0;
            uStack_1b8 = uStack_3b8;
            uStack_1b0 = uStack_3b0;
            uStack_1a8 = uStack_3a8;
            local_1a0 = local_4c0;
            uVar149 = vmovmskps_avx(local_200);
            uVar142 = CONCAT44((int)((ulong)local_7d8->args >> 0x20),uVar149);
            uVar144 = 0;
            if (uVar142 != 0) {
              for (; (uVar142 >> uVar144 & 1) == 0; uVar144 = uVar144 + 1) {
              }
            }
            _local_3c0 = auVar192;
            _local_380 = auVar38;
            while( true ) {
              auVar25 = auVar307._0_32_;
              auVar26 = auVar168._0_32_;
              auVar34 = local_620._0_16_;
              if (uVar142 == 0) break;
              local_7a0 = (undefined1  [8])uVar142;
              local_674 = local_1e0[uVar144];
              local_670 = *(undefined4 *)((long)&local_1c0 + uVar144 * 4);
              local_6e0._0_4_ = ray->tfar;
              ray->tfar = *(float *)(local_1a0 + uVar144 * 4);
              local_710.context = local_7d8->user;
              fVar226 = 1.0 - local_674;
              fVar227 = local_674 * fVar226 + local_674 * fVar226;
              auVar386 = ZEXT416((uint)(local_674 * local_674 * 3.0));
              auVar386 = vshufps_avx(auVar386,auVar386,0);
              auVar207 = ZEXT416((uint)((fVar227 - local_674 * local_674) * 3.0));
              auVar207 = vshufps_avx(auVar207,auVar207,0);
              auVar231 = ZEXT416((uint)((fVar226 * fVar226 - fVar227) * 3.0));
              auVar231 = vshufps_avx(auVar231,auVar231,0);
              auVar219 = ZEXT416((uint)(fVar226 * fVar226 * -3.0));
              auVar219 = vshufps_avx(auVar219,auVar219,0);
              auVar205._0_4_ =
                   auVar219._0_4_ * (float)local_690._0_4_ +
                   auVar231._0_4_ * (float)local_5a0._0_4_ +
                   auVar386._0_4_ * (float)local_590._0_4_ + auVar207._0_4_ * (float)local_5b0._0_4_
              ;
              auVar205._4_4_ =
                   auVar219._4_4_ * (float)local_690._4_4_ +
                   auVar231._4_4_ * (float)local_5a0._4_4_ +
                   auVar386._4_4_ * (float)local_590._4_4_ + auVar207._4_4_ * (float)local_5b0._4_4_
              ;
              auVar205._8_4_ =
                   auVar219._8_4_ * (float)uStack_688 +
                   auVar231._8_4_ * (float)uStack_598 +
                   auVar386._8_4_ * fStack_588 + auVar207._8_4_ * (float)uStack_5a8;
              auVar205._12_4_ =
                   auVar219._12_4_ * uStack_688._4_4_ +
                   auVar231._12_4_ * uStack_598._4_4_ +
                   auVar386._12_4_ * fStack_584 + auVar207._12_4_ * uStack_5a8._4_4_;
              auVar214 = ZEXT1664(auVar205);
              local_680 = vmovlps_avx(auVar205);
              local_678 = vextractps_avx(auVar205,2);
              local_66c = (int)local_648;
              local_668 = (int)local_720;
              local_664 = (local_710.context)->instID[0];
              local_660 = (local_710.context)->instPrimID[0];
              local_7dc = -1;
              local_710.valid = &local_7dc;
              local_710.geometryUserPtr = pGVar20->userPtr;
              local_710.ray = (RTCRayN *)ray;
              local_710.hit = (RTCHitN *)&local_680;
              local_710.N = 1;
              if (pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b10a92:
                p_Var23 = local_7d8->args->filter;
                if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                   (((local_7d8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar214 = ZEXT1664(auVar214._0_16_);
                  (*p_Var23)(&local_710);
                  if (*local_710.valid == 0) goto LAB_00b10ad6;
                }
                bVar148 = 1;
                auVar321 = ZEXT3264(_local_780);
                auVar375 = ZEXT3264(_local_6c0);
                fVar227 = (float)local_740._0_4_;
                fVar252 = (float)local_740._4_4_;
                fVar242 = fStack_738;
                fVar248 = fStack_734;
                fVar226 = fStack_730;
                fVar238 = fStack_72c;
                fVar240 = fStack_728;
                fVar194 = fStack_724;
                fVar180 = (float)local_7c0._0_4_;
                fVar195 = (float)local_7c0._4_4_;
                fVar196 = fStack_7b8;
                fVar198 = fStack_7b4;
                fVar197 = fStack_7b0;
                fVar245 = fStack_7ac;
                fVar250 = fStack_7a8;
                fVar216 = (float)local_760._0_4_;
                fVar223 = (float)local_760._4_4_;
                fVar224 = fStack_758;
                fVar225 = fStack_754;
                fVar254 = fStack_750;
                fVar263 = fStack_74c;
                fVar264 = fStack_748;
                auVar34 = local_620._0_16_;
                goto LAB_00b10b5a;
              }
              auVar214 = ZEXT1664(auVar205);
              (*pGVar20->occlusionFilterN)(&local_710);
              if (*local_710.valid != 0) goto LAB_00b10a92;
LAB_00b10ad6:
              ray->tfar = (float)local_6e0._0_4_;
              uVar142 = (ulong)local_7a0 ^ 1L << (uVar144 & 0x3f);
              uVar144 = 0;
              if (uVar142 != 0) {
                for (; (uVar142 >> uVar144 & 1) == 0; uVar144 = uVar144 + 1) {
                }
              }
              auVar168 = ZEXT3264(local_4a0);
              auVar307 = ZEXT3264(local_4c0);
              auVar321 = ZEXT3264(_local_780);
              auVar375 = ZEXT3264(_local_6c0);
              fVar227 = (float)local_740._0_4_;
              fVar252 = (float)local_740._4_4_;
              fVar242 = fStack_738;
              fVar248 = fStack_734;
              fVar226 = fStack_730;
              fVar238 = fStack_72c;
              fVar240 = fStack_728;
              fVar194 = fStack_724;
              fVar216 = (float)local_760._0_4_;
              fVar223 = (float)local_760._4_4_;
              fVar224 = fStack_758;
              fVar225 = fStack_754;
              fVar254 = fStack_750;
              fVar263 = fStack_74c;
              fVar264 = fStack_748;
            }
          }
          local_620._0_16_ = auVar34;
          local_4a0 = auVar26;
          local_4c0 = auVar25;
          bVar148 = 0;
          fVar180 = (float)local_7c0._0_4_;
          fVar195 = (float)local_7c0._4_4_;
          fVar196 = fStack_7b8;
          fVar198 = fStack_7b4;
          fVar197 = fStack_7b0;
          fVar245 = fStack_7ac;
          fVar250 = fStack_7a8;
          auVar34 = local_620._0_16_;
        }
      }
LAB_00b10b5a:
      local_620._0_16_ = auVar34;
      auVar386 = local_640._0_16_;
    }
    auVar193 = ZEXT1664(auVar386);
    if (8 < (int)uVar145) {
      _local_380 = vpshufd_avx(ZEXT416(uVar145),0);
      auVar386 = vshufps_avx(auVar386,auVar386,0);
      local_3a0._16_16_ = auVar386;
      local_3a0._0_16_ = auVar386;
      local_100 = local_620._0_8_;
      uStack_f8 = local_620._8_8_;
      uStack_f0 = local_620._0_8_;
      uStack_e8 = local_620._8_8_;
      auVar154._0_4_ = 1.0 / local_420;
      auVar154._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar386 = vshufps_avx(auVar154,auVar154,0);
      register0x00001210 = auVar386;
      _local_120 = auVar386;
      auVar168 = ZEXT3264(_local_120);
      for (lVar151 = 8; lVar151 < local_7d0; lVar151 = lVar151 + 8) {
        pauVar9 = (undefined1 (*) [28])(bezier_basis0 + lVar151 * 4 + lVar150);
        fVar265 = *(float *)*pauVar9;
        fVar266 = *(float *)(*pauVar9 + 4);
        fVar267 = *(float *)(*pauVar9 + 8);
        fVar268 = *(float *)(*pauVar9 + 0xc);
        fVar271 = *(float *)(*pauVar9 + 0x10);
        fVar277 = *(float *)(*pauVar9 + 0x14);
        fVar279 = *(float *)(*pauVar9 + 0x18);
        auVar139 = *pauVar9;
        pauVar9 = (undefined1 (*) [28])(lVar150 + 0x21fb768 + lVar151 * 4);
        fVar281 = *(float *)*pauVar9;
        fVar283 = *(float *)(*pauVar9 + 4);
        fVar285 = *(float *)(*pauVar9 + 8);
        fVar287 = *(float *)(*pauVar9 + 0xc);
        fVar269 = *(float *)(*pauVar9 + 0x10);
        fVar352 = *(float *)(*pauVar9 + 0x14);
        fVar288 = *(float *)(*pauVar9 + 0x18);
        auVar138 = *pauVar9;
        pfVar1 = (float *)(lVar150 + 0x21fbbec + lVar151 * 4);
        fVar300 = *pfVar1;
        fVar244 = pfVar1[1];
        fVar199 = pfVar1[2];
        fVar309 = pfVar1[3];
        fVar312 = pfVar1[4];
        fVar247 = pfVar1[5];
        fVar200 = pfVar1[6];
        pauVar9 = (undefined1 (*) [28])(lVar150 + 0x21fc070 + lVar151 * 4);
        fVar314 = *(float *)*pauVar9;
        fVar322 = *(float *)(*pauVar9 + 4);
        fVar324 = *(float *)(*pauVar9 + 8);
        fVar326 = *(float *)(*pauVar9 + 0xc);
        fVar327 = *(float *)(*pauVar9 + 0x10);
        fVar328 = *(float *)(*pauVar9 + 0x14);
        fVar329 = *(float *)(*pauVar9 + 0x18);
        auVar137 = *pauVar9;
        fVar201 = *(float *)pauVar9[1];
        fVar215 = fVar201 + auVar214._28_4_;
        fStack_784 = fVar201 + fVar201 + auVar168._28_4_;
        fVar228 = auVar375._0_4_;
        fVar239 = auVar375._4_4_;
        fVar241 = auVar375._8_4_;
        fVar243 = auVar375._12_4_;
        fVar246 = auVar375._16_4_;
        fVar249 = auVar375._20_4_;
        fVar251 = auVar375._24_4_;
        local_640._0_4_ =
             fVar228 * fVar265 +
             auVar321._0_4_ * fVar281 + fVar300 * fVar180 + (float)local_400._0_4_ * fVar314;
        local_640._4_4_ =
             fVar239 * fVar266 +
             auVar321._4_4_ * fVar283 + fVar244 * fVar195 + (float)local_400._4_4_ * fVar322;
        local_640._8_4_ =
             fVar241 * fVar267 + auVar321._8_4_ * fVar285 + fVar199 * fVar196 + fStack_3f8 * fVar324
        ;
        local_640._12_4_ =
             fVar243 * fVar268 +
             auVar321._12_4_ * fVar287 + fVar309 * fVar198 + fStack_3f4 * fVar326;
        local_640._16_4_ =
             fVar246 * fVar271 +
             auVar321._16_4_ * fVar269 + fVar312 * fVar197 + fStack_3f0 * fVar327;
        local_640._20_4_ =
             fVar249 * fVar277 +
             auVar321._20_4_ * fVar352 + fVar247 * fVar245 + fStack_3ec * fVar328;
        local_640._24_4_ =
             fVar251 * fVar279 +
             auVar321._24_4_ * fVar288 + fVar200 * fVar250 + fStack_3e8 * fVar329;
        local_640._28_4_ = fVar215 + fStack_784;
        auVar213._0_4_ =
             fVar281 * (float)local_320._0_4_ + fVar216 * fVar300 + fVar227 * fVar314 +
             (float)local_340._0_4_ * fVar265;
        auVar213._4_4_ =
             fVar283 * (float)local_320._4_4_ + fVar223 * fVar244 + fVar252 * fVar322 +
             (float)local_340._4_4_ * fVar266;
        auVar213._8_4_ =
             fVar285 * fStack_318 + fVar224 * fVar199 + fVar242 * fVar324 + fStack_338 * fVar267;
        auVar213._12_4_ =
             fVar287 * fStack_314 + fVar225 * fVar309 + fVar248 * fVar326 + fStack_334 * fVar268;
        auVar213._16_4_ =
             fVar269 * fStack_310 + fVar254 * fVar312 + fVar226 * fVar327 + fStack_330 * fVar271;
        auVar213._20_4_ =
             fVar352 * fStack_30c + fVar263 * fVar247 + fVar238 * fVar328 + fStack_32c * fVar277;
        auVar213._24_4_ =
             fVar288 * fStack_308 + fVar264 * fVar200 + fVar240 * fVar329 + fStack_328 * fVar279;
        auVar213._28_4_ = fVar201 + fVar201 + auVar193._28_4_ + fStack_784;
        auVar214 = ZEXT3264(auVar213);
        local_7a0._0_4_ =
             (float)local_e0._0_4_ * fVar265 +
             fVar281 * (float)local_140._0_4_ +
             (float)local_a0._0_4_ * fVar300 + (float)local_c0._0_4_ * fVar314;
        local_7a0._4_4_ =
             (float)local_e0._4_4_ * fVar266 +
             fVar283 * (float)local_140._4_4_ +
             (float)local_a0._4_4_ * fVar244 + (float)local_c0._4_4_ * fVar322;
        fStack_798 = fStack_d8 * fVar267 +
                     fVar285 * fStack_138 + fStack_98 * fVar199 + fStack_b8 * fVar324;
        fStack_794 = fStack_d4 * fVar268 +
                     fVar287 * fStack_134 + fStack_94 * fVar309 + fStack_b4 * fVar326;
        fStack_790 = fStack_d0 * fVar271 +
                     fVar269 * fStack_130 + fStack_90 * fVar312 + fStack_b0 * fVar327;
        fStack_78c = fStack_cc * fVar277 +
                     fVar352 * fStack_12c + fStack_8c * fVar247 + fStack_ac * fVar328;
        fStack_788 = fStack_c8 * fVar279 +
                     fVar288 * fStack_128 + fStack_88 * fVar200 + fStack_a8 * fVar329;
        fStack_784 = fStack_784 + fVar201 + fVar215;
        pfVar1 = (float *)(bezier_basis1 + lVar151 * 4 + lVar150);
        fVar281 = *pfVar1;
        fVar283 = pfVar1[1];
        fVar285 = pfVar1[2];
        fVar287 = pfVar1[3];
        fVar269 = pfVar1[4];
        fVar352 = pfVar1[5];
        fVar288 = pfVar1[6];
        pauVar9 = (undefined1 (*) [28])(lVar150 + 0x21fdb88 + lVar151 * 4);
        fVar314 = *(float *)*pauVar9;
        fVar322 = *(float *)(*pauVar9 + 4);
        fVar324 = *(float *)(*pauVar9 + 8);
        fVar326 = *(float *)(*pauVar9 + 0xc);
        fVar327 = *(float *)(*pauVar9 + 0x10);
        fVar328 = *(float *)(*pauVar9 + 0x14);
        fVar329 = *(float *)(*pauVar9 + 0x18);
        auVar140 = *pauVar9;
        auVar192 = *(undefined1 (*) [32])(lVar150 + 0x21fe00c + lVar151 * 4);
        auVar168 = ZEXT3264(auVar192);
        pfVar2 = (float *)(lVar150 + 0x21fe490 + lVar151 * 4);
        fVar201 = *pfVar2;
        fVar215 = pfVar2[1];
        fVar330 = pfVar2[2];
        fVar169 = pfVar2[3];
        fVar171 = pfVar2[4];
        fVar173 = pfVar2[5];
        fVar175 = pfVar2[6];
        fVar179 = pfVar2[7];
        fVar265 = auVar192._0_4_;
        fVar266 = auVar192._4_4_;
        fVar267 = auVar192._8_4_;
        fVar268 = auVar192._12_4_;
        fVar271 = auVar192._16_4_;
        fVar277 = auVar192._20_4_;
        fVar279 = auVar192._24_4_;
        fVar253 = fVar179 + fVar179 + fStack_3e4;
        auVar275._0_4_ =
             fVar228 * fVar281 +
             fVar314 * auVar321._0_4_ + fVar180 * fVar265 + (float)local_400._0_4_ * fVar201;
        auVar275._4_4_ =
             fVar239 * fVar283 +
             fVar322 * auVar321._4_4_ + fVar195 * fVar266 + (float)local_400._4_4_ * fVar215;
        auVar275._8_4_ =
             fVar241 * fVar285 + fVar324 * auVar321._8_4_ + fVar196 * fVar267 + fStack_3f8 * fVar330
        ;
        auVar275._12_4_ =
             fVar243 * fVar287 +
             fVar326 * auVar321._12_4_ + fVar198 * fVar268 + fStack_3f4 * fVar169;
        auVar275._16_4_ =
             fVar246 * fVar269 +
             fVar327 * auVar321._16_4_ + fVar197 * fVar271 + fStack_3f0 * fVar171;
        auVar275._20_4_ =
             fVar249 * fVar352 +
             fVar328 * auVar321._20_4_ + fVar245 * fVar277 + fStack_3ec * fVar173;
        auVar275._24_4_ =
             fVar251 * fVar288 +
             fVar329 * auVar321._24_4_ + fVar250 * fVar279 + fStack_3e8 * fVar175;
        auVar275._28_4_ = fStack_a4 + fVar179 + fVar253;
        local_4e0._0_4_ =
             fVar281 * (float)local_340._0_4_ +
             (float)local_320._0_4_ * fVar314 + fVar216 * fVar265 + fVar227 * fVar201;
        local_4e0._4_4_ =
             fVar283 * (float)local_340._4_4_ +
             (float)local_320._4_4_ * fVar322 + fVar223 * fVar266 + fVar252 * fVar215;
        local_4e0._8_4_ =
             fVar285 * fStack_338 + fStack_318 * fVar324 + fVar224 * fVar267 + fVar242 * fVar330;
        local_4e0._12_4_ =
             fVar287 * fStack_334 + fStack_314 * fVar326 + fVar225 * fVar268 + fVar248 * fVar169;
        local_4e0._16_4_ =
             fVar269 * fStack_330 + fStack_310 * fVar327 + fVar254 * fVar271 + fVar226 * fVar171;
        local_4e0._20_4_ =
             fVar352 * fStack_32c + fStack_30c * fVar328 + fVar263 * fVar277 + fVar238 * fVar173;
        local_4e0._24_4_ =
             fVar288 * fStack_328 + fStack_308 * fVar329 + fVar264 * fVar279 + fVar240 * fVar175;
        local_4e0._28_4_ = fVar253 + fVar179 + fVar179 + fVar194;
        auVar369._0_4_ =
             fVar314 * (float)local_140._0_4_ +
             (float)local_c0._0_4_ * fVar201 + (float)local_a0._0_4_ * fVar265 +
             (float)local_e0._0_4_ * fVar281;
        auVar369._4_4_ =
             fVar322 * (float)local_140._4_4_ +
             (float)local_c0._4_4_ * fVar215 + (float)local_a0._4_4_ * fVar266 +
             (float)local_e0._4_4_ * fVar283;
        auVar369._8_4_ =
             fVar324 * fStack_138 + fStack_b8 * fVar330 + fStack_98 * fVar267 + fStack_d8 * fVar285;
        auVar369._12_4_ =
             fVar326 * fStack_134 + fStack_b4 * fVar169 + fStack_94 * fVar268 + fStack_d4 * fVar287;
        auVar369._16_4_ =
             fVar327 * fStack_130 + fStack_b0 * fVar171 + fStack_90 * fVar271 + fStack_d0 * fVar269;
        auVar369._20_4_ =
             fVar328 * fStack_12c + fStack_ac * fVar173 + fStack_8c * fVar277 + fStack_cc * fVar352;
        auVar369._24_4_ =
             fVar329 * fStack_128 + fStack_a8 * fVar175 + fStack_88 * fVar279 + fStack_c8 * fVar288;
        auVar369._28_4_ = fVar179 + fStack_a4 + fVar179 + fVar253;
        auVar26 = vsubps_avx(auVar275,local_640);
        auVar27 = vsubps_avx(local_4e0,auVar213);
        fVar227 = auVar26._0_4_;
        fVar238 = auVar26._4_4_;
        auVar86._4_4_ = auVar213._4_4_ * fVar238;
        auVar86._0_4_ = auVar213._0_4_ * fVar227;
        fVar240 = auVar26._8_4_;
        auVar86._8_4_ = auVar213._8_4_ * fVar240;
        fVar242 = auVar26._12_4_;
        auVar86._12_4_ = auVar213._12_4_ * fVar242;
        fVar245 = auVar26._16_4_;
        auVar86._16_4_ = auVar213._16_4_ * fVar245;
        fVar250 = auVar26._20_4_;
        auVar86._20_4_ = auVar213._20_4_ * fVar250;
        fVar263 = auVar26._24_4_;
        auVar86._24_4_ = auVar213._24_4_ * fVar263;
        auVar86._28_4_ = fVar253;
        fVar226 = auVar27._0_4_;
        fVar252 = auVar27._4_4_;
        auVar87._4_4_ = local_640._4_4_ * fVar252;
        auVar87._0_4_ = (float)local_640._0_4_ * fVar226;
        fVar194 = auVar27._8_4_;
        auVar87._8_4_ = local_640._8_4_ * fVar194;
        fVar197 = auVar27._12_4_;
        auVar87._12_4_ = local_640._12_4_ * fVar197;
        fVar248 = auVar27._16_4_;
        auVar87._16_4_ = local_640._16_4_ * fVar248;
        fVar254 = auVar27._20_4_;
        auVar87._20_4_ = local_640._20_4_ * fVar254;
        fVar264 = auVar27._24_4_;
        auVar87._24_4_ = local_640._24_4_ * fVar264;
        auVar87._28_4_ = local_4e0._28_4_;
        auVar28 = vsubps_avx(auVar86,auVar87);
        auVar25 = vmaxps_avx(_local_7a0,auVar369);
        auVar88._4_4_ = auVar25._4_4_ * auVar25._4_4_ * (fVar238 * fVar238 + fVar252 * fVar252);
        auVar88._0_4_ = auVar25._0_4_ * auVar25._0_4_ * (fVar227 * fVar227 + fVar226 * fVar226);
        auVar88._8_4_ = auVar25._8_4_ * auVar25._8_4_ * (fVar240 * fVar240 + fVar194 * fVar194);
        auVar88._12_4_ = auVar25._12_4_ * auVar25._12_4_ * (fVar242 * fVar242 + fVar197 * fVar197);
        auVar88._16_4_ = auVar25._16_4_ * auVar25._16_4_ * (fVar245 * fVar245 + fVar248 * fVar248);
        auVar88._20_4_ = auVar25._20_4_ * auVar25._20_4_ * (fVar250 * fVar250 + fVar254 * fVar254);
        auVar88._24_4_ = auVar25._24_4_ * auVar25._24_4_ * (fVar263 * fVar263 + fVar264 * fVar264);
        auVar88._28_4_ = auVar275._28_4_ + local_4e0._28_4_;
        auVar89._4_4_ = auVar28._4_4_ * auVar28._4_4_;
        auVar89._0_4_ = auVar28._0_4_ * auVar28._0_4_;
        auVar89._8_4_ = auVar28._8_4_ * auVar28._8_4_;
        auVar89._12_4_ = auVar28._12_4_ * auVar28._12_4_;
        auVar89._16_4_ = auVar28._16_4_ * auVar28._16_4_;
        auVar89._20_4_ = auVar28._20_4_ * auVar28._20_4_;
        auVar89._24_4_ = auVar28._24_4_ * auVar28._24_4_;
        auVar89._28_4_ = auVar28._28_4_;
        local_360 = vcmpps_avx(auVar89,auVar88,2);
        auVar193 = ZEXT3264(local_360);
        local_260 = (uint)lVar151;
        auVar207 = vpshufd_avx(ZEXT416(local_260),0);
        auVar386 = vpor_avx(auVar207,_DAT_01f4ad30);
        auVar207 = vpor_avx(auVar207,_DAT_01f7afa0);
        auVar386 = vpcmpgtd_avx(_local_380,auVar386);
        auVar207 = vpcmpgtd_avx(_local_380,auVar207);
        auVar222._16_16_ = auVar207;
        auVar222._0_16_ = auVar386;
        auVar25 = auVar222 & local_360;
        fVar227 = (float)local_740._0_4_;
        fVar252 = (float)local_740._4_4_;
        fVar242 = fStack_738;
        fVar248 = fStack_734;
        fVar226 = fStack_730;
        fVar238 = fStack_72c;
        fVar240 = fStack_728;
        fVar194 = fStack_724;
        fVar180 = (float)local_7c0._0_4_;
        fVar195 = (float)local_7c0._4_4_;
        fVar196 = fStack_7b8;
        fVar198 = fStack_7b4;
        fVar197 = fStack_7b0;
        fVar245 = fStack_7ac;
        fVar250 = fStack_7a8;
        fVar216 = (float)local_760._0_4_;
        fVar223 = (float)local_760._4_4_;
        fVar224 = fStack_758;
        fVar225 = fStack_754;
        fVar254 = fStack_750;
        fVar263 = fStack_74c;
        fVar264 = fStack_748;
        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0x7f,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar25 >> 0xbf,0) == '\0') &&
            (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar25[0x1f]) {
          auVar321 = ZEXT3264(_local_780);
          auVar375 = ZEXT3264(auVar375._0_32_);
        }
        else {
          local_520._0_4_ = auVar140._0_4_;
          local_520._4_4_ = auVar140._4_4_;
          fStack_518 = auVar140._8_4_;
          fStack_514 = auVar140._12_4_;
          fStack_510 = auVar140._16_4_;
          fStack_50c = auVar140._20_4_;
          fStack_508 = auVar140._24_4_;
          fVar314 = (float)local_300._0_4_ * (float)local_520._0_4_;
          fVar322 = (float)local_300._4_4_ * (float)local_520._4_4_;
          fVar324 = fStack_2f8 * fStack_518;
          fVar326 = fStack_2f4 * fStack_514;
          fVar327 = fStack_2f0 * fStack_510;
          fVar328 = fStack_2ec * fStack_50c;
          fVar329 = fStack_2e8 * fStack_508;
          _local_520 = auVar222;
          local_540 = fVar281 * (float)local_560._0_4_ +
                      fVar314 + (float)local_2e0._0_4_ * fVar265 + (float)local_580._0_4_ * fVar201;
          fStack_53c = fVar283 * (float)local_560._4_4_ +
                       fVar322 + (float)local_2e0._4_4_ * fVar266 + (float)local_580._4_4_ * fVar215
          ;
          fStack_538 = fVar285 * fStack_558 + fVar324 + fStack_2d8 * fVar267 + fStack_578 * fVar330;
          fStack_534 = fVar287 * fStack_554 + fVar326 + fStack_2d4 * fVar268 + fStack_574 * fVar169;
          fStack_530 = fVar269 * fStack_550 + fVar327 + fStack_2d0 * fVar271 + fStack_570 * fVar171;
          fStack_52c = fVar352 * fStack_54c + fVar328 + fStack_2cc * fVar277 + fStack_56c * fVar173;
          fStack_528 = fVar288 * fStack_548 + fVar329 + fStack_2c8 * fVar279 + fStack_568 * fVar175;
          fStack_524 = pfVar1[7] + auVar192._28_4_ + local_360._28_4_ + 0.0;
          local_460._0_4_ = auVar138._0_4_;
          local_460._4_4_ = auVar138._4_4_;
          fStack_458 = auVar138._8_4_;
          fStack_454 = auVar138._12_4_;
          fStack_450 = auVar138._16_4_;
          fStack_44c = auVar138._20_4_;
          fStack_448 = auVar138._24_4_;
          fVar253 = (float)local_300._0_4_ * (float)local_460._0_4_;
          fVar170 = (float)local_300._4_4_ * (float)local_460._4_4_;
          fVar172 = fStack_2f8 * fStack_458;
          fVar174 = fStack_2f4 * fStack_454;
          fVar176 = fStack_2f0 * fStack_450;
          fVar177 = fStack_2ec * fStack_44c;
          fVar178 = fStack_2e8 * fStack_448;
          local_600._0_4_ = auVar137._0_4_;
          local_600._4_4_ = auVar137._4_4_;
          fStack_5f8 = auVar137._8_4_;
          fStack_5f4 = auVar137._12_4_;
          fStack_5f0 = auVar137._16_4_;
          fStack_5ec = auVar137._20_4_;
          fStack_5e8 = auVar137._24_4_;
          fVar272 = (float)local_580._0_4_ * (float)local_600._0_4_;
          fVar278 = (float)local_580._4_4_ * (float)local_600._4_4_;
          fVar280 = fStack_578 * fStack_5f8;
          fVar282 = fStack_574 * fStack_5f4;
          fVar284 = fStack_570 * fStack_5f0;
          fVar286 = fStack_56c * fStack_5ec;
          fVar270 = fStack_568 * fStack_5e8;
          pfVar1 = (float *)(lVar150 + 0x21fcdfc + lVar151 * 4);
          fVar265 = *pfVar1;
          fVar266 = pfVar1[1];
          fVar267 = pfVar1[2];
          fVar268 = pfVar1[3];
          fVar271 = pfVar1[4];
          fVar277 = pfVar1[5];
          fVar279 = pfVar1[6];
          pfVar2 = (float *)(lVar150 + 0x21fd280 + lVar151 * 4);
          fVar281 = *pfVar2;
          fVar283 = pfVar2[1];
          fVar285 = pfVar2[2];
          fVar287 = pfVar2[3];
          fVar269 = pfVar2[4];
          fVar352 = pfVar2[5];
          fVar288 = pfVar2[6];
          _local_460 = auVar369;
          _local_600 = auVar27;
          fVar289 = *(float *)pauVar9[1] + 0.0;
          pfVar3 = (float *)(lVar150 + 0x21fc978 + lVar151 * 4);
          fVar314 = *pfVar3;
          fVar322 = pfVar3[1];
          fVar324 = pfVar3[2];
          fVar326 = pfVar3[3];
          fVar327 = pfVar3[4];
          fVar328 = pfVar3[5];
          fVar329 = pfVar3[6];
          fVar179 = pfVar1[7] + pfVar2[7];
          fStack_404 = pfVar2[7] + fVar289;
          fVar289 = *(float *)pauVar9[1] + auVar369._28_4_ + fVar289;
          pfVar1 = (float *)(lVar150 + 0x21fc4f4 + lVar151 * 4);
          fVar201 = *pfVar1;
          fVar215 = pfVar1[1];
          fVar330 = pfVar1[2];
          fVar169 = pfVar1[3];
          fVar171 = pfVar1[4];
          fVar173 = pfVar1[5];
          fVar175 = pfVar1[6];
          local_440 = fVar228 * fVar201 +
                      (float)local_780._0_4_ * fVar314 +
                      (float)local_7c0._0_4_ * fVar265 + (float)local_400._0_4_ * fVar281;
          fStack_43c = fVar239 * fVar215 +
                       (float)local_780._4_4_ * fVar322 +
                       (float)local_7c0._4_4_ * fVar266 + (float)local_400._4_4_ * fVar283;
          fStack_438 = fVar241 * fVar330 +
                       fStack_778 * fVar324 + fStack_7b8 * fVar267 + fStack_3f8 * fVar285;
          fStack_434 = fVar243 * fVar169 +
                       fStack_774 * fVar326 + fStack_7b4 * fVar268 + fStack_3f4 * fVar287;
          fStack_430 = fVar246 * fVar171 +
                       fStack_770 * fVar327 + fStack_7b0 * fVar271 + fStack_3f0 * fVar269;
          fStack_42c = fVar249 * fVar173 +
                       fStack_76c * fVar328 + fStack_7ac * fVar277 + fStack_3ec * fVar352;
          fStack_428 = fVar251 * fVar175 +
                       fStack_768 * fVar329 + fStack_7a8 * fVar279 + fStack_3e8 * fVar288;
          fStack_424 = fVar179 + fStack_404;
          local_420 = fVar201 * (float)local_340._0_4_ +
                      (float)local_760._0_4_ * fVar265 + (float)local_740._0_4_ * fVar281 +
                      (float)local_320._0_4_ * fVar314;
          fStack_41c = fVar215 * (float)local_340._4_4_ +
                       (float)local_760._4_4_ * fVar266 + (float)local_740._4_4_ * fVar283 +
                       (float)local_320._4_4_ * fVar322;
          fStack_418 = fVar330 * fStack_338 +
                       fStack_758 * fVar267 + fStack_738 * fVar285 + fStack_318 * fVar324;
          fStack_414 = fVar169 * fStack_334 +
                       fStack_754 * fVar268 + fStack_734 * fVar287 + fStack_314 * fVar326;
          fStack_410 = fVar171 * fStack_330 +
                       fStack_750 * fVar271 + fStack_730 * fVar269 + fStack_310 * fVar327;
          fStack_40c = fVar173 * fStack_32c +
                       fStack_74c * fVar277 + fStack_72c * fVar352 + fStack_30c * fVar328;
          fStack_408 = fVar175 * fStack_328 +
                       fStack_748 * fVar279 + fStack_728 * fVar288 + fStack_308 * fVar329;
          fStack_404 = fStack_404 + fVar289;
          auVar370._0_4_ =
               fVar314 * (float)local_300._0_4_ +
               (float)local_2e0._0_4_ * fVar265 + (float)local_580._0_4_ * fVar281 +
               fVar201 * (float)local_560._0_4_;
          auVar370._4_4_ =
               fVar322 * (float)local_300._4_4_ +
               (float)local_2e0._4_4_ * fVar266 + (float)local_580._4_4_ * fVar283 +
               fVar215 * (float)local_560._4_4_;
          auVar370._8_4_ =
               fVar324 * fStack_2f8 + fStack_2d8 * fVar267 + fStack_578 * fVar285 +
               fVar330 * fStack_558;
          auVar370._12_4_ =
               fVar326 * fStack_2f4 + fStack_2d4 * fVar268 + fStack_574 * fVar287 +
               fVar169 * fStack_554;
          auVar370._16_4_ =
               fVar327 * fStack_2f0 + fStack_2d0 * fVar271 + fStack_570 * fVar269 +
               fVar171 * fStack_550;
          auVar370._20_4_ =
               fVar328 * fStack_2ec + fStack_2cc * fVar277 + fStack_56c * fVar352 +
               fVar173 * fStack_54c;
          auVar370._24_4_ =
               fVar329 * fStack_2e8 + fStack_2c8 * fVar279 + fStack_568 * fVar288 +
               fVar175 * fStack_548;
          auVar370._28_4_ = pfVar3[7] + fVar179 + fVar289;
          pfVar1 = (float *)(lVar150 + 0x21ff21c + lVar151 * 4);
          fVar266 = *pfVar1;
          fVar267 = pfVar1[1];
          fVar268 = pfVar1[2];
          fVar271 = pfVar1[3];
          fVar277 = pfVar1[4];
          fVar279 = pfVar1[5];
          fVar281 = pfVar1[6];
          pfVar2 = (float *)(lVar150 + 0x21ff6a0 + lVar151 * 4);
          fVar283 = *pfVar2;
          fVar285 = pfVar2[1];
          fVar287 = pfVar2[2];
          fVar269 = pfVar2[3];
          fVar352 = pfVar2[4];
          fVar288 = pfVar2[5];
          fVar314 = pfVar2[6];
          fVar265 = auVar375._28_4_;
          pfVar3 = (float *)(lVar150 + 0x21fed98 + lVar151 * 4);
          fVar322 = *pfVar3;
          fVar324 = pfVar3[1];
          fVar326 = pfVar3[2];
          fVar327 = pfVar3[3];
          fVar328 = pfVar3[4];
          fVar329 = pfVar3[5];
          fVar201 = pfVar3[6];
          pfVar4 = (float *)(lVar150 + 0x21fe914 + lVar151 * 4);
          fVar215 = *pfVar4;
          fVar330 = pfVar4[1];
          fVar169 = pfVar4[2];
          fVar171 = pfVar4[3];
          fVar173 = pfVar4[4];
          fVar175 = pfVar4[5];
          fVar179 = pfVar4[6];
          auVar319._0_4_ =
               fVar215 * (float)local_6c0._0_4_ +
               (float)local_780._0_4_ * fVar322 +
               (float)local_7c0._0_4_ * fVar266 + (float)local_400._0_4_ * fVar283;
          auVar319._4_4_ =
               fVar330 * (float)local_6c0._4_4_ +
               (float)local_780._4_4_ * fVar324 +
               (float)local_7c0._4_4_ * fVar267 + (float)local_400._4_4_ * fVar285;
          auVar319._8_4_ =
               fVar169 * fStack_6b8 +
               fStack_778 * fVar326 + fStack_7b8 * fVar268 + fStack_3f8 * fVar287;
          auVar319._12_4_ =
               fVar171 * fStack_6b4 +
               fStack_774 * fVar327 + fStack_7b4 * fVar271 + fStack_3f4 * fVar269;
          auVar319._16_4_ =
               fVar173 * fStack_6b0 +
               fStack_770 * fVar328 + fStack_7b0 * fVar277 + fStack_3f0 * fVar352;
          auVar319._20_4_ =
               fVar175 * fStack_6ac +
               fStack_76c * fVar329 + fStack_7ac * fVar279 + fStack_3ec * fVar288;
          auVar319._24_4_ =
               fVar179 * fStack_6a8 +
               fStack_768 * fVar201 + fStack_7a8 * fVar281 + fStack_3e8 * fVar314;
          auVar319._28_4_ = fVar265 + fVar265 + fStack_3e4 + fVar265;
          auVar360._0_4_ =
               fVar215 * (float)local_340._0_4_ +
               (float)local_320._0_4_ * fVar322 +
               (float)local_760._0_4_ * fVar266 + (float)local_740._0_4_ * fVar283;
          auVar360._4_4_ =
               fVar330 * (float)local_340._4_4_ +
               (float)local_320._4_4_ * fVar324 +
               (float)local_760._4_4_ * fVar267 + (float)local_740._4_4_ * fVar285;
          auVar360._8_4_ =
               fVar169 * fStack_338 +
               fStack_318 * fVar326 + fStack_758 * fVar268 + fStack_738 * fVar287;
          auVar360._12_4_ =
               fVar171 * fStack_334 +
               fStack_314 * fVar327 + fStack_754 * fVar271 + fStack_734 * fVar269;
          auVar360._16_4_ =
               fVar173 * fStack_330 +
               fStack_310 * fVar328 + fStack_750 * fVar277 + fStack_730 * fVar352;
          auVar360._20_4_ =
               fVar175 * fStack_32c +
               fStack_30c * fVar329 + fStack_74c * fVar279 + fStack_72c * fVar288;
          auVar360._24_4_ =
               fVar179 * fStack_328 +
               fStack_308 * fVar201 + fStack_748 * fVar281 + fStack_728 * fVar314;
          auVar360._28_4_ = fVar265 + fVar265 + fStack_724 + fVar265;
          auVar262._8_4_ = 0x7fffffff;
          auVar262._0_8_ = 0x7fffffff7fffffff;
          auVar262._12_4_ = 0x7fffffff;
          auVar262._16_4_ = 0x7fffffff;
          auVar262._20_4_ = 0x7fffffff;
          auVar262._24_4_ = 0x7fffffff;
          auVar262._28_4_ = 0x7fffffff;
          auVar134._4_4_ = fStack_43c;
          auVar134._0_4_ = local_440;
          auVar134._8_4_ = fStack_438;
          auVar134._12_4_ = fStack_434;
          auVar134._16_4_ = fStack_430;
          auVar134._20_4_ = fStack_42c;
          auVar134._24_4_ = fStack_428;
          auVar134._28_4_ = fStack_424;
          auVar192 = vandps_avx(auVar134,auVar262);
          auVar135._4_4_ = fStack_41c;
          auVar135._0_4_ = local_420;
          auVar135._8_4_ = fStack_418;
          auVar135._12_4_ = fStack_414;
          auVar135._16_4_ = fStack_410;
          auVar135._20_4_ = fStack_40c;
          auVar135._24_4_ = fStack_408;
          auVar135._28_4_ = fStack_404;
          auVar25 = vandps_avx(auVar135,auVar262);
          auVar25 = vmaxps_avx(auVar192,auVar25);
          auVar192 = vandps_avx(auVar370,auVar262);
          auVar25 = vmaxps_avx(auVar25,auVar192);
          auVar25 = vcmpps_avx(auVar25,local_3a0,1);
          auVar28 = vblendvps_avx(auVar134,auVar26,auVar25);
          auVar165._0_4_ =
               fVar215 * (float)local_560._0_4_ +
               fVar322 * (float)local_300._0_4_ +
               fVar283 * (float)local_580._0_4_ + (float)local_2e0._0_4_ * fVar266;
          auVar165._4_4_ =
               fVar330 * (float)local_560._4_4_ +
               fVar324 * (float)local_300._4_4_ +
               fVar285 * (float)local_580._4_4_ + (float)local_2e0._4_4_ * fVar267;
          auVar165._8_4_ =
               fVar169 * fStack_558 +
               fVar326 * fStack_2f8 + fVar287 * fStack_578 + fStack_2d8 * fVar268;
          auVar165._12_4_ =
               fVar171 * fStack_554 +
               fVar327 * fStack_2f4 + fVar269 * fStack_574 + fStack_2d4 * fVar271;
          auVar165._16_4_ =
               fVar173 * fStack_550 +
               fVar328 * fStack_2f0 + fVar352 * fStack_570 + fStack_2d0 * fVar277;
          auVar165._20_4_ =
               fVar175 * fStack_54c +
               fVar329 * fStack_2ec + fVar288 * fStack_56c + fStack_2cc * fVar279;
          auVar165._24_4_ =
               fVar179 * fStack_548 +
               fVar201 * fStack_2e8 + fVar314 * fStack_568 + fStack_2c8 * fVar281;
          auVar165._28_4_ = auVar192._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar29 = vblendvps_avx(auVar135,auVar27,auVar25);
          auVar192 = vandps_avx(auVar319,auVar262);
          auVar25 = vandps_avx(auVar360,auVar262);
          auVar30 = vmaxps_avx(auVar192,auVar25);
          auVar192 = vandps_avx(auVar165,auVar262);
          auVar192 = vmaxps_avx(auVar30,auVar192);
          local_500._0_4_ = auVar139._0_4_;
          local_500._4_4_ = auVar139._4_4_;
          fStack_4f8 = auVar139._8_4_;
          fStack_4f4 = auVar139._12_4_;
          fStack_4f0 = auVar139._16_4_;
          fStack_4ec = auVar139._20_4_;
          fStack_4e8 = auVar139._24_4_;
          auVar25 = vcmpps_avx(auVar192,local_3a0,1);
          auVar192 = vblendvps_avx(auVar319,auVar26,auVar25);
          auVar166._0_4_ =
               (float)local_560._0_4_ * (float)local_500._0_4_ +
               fVar253 + (float)local_2e0._0_4_ * fVar300 + fVar272;
          auVar166._4_4_ =
               (float)local_560._4_4_ * (float)local_500._4_4_ +
               fVar170 + (float)local_2e0._4_4_ * fVar244 + fVar278;
          auVar166._8_4_ = fStack_558 * fStack_4f8 + fVar172 + fStack_2d8 * fVar199 + fVar280;
          auVar166._12_4_ = fStack_554 * fStack_4f4 + fVar174 + fStack_2d4 * fVar309 + fVar282;
          auVar166._16_4_ = fStack_550 * fStack_4f0 + fVar176 + fStack_2d0 * fVar312 + fVar284;
          auVar166._20_4_ = fStack_54c * fStack_4ec + fVar177 + fStack_2cc * fVar247 + fVar286;
          auVar166._24_4_ = fStack_548 * fStack_4e8 + fVar178 + fStack_2c8 * fVar200 + fVar270;
          auVar166._28_4_ = auVar30._28_4_ + fStack_524 + local_360._28_4_ + 0.0;
          auVar25 = vblendvps_avx(auVar360,auVar27,auVar25);
          fVar179 = auVar28._0_4_;
          fVar253 = auVar28._4_4_;
          fVar228 = auVar28._8_4_;
          fVar239 = auVar28._12_4_;
          fVar241 = auVar28._16_4_;
          fVar243 = auVar28._20_4_;
          fVar246 = auVar28._24_4_;
          fVar249 = auVar28._28_4_;
          fVar300 = auVar192._0_4_;
          fVar199 = auVar192._4_4_;
          fVar312 = auVar192._8_4_;
          fVar200 = auVar192._12_4_;
          fVar322 = auVar192._16_4_;
          fVar326 = auVar192._20_4_;
          fVar328 = auVar192._24_4_;
          fVar265 = auVar29._0_4_;
          fVar267 = auVar29._4_4_;
          fVar271 = auVar29._8_4_;
          fVar279 = auVar29._12_4_;
          fVar283 = auVar29._16_4_;
          fVar287 = auVar29._20_4_;
          fVar352 = auVar29._24_4_;
          auVar338._0_4_ = fVar265 * fVar265 + fVar179 * fVar179;
          auVar338._4_4_ = fVar267 * fVar267 + fVar253 * fVar253;
          auVar338._8_4_ = fVar271 * fVar271 + fVar228 * fVar228;
          auVar338._12_4_ = fVar279 * fVar279 + fVar239 * fVar239;
          auVar338._16_4_ = fVar283 * fVar283 + fVar241 * fVar241;
          auVar338._20_4_ = fVar287 * fVar287 + fVar243 * fVar243;
          auVar338._24_4_ = fVar352 * fVar352 + fVar246 * fVar246;
          auVar338._28_4_ = fStack_304 + auVar27._28_4_;
          auVar26 = vrsqrtps_avx(auVar338);
          fVar266 = auVar26._0_4_;
          fVar268 = auVar26._4_4_;
          auVar90._4_4_ = fVar268 * 1.5;
          auVar90._0_4_ = fVar266 * 1.5;
          fVar277 = auVar26._8_4_;
          auVar90._8_4_ = fVar277 * 1.5;
          fVar281 = auVar26._12_4_;
          auVar90._12_4_ = fVar281 * 1.5;
          fVar285 = auVar26._16_4_;
          auVar90._16_4_ = fVar285 * 1.5;
          fVar269 = auVar26._20_4_;
          auVar90._20_4_ = fVar269 * 1.5;
          fVar288 = auVar26._24_4_;
          auVar90._24_4_ = fVar288 * 1.5;
          auVar90._28_4_ = auVar360._28_4_;
          auVar91._4_4_ = fVar268 * fVar268 * fVar268 * auVar338._4_4_ * 0.5;
          auVar91._0_4_ = fVar266 * fVar266 * fVar266 * auVar338._0_4_ * 0.5;
          auVar91._8_4_ = fVar277 * fVar277 * fVar277 * auVar338._8_4_ * 0.5;
          auVar91._12_4_ = fVar281 * fVar281 * fVar281 * auVar338._12_4_ * 0.5;
          auVar91._16_4_ = fVar285 * fVar285 * fVar285 * auVar338._16_4_ * 0.5;
          auVar91._20_4_ = fVar269 * fVar269 * fVar269 * auVar338._20_4_ * 0.5;
          auVar91._24_4_ = fVar288 * fVar288 * fVar288 * auVar338._24_4_ * 0.5;
          auVar91._28_4_ = auVar338._28_4_;
          auVar27 = vsubps_avx(auVar90,auVar91);
          fVar201 = auVar27._0_4_;
          fVar215 = auVar27._4_4_;
          fVar330 = auVar27._8_4_;
          fVar169 = auVar27._12_4_;
          fVar171 = auVar27._16_4_;
          fVar173 = auVar27._20_4_;
          fVar175 = auVar27._24_4_;
          fVar266 = auVar25._0_4_;
          fVar268 = auVar25._4_4_;
          fVar277 = auVar25._8_4_;
          fVar281 = auVar25._12_4_;
          fVar285 = auVar25._16_4_;
          fVar269 = auVar25._20_4_;
          fVar288 = auVar25._24_4_;
          auVar306._0_4_ = fVar266 * fVar266 + fVar300 * fVar300;
          auVar306._4_4_ = fVar268 * fVar268 + fVar199 * fVar199;
          auVar306._8_4_ = fVar277 * fVar277 + fVar312 * fVar312;
          auVar306._12_4_ = fVar281 * fVar281 + fVar200 * fVar200;
          auVar306._16_4_ = fVar285 * fVar285 + fVar322 * fVar322;
          auVar306._20_4_ = fVar269 * fVar269 + fVar326 * fVar326;
          auVar306._24_4_ = fVar288 * fVar288 + fVar328 * fVar328;
          auVar306._28_4_ = auVar26._28_4_ + auVar192._28_4_;
          auVar192 = vrsqrtps_avx(auVar306);
          fVar244 = auVar192._0_4_;
          fVar309 = auVar192._4_4_;
          auVar92._4_4_ = fVar309 * 1.5;
          auVar92._0_4_ = fVar244 * 1.5;
          fVar247 = auVar192._8_4_;
          auVar92._8_4_ = fVar247 * 1.5;
          fVar314 = auVar192._12_4_;
          auVar92._12_4_ = fVar314 * 1.5;
          fVar324 = auVar192._16_4_;
          auVar92._16_4_ = fVar324 * 1.5;
          fVar327 = auVar192._20_4_;
          auVar92._20_4_ = fVar327 * 1.5;
          fVar329 = auVar192._24_4_;
          auVar92._24_4_ = fVar329 * 1.5;
          auVar92._28_4_ = auVar360._28_4_;
          auVar93._4_4_ = fVar309 * fVar309 * fVar309 * auVar306._4_4_ * 0.5;
          auVar93._0_4_ = fVar244 * fVar244 * fVar244 * auVar306._0_4_ * 0.5;
          auVar93._8_4_ = fVar247 * fVar247 * fVar247 * auVar306._8_4_ * 0.5;
          auVar93._12_4_ = fVar314 * fVar314 * fVar314 * auVar306._12_4_ * 0.5;
          auVar93._16_4_ = fVar324 * fVar324 * fVar324 * auVar306._16_4_ * 0.5;
          auVar93._20_4_ = fVar327 * fVar327 * fVar327 * auVar306._20_4_ * 0.5;
          auVar93._24_4_ = fVar329 * fVar329 * fVar329 * auVar306._24_4_ * 0.5;
          auVar93._28_4_ = auVar306._28_4_;
          auVar25 = vsubps_avx(auVar92,auVar93);
          fVar244 = auVar25._0_4_;
          fVar309 = auVar25._4_4_;
          fVar247 = auVar25._8_4_;
          fVar314 = auVar25._12_4_;
          fVar324 = auVar25._16_4_;
          fVar327 = auVar25._20_4_;
          fVar329 = auVar25._24_4_;
          fVar265 = (float)local_7a0._0_4_ * fVar201 * fVar265;
          fVar267 = (float)local_7a0._4_4_ * fVar215 * fVar267;
          auVar94._4_4_ = fVar267;
          auVar94._0_4_ = fVar265;
          fVar271 = fStack_798 * fVar330 * fVar271;
          auVar94._8_4_ = fVar271;
          fVar279 = fStack_794 * fVar169 * fVar279;
          auVar94._12_4_ = fVar279;
          fVar283 = fStack_790 * fVar171 * fVar283;
          auVar94._16_4_ = fVar283;
          fVar287 = fStack_78c * fVar173 * fVar287;
          auVar94._20_4_ = fVar287;
          fVar352 = fStack_788 * fVar175 * fVar352;
          auVar94._24_4_ = fVar352;
          auVar94._28_4_ = auVar192._28_4_;
          local_500._4_4_ = fVar267 + local_640._4_4_;
          local_500._0_4_ = fVar265 + (float)local_640._0_4_;
          fStack_4f8 = fVar271 + local_640._8_4_;
          fStack_4f4 = fVar279 + local_640._12_4_;
          fStack_4f0 = fVar283 + local_640._16_4_;
          fStack_4ec = fVar287 + local_640._20_4_;
          fStack_4e8 = fVar352 + local_640._24_4_;
          fStack_4e4 = auVar192._28_4_ + local_640._28_4_;
          local_5e0 = (float)local_7a0._0_4_ * fVar201 * -fVar179;
          fStack_5dc = (float)local_7a0._4_4_ * fVar215 * -fVar253;
          auVar95._4_4_ = fStack_5dc;
          auVar95._0_4_ = local_5e0;
          fStack_5d8 = fStack_798 * fVar330 * -fVar228;
          auVar95._8_4_ = fStack_5d8;
          fStack_5d4 = fStack_794 * fVar169 * -fVar239;
          auVar95._12_4_ = fStack_5d4;
          fStack_5d0 = fStack_790 * fVar171 * -fVar241;
          auVar95._16_4_ = fStack_5d0;
          fStack_5cc = fStack_78c * fVar173 * -fVar243;
          auVar95._20_4_ = fStack_5cc;
          fStack_5c8 = fStack_788 * fVar175 * -fVar246;
          auVar95._24_4_ = fStack_5c8;
          auVar95._28_4_ = -fVar249;
          local_5e0 = auVar213._0_4_ + local_5e0;
          fStack_5dc = auVar213._4_4_ + fStack_5dc;
          fStack_5d8 = auVar213._8_4_ + fStack_5d8;
          fStack_5d4 = auVar213._12_4_ + fStack_5d4;
          fStack_5d0 = auVar213._16_4_ + fStack_5d0;
          fStack_5cc = auVar213._20_4_ + fStack_5cc;
          fStack_5c8 = auVar213._24_4_ + fStack_5c8;
          fStack_5c4 = auVar213._28_4_ + -fVar249;
          fVar265 = fVar201 * 0.0 * (float)local_7a0._0_4_;
          fVar267 = fVar215 * 0.0 * (float)local_7a0._4_4_;
          auVar96._4_4_ = fVar267;
          auVar96._0_4_ = fVar265;
          fVar271 = fVar330 * 0.0 * fStack_798;
          auVar96._8_4_ = fVar271;
          fVar279 = fVar169 * 0.0 * fStack_794;
          auVar96._12_4_ = fVar279;
          fVar283 = fVar171 * 0.0 * fStack_790;
          auVar96._16_4_ = fVar283;
          fVar287 = fVar173 * 0.0 * fStack_78c;
          auVar96._20_4_ = fVar287;
          fVar352 = fVar175 * 0.0 * fStack_788;
          auVar96._24_4_ = fVar352;
          auVar96._28_4_ = fVar249;
          auVar30 = vsubps_avx(local_640,auVar94);
          auVar382._0_4_ = fVar265 + auVar166._0_4_;
          auVar382._4_4_ = fVar267 + auVar166._4_4_;
          auVar382._8_4_ = fVar271 + auVar166._8_4_;
          auVar382._12_4_ = fVar279 + auVar166._12_4_;
          auVar382._16_4_ = fVar283 + auVar166._16_4_;
          auVar382._20_4_ = fVar287 + auVar166._20_4_;
          auVar382._24_4_ = fVar352 + auVar166._24_4_;
          auVar382._28_4_ = fVar249 + auVar166._28_4_;
          fVar265 = auVar369._0_4_ * fVar244 * fVar266;
          fVar266 = auVar369._4_4_ * fVar309 * fVar268;
          auVar97._4_4_ = fVar266;
          auVar97._0_4_ = fVar265;
          fVar267 = auVar369._8_4_ * fVar247 * fVar277;
          auVar97._8_4_ = fVar267;
          fVar268 = auVar369._12_4_ * fVar314 * fVar281;
          auVar97._12_4_ = fVar268;
          fVar271 = auVar369._16_4_ * fVar324 * fVar285;
          auVar97._16_4_ = fVar271;
          fVar277 = auVar369._20_4_ * fVar327 * fVar269;
          auVar97._20_4_ = fVar277;
          fVar279 = auVar369._24_4_ * fVar329 * fVar288;
          auVar97._24_4_ = fVar279;
          auVar97._28_4_ = fStack_784;
          auVar45 = vsubps_avx(auVar213,auVar95);
          auVar371._0_4_ = auVar275._0_4_ + fVar265;
          auVar371._4_4_ = auVar275._4_4_ + fVar266;
          auVar371._8_4_ = auVar275._8_4_ + fVar267;
          auVar371._12_4_ = auVar275._12_4_ + fVar268;
          auVar371._16_4_ = auVar275._16_4_ + fVar271;
          auVar371._20_4_ = auVar275._20_4_ + fVar277;
          auVar371._24_4_ = auVar275._24_4_ + fVar279;
          auVar371._28_4_ = auVar275._28_4_ + fStack_784;
          fVar265 = fVar244 * -fVar300 * auVar369._0_4_;
          fVar266 = fVar309 * -fVar199 * auVar369._4_4_;
          auVar98._4_4_ = fVar266;
          auVar98._0_4_ = fVar265;
          fVar267 = fVar247 * -fVar312 * auVar369._8_4_;
          auVar98._8_4_ = fVar267;
          fVar268 = fVar314 * -fVar200 * auVar369._12_4_;
          auVar98._12_4_ = fVar268;
          fVar271 = fVar324 * -fVar322 * auVar369._16_4_;
          auVar98._16_4_ = fVar271;
          fVar277 = fVar327 * -fVar326 * auVar369._20_4_;
          auVar98._20_4_ = fVar277;
          fVar279 = fVar329 * -fVar328 * auVar369._24_4_;
          auVar98._24_4_ = fVar279;
          auVar98._28_4_ = local_640._28_4_;
          auVar155 = vsubps_avx(auVar166,auVar96);
          auVar236._0_4_ = local_4e0._0_4_ + fVar265;
          auVar236._4_4_ = local_4e0._4_4_ + fVar266;
          auVar236._8_4_ = local_4e0._8_4_ + fVar267;
          auVar236._12_4_ = local_4e0._12_4_ + fVar268;
          auVar236._16_4_ = local_4e0._16_4_ + fVar271;
          auVar236._20_4_ = local_4e0._20_4_ + fVar277;
          auVar236._24_4_ = local_4e0._24_4_ + fVar279;
          auVar236._28_4_ = local_4e0._28_4_ + local_640._28_4_;
          fVar265 = fVar244 * 0.0 * auVar369._0_4_;
          fVar266 = fVar309 * 0.0 * auVar369._4_4_;
          auVar99._4_4_ = fVar266;
          auVar99._0_4_ = fVar265;
          fVar267 = fVar247 * 0.0 * auVar369._8_4_;
          auVar99._8_4_ = fVar267;
          fVar268 = fVar314 * 0.0 * auVar369._12_4_;
          auVar99._12_4_ = fVar268;
          fVar271 = fVar324 * 0.0 * auVar369._16_4_;
          auVar99._16_4_ = fVar271;
          fVar277 = fVar327 * 0.0 * auVar369._20_4_;
          auVar99._20_4_ = fVar277;
          fVar279 = fVar329 * 0.0 * auVar369._24_4_;
          auVar99._24_4_ = fVar279;
          auVar99._28_4_ = auVar166._28_4_;
          auVar192 = vsubps_avx(auVar275,auVar97);
          auVar132._4_4_ = fStack_53c;
          auVar132._0_4_ = local_540;
          auVar132._8_4_ = fStack_538;
          auVar132._12_4_ = fStack_534;
          auVar132._16_4_ = fStack_530;
          auVar132._20_4_ = fStack_52c;
          auVar132._24_4_ = fStack_528;
          auVar132._28_4_ = fStack_524;
          auVar320._0_4_ = local_540 + fVar265;
          auVar320._4_4_ = fStack_53c + fVar266;
          auVar320._8_4_ = fStack_538 + fVar267;
          auVar320._12_4_ = fStack_534 + fVar268;
          auVar320._16_4_ = fStack_530 + fVar271;
          auVar320._20_4_ = fStack_52c + fVar277;
          auVar320._24_4_ = fStack_528 + fVar279;
          auVar320._28_4_ = fStack_524 + auVar166._28_4_;
          auVar26 = vsubps_avx(local_4e0,auVar98);
          auVar27 = vsubps_avx(auVar132,auVar99);
          auVar28 = vsubps_avx(auVar236,auVar45);
          auVar29 = vsubps_avx(auVar320,auVar155);
          auVar100._4_4_ = auVar155._4_4_ * auVar28._4_4_;
          auVar100._0_4_ = auVar155._0_4_ * auVar28._0_4_;
          auVar100._8_4_ = auVar155._8_4_ * auVar28._8_4_;
          auVar100._12_4_ = auVar155._12_4_ * auVar28._12_4_;
          auVar100._16_4_ = auVar155._16_4_ * auVar28._16_4_;
          auVar100._20_4_ = auVar155._20_4_ * auVar28._20_4_;
          auVar100._24_4_ = auVar155._24_4_ * auVar28._24_4_;
          auVar100._28_4_ = auVar360._28_4_;
          auVar101._4_4_ = auVar45._4_4_ * auVar29._4_4_;
          auVar101._0_4_ = auVar45._0_4_ * auVar29._0_4_;
          auVar101._8_4_ = auVar45._8_4_ * auVar29._8_4_;
          auVar101._12_4_ = auVar45._12_4_ * auVar29._12_4_;
          auVar101._16_4_ = auVar45._16_4_ * auVar29._16_4_;
          auVar101._20_4_ = auVar45._20_4_ * auVar29._20_4_;
          auVar101._24_4_ = auVar45._24_4_ * auVar29._24_4_;
          auVar101._28_4_ = fStack_524;
          auVar31 = vsubps_avx(auVar101,auVar100);
          auVar102._4_4_ = auVar30._4_4_ * auVar29._4_4_;
          auVar102._0_4_ = auVar30._0_4_ * auVar29._0_4_;
          auVar102._8_4_ = auVar30._8_4_ * auVar29._8_4_;
          auVar102._12_4_ = auVar30._12_4_ * auVar29._12_4_;
          auVar102._16_4_ = auVar30._16_4_ * auVar29._16_4_;
          auVar102._20_4_ = auVar30._20_4_ * auVar29._20_4_;
          auVar102._24_4_ = auVar30._24_4_ * auVar29._24_4_;
          auVar102._28_4_ = auVar29._28_4_;
          auVar29 = vsubps_avx(auVar371,auVar30);
          auVar103._4_4_ = auVar155._4_4_ * auVar29._4_4_;
          auVar103._0_4_ = auVar155._0_4_ * auVar29._0_4_;
          auVar103._8_4_ = auVar155._8_4_ * auVar29._8_4_;
          auVar103._12_4_ = auVar155._12_4_ * auVar29._12_4_;
          auVar103._16_4_ = auVar155._16_4_ * auVar29._16_4_;
          auVar103._20_4_ = auVar155._20_4_ * auVar29._20_4_;
          auVar103._24_4_ = auVar155._24_4_ * auVar29._24_4_;
          auVar103._28_4_ = auVar25._28_4_;
          auVar32 = vsubps_avx(auVar103,auVar102);
          auVar104._4_4_ = auVar45._4_4_ * auVar29._4_4_;
          auVar104._0_4_ = auVar45._0_4_ * auVar29._0_4_;
          auVar104._8_4_ = auVar45._8_4_ * auVar29._8_4_;
          auVar104._12_4_ = auVar45._12_4_ * auVar29._12_4_;
          auVar104._16_4_ = auVar45._16_4_ * auVar29._16_4_;
          auVar104._20_4_ = auVar45._20_4_ * auVar29._20_4_;
          auVar104._24_4_ = auVar45._24_4_ * auVar29._24_4_;
          auVar104._28_4_ = auVar25._28_4_;
          auVar105._4_4_ = auVar30._4_4_ * auVar28._4_4_;
          auVar105._0_4_ = auVar30._0_4_ * auVar28._0_4_;
          auVar105._8_4_ = auVar30._8_4_ * auVar28._8_4_;
          auVar105._12_4_ = auVar30._12_4_ * auVar28._12_4_;
          auVar105._16_4_ = auVar30._16_4_ * auVar28._16_4_;
          auVar105._20_4_ = auVar30._20_4_ * auVar28._20_4_;
          auVar105._24_4_ = auVar30._24_4_ * auVar28._24_4_;
          auVar105._28_4_ = auVar28._28_4_;
          auVar25 = vsubps_avx(auVar105,auVar104);
          auVar190._0_4_ = auVar31._0_4_ * 0.0 + auVar25._0_4_ + auVar32._0_4_ * 0.0;
          auVar190._4_4_ = auVar31._4_4_ * 0.0 + auVar25._4_4_ + auVar32._4_4_ * 0.0;
          auVar190._8_4_ = auVar31._8_4_ * 0.0 + auVar25._8_4_ + auVar32._8_4_ * 0.0;
          auVar190._12_4_ = auVar31._12_4_ * 0.0 + auVar25._12_4_ + auVar32._12_4_ * 0.0;
          auVar190._16_4_ = auVar31._16_4_ * 0.0 + auVar25._16_4_ + auVar32._16_4_ * 0.0;
          auVar190._20_4_ = auVar31._20_4_ * 0.0 + auVar25._20_4_ + auVar32._20_4_ * 0.0;
          auVar190._24_4_ = auVar31._24_4_ * 0.0 + auVar25._24_4_ + auVar32._24_4_ * 0.0;
          auVar190._28_4_ = auVar31._28_4_ + auVar25._28_4_ + auVar32._28_4_;
          auVar24 = vcmpps_avx(auVar190,ZEXT832(0) << 0x20,2);
          auVar214 = ZEXT3264(auVar24);
          auVar192 = vblendvps_avx(auVar192,_local_500,auVar24);
          auVar130._4_4_ = fStack_5dc;
          auVar130._0_4_ = local_5e0;
          auVar130._8_4_ = fStack_5d8;
          auVar130._12_4_ = fStack_5d4;
          auVar130._16_4_ = fStack_5d0;
          auVar130._20_4_ = fStack_5cc;
          auVar130._24_4_ = fStack_5c8;
          auVar130._28_4_ = fStack_5c4;
          auVar25 = vblendvps_avx(auVar26,auVar130,auVar24);
          auVar26 = vblendvps_avx(auVar27,auVar382,auVar24);
          auVar27 = vblendvps_avx(auVar30,auVar371,auVar24);
          auVar28 = vblendvps_avx(auVar45,auVar236,auVar24);
          auVar29 = vblendvps_avx(auVar155,auVar320,auVar24);
          auVar30 = vblendvps_avx(auVar371,auVar30,auVar24);
          auVar31 = vblendvps_avx(auVar236,auVar45,auVar24);
          auVar32 = vblendvps_avx(auVar320,auVar155,auVar24);
          local_620 = vandps_avx(local_360,auVar222);
          auVar30 = vsubps_avx(auVar30,auVar192);
          auVar156 = vsubps_avx(auVar31,auVar25);
          auVar32 = vsubps_avx(auVar32,auVar26);
          auVar186 = vsubps_avx(auVar25,auVar28);
          fVar265 = auVar156._0_4_;
          fVar178 = auVar26._0_4_;
          fVar281 = auVar156._4_4_;
          fVar272 = auVar26._4_4_;
          auVar106._4_4_ = fVar272 * fVar281;
          auVar106._0_4_ = fVar178 * fVar265;
          fVar300 = auVar156._8_4_;
          fVar278 = auVar26._8_4_;
          auVar106._8_4_ = fVar278 * fVar300;
          fVar314 = auVar156._12_4_;
          fVar280 = auVar26._12_4_;
          auVar106._12_4_ = fVar280 * fVar314;
          fVar201 = auVar156._16_4_;
          fVar282 = auVar26._16_4_;
          auVar106._16_4_ = fVar282 * fVar201;
          fVar179 = auVar156._20_4_;
          fVar284 = auVar26._20_4_;
          auVar106._20_4_ = fVar284 * fVar179;
          fVar249 = auVar156._24_4_;
          fVar286 = auVar26._24_4_;
          auVar106._24_4_ = fVar286 * fVar249;
          auVar106._28_4_ = auVar31._28_4_;
          fVar266 = auVar25._0_4_;
          fVar270 = auVar32._0_4_;
          fVar283 = auVar25._4_4_;
          fVar289 = auVar32._4_4_;
          auVar107._4_4_ = fVar289 * fVar283;
          auVar107._0_4_ = fVar270 * fVar266;
          fVar244 = auVar25._8_4_;
          fVar296 = auVar32._8_4_;
          auVar107._8_4_ = fVar296 * fVar244;
          fVar322 = auVar25._12_4_;
          fVar299 = auVar32._12_4_;
          auVar107._12_4_ = fVar299 * fVar322;
          fVar215 = auVar25._16_4_;
          fVar308 = auVar32._16_4_;
          auVar107._16_4_ = fVar308 * fVar215;
          fVar253 = auVar25._20_4_;
          fVar311 = auVar32._20_4_;
          auVar107._20_4_ = fVar311 * fVar253;
          fVar251 = auVar25._24_4_;
          fVar313 = auVar32._24_4_;
          uVar149 = auVar45._28_4_;
          auVar107._24_4_ = fVar313 * fVar251;
          auVar107._28_4_ = uVar149;
          auVar31 = vsubps_avx(auVar107,auVar106);
          fVar267 = auVar192._0_4_;
          fVar285 = auVar192._4_4_;
          auVar108._4_4_ = fVar289 * fVar285;
          auVar108._0_4_ = fVar270 * fVar267;
          fVar199 = auVar192._8_4_;
          auVar108._8_4_ = fVar296 * fVar199;
          fVar324 = auVar192._12_4_;
          auVar108._12_4_ = fVar299 * fVar324;
          fVar330 = auVar192._16_4_;
          auVar108._16_4_ = fVar308 * fVar330;
          fVar228 = auVar192._20_4_;
          auVar108._20_4_ = fVar311 * fVar228;
          fVar170 = auVar192._24_4_;
          auVar108._24_4_ = fVar313 * fVar170;
          auVar108._28_4_ = uVar149;
          fVar268 = auVar30._0_4_;
          fVar287 = auVar30._4_4_;
          auVar109._4_4_ = fVar272 * fVar287;
          auVar109._0_4_ = fVar178 * fVar268;
          fVar309 = auVar30._8_4_;
          auVar109._8_4_ = fVar278 * fVar309;
          fVar326 = auVar30._12_4_;
          auVar109._12_4_ = fVar280 * fVar326;
          fVar169 = auVar30._16_4_;
          auVar109._16_4_ = fVar282 * fVar169;
          fVar239 = auVar30._20_4_;
          auVar109._20_4_ = fVar284 * fVar239;
          fVar172 = auVar30._24_4_;
          auVar109._24_4_ = fVar286 * fVar172;
          auVar109._28_4_ = auVar371._28_4_;
          auVar45 = vsubps_avx(auVar109,auVar108);
          auVar110._4_4_ = fVar283 * fVar287;
          auVar110._0_4_ = fVar266 * fVar268;
          auVar110._8_4_ = fVar244 * fVar309;
          auVar110._12_4_ = fVar322 * fVar326;
          auVar110._16_4_ = fVar215 * fVar169;
          auVar110._20_4_ = fVar253 * fVar239;
          auVar110._24_4_ = fVar251 * fVar172;
          auVar110._28_4_ = uVar149;
          auVar111._4_4_ = fVar285 * fVar281;
          auVar111._0_4_ = fVar267 * fVar265;
          auVar111._8_4_ = fVar199 * fVar300;
          auVar111._12_4_ = fVar324 * fVar314;
          auVar111._16_4_ = fVar330 * fVar201;
          auVar111._20_4_ = fVar228 * fVar179;
          auVar111._24_4_ = fVar170 * fVar249;
          auVar111._28_4_ = auVar155._28_4_;
          auVar155 = vsubps_avx(auVar111,auVar110);
          auVar185 = vsubps_avx(auVar26,auVar29);
          fVar277 = auVar155._28_4_ + auVar45._28_4_;
          auVar339._0_4_ = auVar155._0_4_ + auVar45._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
          auVar339._4_4_ = auVar155._4_4_ + auVar45._4_4_ * 0.0 + auVar31._4_4_ * 0.0;
          auVar339._8_4_ = auVar155._8_4_ + auVar45._8_4_ * 0.0 + auVar31._8_4_ * 0.0;
          auVar339._12_4_ = auVar155._12_4_ + auVar45._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
          auVar339._16_4_ = auVar155._16_4_ + auVar45._16_4_ * 0.0 + auVar31._16_4_ * 0.0;
          auVar339._20_4_ = auVar155._20_4_ + auVar45._20_4_ * 0.0 + auVar31._20_4_ * 0.0;
          auVar339._24_4_ = auVar155._24_4_ + auVar45._24_4_ * 0.0 + auVar31._24_4_ * 0.0;
          auVar339._28_4_ = fVar277 + auVar31._28_4_;
          fVar271 = auVar186._0_4_;
          fVar269 = auVar186._4_4_;
          auVar112._4_4_ = auVar29._4_4_ * fVar269;
          auVar112._0_4_ = auVar29._0_4_ * fVar271;
          fVar312 = auVar186._8_4_;
          auVar112._8_4_ = auVar29._8_4_ * fVar312;
          fVar327 = auVar186._12_4_;
          auVar112._12_4_ = auVar29._12_4_ * fVar327;
          fVar171 = auVar186._16_4_;
          auVar112._16_4_ = auVar29._16_4_ * fVar171;
          fVar241 = auVar186._20_4_;
          auVar112._20_4_ = auVar29._20_4_ * fVar241;
          fVar174 = auVar186._24_4_;
          auVar112._24_4_ = auVar29._24_4_ * fVar174;
          auVar112._28_4_ = fVar277;
          fVar277 = auVar185._0_4_;
          fVar352 = auVar185._4_4_;
          auVar113._4_4_ = auVar28._4_4_ * fVar352;
          auVar113._0_4_ = auVar28._0_4_ * fVar277;
          fVar247 = auVar185._8_4_;
          auVar113._8_4_ = auVar28._8_4_ * fVar247;
          fVar328 = auVar185._12_4_;
          auVar113._12_4_ = auVar28._12_4_ * fVar328;
          fVar173 = auVar185._16_4_;
          auVar113._16_4_ = auVar28._16_4_ * fVar173;
          fVar243 = auVar185._20_4_;
          auVar113._20_4_ = auVar28._20_4_ * fVar243;
          fVar176 = auVar185._24_4_;
          auVar113._24_4_ = auVar28._24_4_ * fVar176;
          auVar113._28_4_ = auVar155._28_4_;
          auVar45 = vsubps_avx(auVar113,auVar112);
          auVar155 = vsubps_avx(auVar192,auVar27);
          fVar279 = auVar155._0_4_;
          fVar288 = auVar155._4_4_;
          auVar114._4_4_ = auVar29._4_4_ * fVar288;
          auVar114._0_4_ = auVar29._0_4_ * fVar279;
          fVar200 = auVar155._8_4_;
          auVar114._8_4_ = auVar29._8_4_ * fVar200;
          fVar329 = auVar155._12_4_;
          auVar114._12_4_ = auVar29._12_4_ * fVar329;
          fVar175 = auVar155._16_4_;
          auVar114._16_4_ = auVar29._16_4_ * fVar175;
          fVar246 = auVar155._20_4_;
          auVar114._20_4_ = auVar29._20_4_ * fVar246;
          fVar177 = auVar155._24_4_;
          auVar114._24_4_ = auVar29._24_4_ * fVar177;
          auVar114._28_4_ = auVar29._28_4_;
          auVar115._4_4_ = fVar352 * auVar27._4_4_;
          auVar115._0_4_ = fVar277 * auVar27._0_4_;
          auVar115._8_4_ = fVar247 * auVar27._8_4_;
          auVar115._12_4_ = fVar328 * auVar27._12_4_;
          auVar115._16_4_ = fVar173 * auVar27._16_4_;
          auVar115._20_4_ = fVar243 * auVar27._20_4_;
          auVar115._24_4_ = fVar176 * auVar27._24_4_;
          auVar115._28_4_ = auVar31._28_4_;
          auVar29 = vsubps_avx(auVar114,auVar115);
          auVar116._4_4_ = auVar28._4_4_ * fVar288;
          auVar116._0_4_ = auVar28._0_4_ * fVar279;
          auVar116._8_4_ = auVar28._8_4_ * fVar200;
          auVar116._12_4_ = auVar28._12_4_ * fVar329;
          auVar116._16_4_ = auVar28._16_4_ * fVar175;
          auVar116._20_4_ = auVar28._20_4_ * fVar246;
          auVar116._24_4_ = auVar28._24_4_ * fVar177;
          auVar116._28_4_ = auVar28._28_4_;
          auVar117._4_4_ = fVar269 * auVar27._4_4_;
          auVar117._0_4_ = fVar271 * auVar27._0_4_;
          auVar117._8_4_ = fVar312 * auVar27._8_4_;
          auVar117._12_4_ = fVar327 * auVar27._12_4_;
          auVar117._16_4_ = fVar171 * auVar27._16_4_;
          auVar117._20_4_ = fVar241 * auVar27._20_4_;
          auVar117._24_4_ = fVar174 * auVar27._24_4_;
          auVar117._28_4_ = auVar27._28_4_;
          auVar27 = vsubps_avx(auVar117,auVar116);
          auVar167._0_4_ = auVar45._0_4_ * 0.0 + auVar27._0_4_ + auVar29._0_4_ * 0.0;
          auVar167._4_4_ = auVar45._4_4_ * 0.0 + auVar27._4_4_ + auVar29._4_4_ * 0.0;
          auVar167._8_4_ = auVar45._8_4_ * 0.0 + auVar27._8_4_ + auVar29._8_4_ * 0.0;
          auVar167._12_4_ = auVar45._12_4_ * 0.0 + auVar27._12_4_ + auVar29._12_4_ * 0.0;
          auVar167._16_4_ = auVar45._16_4_ * 0.0 + auVar27._16_4_ + auVar29._16_4_ * 0.0;
          auVar167._20_4_ = auVar45._20_4_ * 0.0 + auVar27._20_4_ + auVar29._20_4_ * 0.0;
          auVar167._24_4_ = auVar45._24_4_ * 0.0 + auVar27._24_4_ + auVar29._24_4_ * 0.0;
          auVar167._28_4_ = auVar29._28_4_ + auVar27._28_4_ + auVar29._28_4_;
          auVar168 = ZEXT3264(auVar167);
          auVar27 = vmaxps_avx(auVar339,auVar167);
          auVar27 = vcmpps_avx(auVar27,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar28 = local_620 & auVar27;
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0x7f,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar28 >> 0xbf,0) == '\0') &&
              (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar28[0x1f]) {
LAB_00b118c1:
            auVar310 = auVar186._4_12_;
            auVar193 = ZEXT3264(CONCAT824(uStack_468,
                                          CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
          }
          else {
            auVar28 = vandps_avx(auVar27,local_620);
            auVar118._4_4_ = fVar352 * fVar281;
            auVar118._0_4_ = fVar277 * fVar265;
            auVar118._8_4_ = fVar247 * fVar300;
            auVar118._12_4_ = fVar328 * fVar314;
            auVar118._16_4_ = fVar173 * fVar201;
            auVar118._20_4_ = fVar243 * fVar179;
            auVar118._24_4_ = fVar176 * fVar249;
            auVar118._28_4_ = local_620._28_4_;
            auVar119._4_4_ = fVar269 * fVar289;
            auVar119._0_4_ = fVar271 * fVar270;
            auVar119._8_4_ = fVar312 * fVar296;
            auVar119._12_4_ = fVar327 * fVar299;
            auVar119._16_4_ = fVar171 * fVar308;
            auVar119._20_4_ = fVar241 * fVar311;
            auVar119._24_4_ = fVar174 * fVar313;
            auVar119._28_4_ = auVar27._28_4_;
            auVar29 = vsubps_avx(auVar119,auVar118);
            auVar120._4_4_ = fVar288 * fVar289;
            auVar120._0_4_ = fVar279 * fVar270;
            auVar120._8_4_ = fVar200 * fVar296;
            auVar120._12_4_ = fVar329 * fVar299;
            auVar120._16_4_ = fVar175 * fVar308;
            auVar120._20_4_ = fVar246 * fVar311;
            auVar120._24_4_ = fVar177 * fVar313;
            auVar120._28_4_ = auVar32._28_4_;
            auVar121._4_4_ = fVar352 * fVar287;
            auVar121._0_4_ = fVar277 * fVar268;
            auVar121._8_4_ = fVar247 * fVar309;
            auVar121._12_4_ = fVar328 * fVar326;
            auVar121._16_4_ = fVar173 * fVar169;
            auVar121._20_4_ = fVar243 * fVar239;
            auVar121._24_4_ = fVar176 * fVar172;
            auVar121._28_4_ = auVar185._28_4_;
            auVar31 = vsubps_avx(auVar121,auVar120);
            auVar122._4_4_ = fVar269 * fVar287;
            auVar122._0_4_ = fVar271 * fVar268;
            auVar122._8_4_ = fVar312 * fVar309;
            auVar122._12_4_ = fVar327 * fVar326;
            auVar122._16_4_ = fVar171 * fVar169;
            auVar122._20_4_ = fVar241 * fVar239;
            auVar122._24_4_ = fVar174 * fVar172;
            auVar122._28_4_ = auVar30._28_4_;
            auVar123._4_4_ = fVar288 * fVar281;
            auVar123._0_4_ = fVar279 * fVar265;
            auVar123._8_4_ = fVar200 * fVar300;
            auVar123._12_4_ = fVar329 * fVar314;
            auVar123._16_4_ = fVar175 * fVar201;
            auVar123._20_4_ = fVar246 * fVar179;
            auVar123._24_4_ = fVar177 * fVar249;
            auVar123._28_4_ = auVar156._28_4_;
            auVar186 = vsubps_avx(auVar123,auVar122);
            auVar310 = auVar186._4_12_;
            auVar191._0_4_ = auVar29._0_4_ * 0.0 + auVar186._0_4_ + auVar31._0_4_ * 0.0;
            auVar191._4_4_ = auVar29._4_4_ * 0.0 + auVar186._4_4_ + auVar31._4_4_ * 0.0;
            auVar191._8_4_ = auVar29._8_4_ * 0.0 + auVar186._8_4_ + auVar31._8_4_ * 0.0;
            auVar191._12_4_ = auVar29._12_4_ * 0.0 + auVar186._12_4_ + auVar31._12_4_ * 0.0;
            auVar191._16_4_ = auVar29._16_4_ * 0.0 + auVar186._16_4_ + auVar31._16_4_ * 0.0;
            auVar191._20_4_ = auVar29._20_4_ * 0.0 + auVar186._20_4_ + auVar31._20_4_ * 0.0;
            auVar191._24_4_ = auVar29._24_4_ * 0.0 + auVar186._24_4_ + auVar31._24_4_ * 0.0;
            auVar191._28_4_ = auVar156._28_4_ + auVar186._28_4_ + auVar30._28_4_;
            auVar27 = vrcpps_avx(auVar191);
            fVar268 = auVar27._0_4_;
            fVar271 = auVar27._4_4_;
            auVar124._4_4_ = auVar191._4_4_ * fVar271;
            auVar124._0_4_ = auVar191._0_4_ * fVar268;
            fVar277 = auVar27._8_4_;
            auVar124._8_4_ = auVar191._8_4_ * fVar277;
            fVar279 = auVar27._12_4_;
            auVar124._12_4_ = auVar191._12_4_ * fVar279;
            fVar281 = auVar27._16_4_;
            auVar124._16_4_ = auVar191._16_4_ * fVar281;
            fVar287 = auVar27._20_4_;
            auVar124._20_4_ = auVar191._20_4_ * fVar287;
            fVar269 = auVar27._24_4_;
            auVar124._24_4_ = auVar191._24_4_ * fVar269;
            auVar124._28_4_ = auVar185._28_4_;
            auVar361._8_4_ = 0x3f800000;
            auVar361._0_8_ = 0x3f8000003f800000;
            auVar361._12_4_ = 0x3f800000;
            auVar361._16_4_ = 0x3f800000;
            auVar361._20_4_ = 0x3f800000;
            auVar361._24_4_ = 0x3f800000;
            auVar361._28_4_ = 0x3f800000;
            auVar27 = vsubps_avx(auVar361,auVar124);
            fVar268 = auVar27._0_4_ * fVar268 + fVar268;
            fVar271 = auVar27._4_4_ * fVar271 + fVar271;
            fVar277 = auVar27._8_4_ * fVar277 + fVar277;
            fVar279 = auVar27._12_4_ * fVar279 + fVar279;
            fVar281 = auVar27._16_4_ * fVar281 + fVar281;
            fVar287 = auVar27._20_4_ * fVar287 + fVar287;
            fVar269 = auVar27._24_4_ * fVar269 + fVar269;
            auVar125._4_4_ =
                 (fVar285 * auVar29._4_4_ + auVar31._4_4_ * fVar283 + auVar186._4_4_ * fVar272) *
                 fVar271;
            auVar125._0_4_ =
                 (fVar267 * auVar29._0_4_ + auVar31._0_4_ * fVar266 + auVar186._0_4_ * fVar178) *
                 fVar268;
            auVar125._8_4_ =
                 (fVar199 * auVar29._8_4_ + auVar31._8_4_ * fVar244 + auVar186._8_4_ * fVar278) *
                 fVar277;
            auVar125._12_4_ =
                 (fVar324 * auVar29._12_4_ + auVar31._12_4_ * fVar322 + auVar186._12_4_ * fVar280) *
                 fVar279;
            auVar125._16_4_ =
                 (fVar330 * auVar29._16_4_ + auVar31._16_4_ * fVar215 + auVar186._16_4_ * fVar282) *
                 fVar281;
            auVar125._20_4_ =
                 (fVar228 * auVar29._20_4_ + auVar31._20_4_ * fVar253 + auVar186._20_4_ * fVar284) *
                 fVar287;
            auVar125._24_4_ =
                 (fVar170 * auVar29._24_4_ + auVar31._24_4_ * fVar251 + auVar186._24_4_ * fVar286) *
                 fVar269;
            auVar125._28_4_ = auVar192._28_4_ + auVar25._28_4_ + auVar26._28_4_;
            fVar265 = ray->tfar;
            auVar237._4_4_ = fVar265;
            auVar237._0_4_ = fVar265;
            auVar237._8_4_ = fVar265;
            auVar237._12_4_ = fVar265;
            auVar237._16_4_ = fVar265;
            auVar237._20_4_ = fVar265;
            auVar237._24_4_ = fVar265;
            auVar237._28_4_ = fVar265;
            auVar136._8_8_ = uStack_f8;
            auVar136._0_8_ = local_100;
            auVar136._16_8_ = uStack_f0;
            auVar136._24_8_ = uStack_e8;
            auVar192 = vcmpps_avx(auVar136,auVar125,2);
            auVar25 = vcmpps_avx(auVar125,auVar237,2);
            auVar192 = vandps_avx(auVar192,auVar25);
            auVar26 = auVar28 & auVar192;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0x7f,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0xbf,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar26[0x1f]) goto LAB_00b118c1;
            auVar192 = vandps_avx(auVar28,auVar192);
            auVar26 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar191,4);
            auVar27 = auVar192 & auVar26;
            auVar193 = ZEXT3264(CONCAT824(uStack_468,
                                          CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              auVar192 = vandps_avx(auVar26,auVar192);
              auVar193 = ZEXT3264(auVar192);
              auVar126._4_4_ = auVar339._4_4_ * fVar271;
              auVar126._0_4_ = auVar339._0_4_ * fVar268;
              auVar126._8_4_ = auVar339._8_4_ * fVar277;
              auVar126._12_4_ = auVar339._12_4_ * fVar279;
              auVar126._16_4_ = auVar339._16_4_ * fVar281;
              auVar126._20_4_ = auVar339._20_4_ * fVar287;
              auVar126._24_4_ = auVar339._24_4_ * fVar269;
              auVar126._28_4_ = auVar25._28_4_;
              auVar127._4_4_ = auVar167._4_4_ * fVar271;
              auVar127._0_4_ = auVar167._0_4_ * fVar268;
              auVar127._8_4_ = auVar167._8_4_ * fVar277;
              auVar127._12_4_ = auVar167._12_4_ * fVar279;
              auVar127._16_4_ = auVar167._16_4_ * fVar281;
              auVar127._20_4_ = auVar167._20_4_ * fVar287;
              auVar127._24_4_ = auVar167._24_4_ * fVar269;
              auVar127._28_4_ = auVar167._28_4_;
              auVar276._8_4_ = 0x3f800000;
              auVar276._0_8_ = 0x3f8000003f800000;
              auVar276._12_4_ = 0x3f800000;
              auVar276._16_4_ = 0x3f800000;
              auVar276._20_4_ = 0x3f800000;
              auVar276._24_4_ = 0x3f800000;
              auVar276._28_4_ = 0x3f800000;
              auVar192 = vsubps_avx(auVar276,auVar126);
              _local_160 = vblendvps_avx(auVar192,auVar126,auVar24);
              auVar192 = vsubps_avx(auVar276,auVar127);
              _local_3e0 = vblendvps_avx(auVar192,auVar127,auVar24);
              auVar168 = ZEXT3264(_local_3e0);
              local_180 = auVar125;
            }
          }
          auVar321 = ZEXT3264(_local_780);
          auVar192 = auVar193._0_32_;
          auVar375 = ZEXT3264(_local_6c0);
          if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar192 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar192 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar192 >> 0x7f,0) != '\0') ||
                (auVar193 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar192 >> 0xbf,0) != '\0') ||
              (auVar193 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar193[0x1f] < '\0') {
            auVar25 = vsubps_avx(auVar369,_local_7a0);
            fVar266 = (float)local_7a0._0_4_ + auVar25._0_4_ * (float)local_160._0_4_;
            fVar267 = (float)local_7a0._4_4_ + auVar25._4_4_ * (float)local_160._4_4_;
            fVar268 = fStack_798 + auVar25._8_4_ * fStack_158;
            fVar271 = fStack_794 + auVar25._12_4_ * fStack_154;
            fVar277 = fStack_790 + auVar25._16_4_ * fStack_150;
            fVar279 = fStack_78c + auVar25._20_4_ * fStack_14c;
            fVar281 = fStack_788 + auVar25._24_4_ * fStack_148;
            fVar283 = fStack_784 + auVar25._28_4_;
            fVar265 = local_718->depth_scale;
            auVar214 = ZEXT3264(CONCAT428(fVar265,CONCAT424(fVar265,CONCAT420(fVar265,CONCAT416(
                                                  fVar265,CONCAT412(fVar265,CONCAT48(fVar265,
                                                  CONCAT44(fVar265,fVar265))))))));
            auVar128._4_4_ = (fVar267 + fVar267) * fVar265;
            auVar128._0_4_ = (fVar266 + fVar266) * fVar265;
            auVar128._8_4_ = (fVar268 + fVar268) * fVar265;
            auVar128._12_4_ = (fVar271 + fVar271) * fVar265;
            auVar128._16_4_ = (fVar277 + fVar277) * fVar265;
            auVar128._20_4_ = (fVar279 + fVar279) * fVar265;
            auVar128._24_4_ = (fVar281 + fVar281) * fVar265;
            auVar128._28_4_ = fVar283 + fVar283;
            auVar25 = vcmpps_avx(local_180,auVar128,6);
            auVar168 = ZEXT3264(auVar25);
            auVar26 = auVar192 & auVar25;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              local_200 = vandps_avx(auVar25,auVar192);
              auVar168 = ZEXT3264(local_200);
              auVar183._0_8_ =
                   CONCAT44((float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0,
                            (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0);
              auVar183._8_4_ = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
              auVar183._12_4_ = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
              auVar184._16_4_ = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
              auVar184._0_16_ = auVar183;
              auVar184._20_4_ = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
              fStack_288 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
              _local_2a0 = auVar184;
              fStack_284 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
              auVar193 = ZEXT3264(_local_2a0);
              local_2c0 = _local_160;
              local_280 = local_180;
              local_25c = uVar145;
              local_250 = local_690;
              uStack_248 = uStack_688;
              local_240 = local_5a0;
              uStack_238 = uStack_598;
              local_230 = local_5b0;
              uStack_228 = uStack_5a8;
              auVar214 = ZEXT1664(_local_590);
              local_220 = _local_590;
              local_6e0._0_8_ = (local_7d8->scene->geometries).items[local_720].ptr;
              _local_3e0 = _local_2a0;
              auVar192 = _local_3e0;
              if ((((Geometry *)local_6e0._0_8_)->mask & ray->mask) == 0) {
                pRVar143 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar143 = local_7d8->args;
                if ((pRVar143->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar143 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar143 >> 8),1),
                   ((Geometry *)local_6e0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_6e0._8_24_ = auVar275._8_24_;
                  auVar206._0_4_ = (float)(int)local_260;
                  auVar206._4_12_ = auVar310;
                  auVar386 = vshufps_avx(auVar206,auVar206,0);
                  auVar214 = ZEXT3264(CONCAT1616(auVar386,auVar386));
                  local_1e0[0] = (auVar386._0_4_ + (float)local_160._0_4_ + 0.0) *
                                 (float)local_120._0_4_;
                  local_1e0[1] = (auVar386._4_4_ + (float)local_160._4_4_ + 1.0) *
                                 (float)local_120._4_4_;
                  local_1e0[2] = (auVar386._8_4_ + fStack_158 + 2.0) * fStack_118;
                  local_1e0[3] = (auVar386._12_4_ + fStack_154 + 3.0) * fStack_114;
                  fStack_1d0 = (auVar386._0_4_ + fStack_150 + 4.0) * fStack_110;
                  fStack_1cc = (auVar386._4_4_ + fStack_14c + 5.0) * fStack_10c;
                  fStack_1c8 = (auVar386._8_4_ + fStack_148 + 6.0) * fStack_108;
                  fStack_1c4 = auVar386._12_4_ + fStack_144 + 7.0;
                  uStack_3d8 = auVar183._8_8_;
                  uStack_3d0 = auVar184._16_8_;
                  uStack_3c8 = local_2a0._24_8_;
                  local_1c0 = auVar183._0_8_;
                  uStack_1b8 = uStack_3d8;
                  uStack_1b0 = uStack_3d0;
                  uStack_1a8 = uStack_3c8;
                  auVar193 = ZEXT3264(local_180);
                  local_1a0 = local_180;
                  uVar149 = vmovmskps_avx(local_200);
                  uVar144 = CONCAT44((int)((ulong)pRVar143 >> 0x20),uVar149);
                  lVar147 = 0;
                  _local_3e0 = auVar192;
                  if (uVar144 != 0) {
                    for (; (uVar144 >> lVar147 & 1) == 0; lVar147 = lVar147 + 1) {
                    }
                  }
                  while( true ) {
                    local_7a0 = (undefined1  [8])lVar147;
                    local_620._0_8_ = uVar144;
                    if (uVar144 == 0) break;
                    local_674 = local_1e0[lVar147];
                    auVar168 = ZEXT464((uint)local_674);
                    local_670 = *(uint *)((long)&local_1c0 + lVar147 * 4);
                    auVar193 = ZEXT464(local_670);
                    local_640._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_1a0 + lVar147 * 4);
                    local_710.context = local_7d8->user;
                    fVar226 = 1.0 - local_674;
                    fVar227 = local_674 * fVar226 + local_674 * fVar226;
                    auVar386 = ZEXT416((uint)(local_674 * local_674 * 3.0));
                    auVar386 = vshufps_avx(auVar386,auVar386,0);
                    auVar207 = ZEXT416((uint)((fVar227 - local_674 * local_674) * 3.0));
                    auVar207 = vshufps_avx(auVar207,auVar207,0);
                    auVar231 = ZEXT416((uint)((fVar226 * fVar226 - fVar227) * 3.0));
                    auVar231 = vshufps_avx(auVar231,auVar231,0);
                    auVar219 = ZEXT416((uint)(fVar226 * fVar226 * -3.0));
                    auVar219 = vshufps_avx(auVar219,auVar219,0);
                    auVar208._0_4_ =
                         auVar219._0_4_ * (float)local_690._0_4_ +
                         auVar231._0_4_ * (float)local_5a0._0_4_ +
                         auVar386._0_4_ * (float)local_590._0_4_ +
                         auVar207._0_4_ * (float)local_5b0._0_4_;
                    auVar208._4_4_ =
                         auVar219._4_4_ * (float)local_690._4_4_ +
                         auVar231._4_4_ * (float)local_5a0._4_4_ +
                         auVar386._4_4_ * (float)local_590._4_4_ +
                         auVar207._4_4_ * (float)local_5b0._4_4_;
                    auVar208._8_4_ =
                         auVar219._8_4_ * (float)uStack_688 +
                         auVar231._8_4_ * (float)uStack_598 +
                         auVar386._8_4_ * fStack_588 + auVar207._8_4_ * (float)uStack_5a8;
                    auVar208._12_4_ =
                         auVar219._12_4_ * uStack_688._4_4_ +
                         auVar231._12_4_ * uStack_598._4_4_ +
                         auVar386._12_4_ * fStack_584 + auVar207._12_4_ * uStack_5a8._4_4_;
                    auVar214 = ZEXT1664(auVar208);
                    local_680 = vmovlps_avx(auVar208);
                    local_678 = vextractps_avx(auVar208,2);
                    local_66c = (int)local_648;
                    local_668 = (int)local_720;
                    local_664 = (local_710.context)->instID[0];
                    local_660 = (local_710.context)->instPrimID[0];
                    local_7dc = -1;
                    local_710.valid = &local_7dc;
                    local_710.geometryUserPtr = *(void **)(local_6e0._0_8_ + 0x18);
                    local_710.ray = (RTCRayN *)ray;
                    local_710.hit = (RTCHitN *)&local_680;
                    local_710.N = 1;
                    if (*(code **)(local_6e0._0_8_ + 0x48) == (code *)0x0) {
LAB_00b11831:
                      p_Var23 = local_7d8->args->filter;
                      if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                         (((local_7d8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_6e0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar214 = ZEXT1664(auVar214._0_16_);
                        auVar386 = (*p_Var23)(&local_710);
                        auVar193._0_8_ = auVar386._8_8_;
                        auVar168._0_8_ = auVar386._0_8_;
                        auVar193._8_56_ = extraout_var_02;
                        auVar168._8_56_ = extraout_var_00;
                        if (*local_710.valid == 0) goto LAB_00b11878;
                      }
                      pRVar143 = (RTCIntersectArguments *)0x1;
                      goto LAB_00b118e4;
                    }
                    auVar214 = ZEXT1664(auVar208);
                    auVar386 = (**(code **)(local_6e0._0_8_ + 0x48))(&local_710);
                    auVar193._0_8_ = auVar386._8_8_;
                    auVar168._0_8_ = auVar386._0_8_;
                    auVar193._8_56_ = extraout_var_01;
                    auVar168._8_56_ = extraout_var;
                    if (*local_710.valid != 0) goto LAB_00b11831;
LAB_00b11878:
                    auVar168 = ZEXT464((uint)local_640._0_4_);
                    ray->tfar = (float)local_640._0_4_;
                    uVar144 = local_620._0_8_ ^ 1L << ((ulong)local_7a0 & 0x3f);
                    lVar147 = 0;
                    if (uVar144 != 0) {
                      for (; (uVar144 >> lVar147 & 1) == 0; lVar147 = lVar147 + 1) {
                      }
                    }
                  }
                  pRVar143 = (RTCIntersectArguments *)0x0;
LAB_00b118e4:
                  auVar321 = ZEXT3264(_local_780);
                  auVar375 = ZEXT3264(_local_6c0);
                }
              }
              bVar148 = bVar148 | (byte)pRVar143;
              fVar227 = (float)local_740._0_4_;
              fVar252 = (float)local_740._4_4_;
              fVar242 = fStack_738;
              fVar248 = fStack_734;
              fVar226 = fStack_730;
              fVar238 = fStack_72c;
              fVar240 = fStack_728;
              fVar194 = fStack_724;
              fVar180 = (float)local_7c0._0_4_;
              fVar195 = (float)local_7c0._4_4_;
              fVar196 = fStack_7b8;
              fVar198 = fStack_7b4;
              fVar197 = fStack_7b0;
              fVar245 = fStack_7ac;
              fVar250 = fStack_7a8;
              fVar216 = (float)local_760._0_4_;
              fVar223 = (float)local_760._4_4_;
              fVar224 = fStack_758;
              fVar225 = fStack_754;
              fVar254 = fStack_750;
              fVar263 = fStack_74c;
              fVar264 = fStack_748;
            }
          }
        }
      }
    }
    if (bVar148 != 0) break;
    fVar227 = ray->tfar;
    auVar164._4_4_ = fVar227;
    auVar164._0_4_ = fVar227;
    auVar164._8_4_ = fVar227;
    auVar164._12_4_ = fVar227;
    auVar164._16_4_ = fVar227;
    auVar164._20_4_ = fVar227;
    auVar164._24_4_ = fVar227;
    auVar164._28_4_ = fVar227;
    auVar192 = vcmpps_avx(local_80,auVar164,2);
    uVar145 = vmovmskps_avx(auVar192);
  }
  return uVar141 != 0;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }